

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O3

void __thiscall Tagliatelle<UF>::FirstScan(Tagliatelle<UF> *this)

{
  char *pcVar1;
  uint *puVar2;
  long lVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  uint *puVar16;
  long lVar17;
  uint uVar18;
  uint *puVar19;
  long lVar20;
  char cVar21;
  uint *puVar22;
  int iVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  int iVar29;
  uint uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  char *pcVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  undefined4 uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  uint *puVar50;
  ulong uVar51;
  long lVar52;
  bool bVar53;
  int local_e8;
  int local_a8;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar15 = *(uint *)&pMVar4->field_0x8;
  uVar18 = *(uint *)&pMVar4->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar15 & 0xfffffffe;
  this->o_rows = (uVar15 & 0x80000001) == 1;
  this->e_cols = uVar18 & 0xfffffffe;
  this->o_cols = (uVar18 & 0x80000001) == 1;
  puVar2 = UF::P_;
  *UF::P_ = 0;
  UF::length_ = 1;
  lVar20 = *(long *)&pMVar4->field_0x10;
  if (uVar15 != 1) {
    lVar31 = **(long **)&pMVar4->field_0x48;
    lVar40 = lVar20 + lVar31;
    lVar32 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar10 = (long)(int)uVar18 - 2;
    local_e8 = (int)uVar10;
    if ((int)uVar18 < 3) {
      uVar24 = 0;
      lVar31 = 1;
    }
    else {
      uVar14 = 0xfffffffe;
      uVar28 = 0;
      do {
        iVar23 = (int)uVar28;
        uVar51 = (ulong)iVar23;
        iVar29 = (int)uVar14;
        if ((*(char *)(lVar20 + uVar51) != '\0') || (*(char *)(lVar40 + uVar51) != '\0')) {
          cVar7 = *(char *)(lVar20 + 3 + (long)iVar29);
          puVar2[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          *(uint *)(lVar32 + uVar51 * 4) = UF::length_;
          UF::length_ = uVar24;
          if (cVar7 != '\0') goto LAB_0027f8ad;
          goto LAB_0027f94c;
        }
        if ((*(char *)((long)iVar29 + 3 + lVar20) != '\0') ||
           (*(char *)(lVar40 + 3 + (long)iVar29) != '\0')) {
          puVar2[UF::length_] = UF::length_;
          uVar24 = UF::length_;
          UF::length_ = UF::length_ + 1;
LAB_0027f8a9:
          *(uint *)(lVar32 + uVar51 * 4) = uVar24;
LAB_0027f8ad:
          iVar29 = iVar23 + 2;
          if (iVar29 < local_e8) {
            lVar44 = (long)iVar23;
            lVar17 = lVar44 + 2;
            lVar26 = lVar32 + lVar44 * 4;
            lVar36 = lVar20 + 3 + lVar44;
            lVar44 = lVar44 + lVar31 + lVar20 + 3;
            lVar33 = 0;
            do {
              if ((*(char *)(lVar36 + -1 + lVar33) == '\0') &&
                 (*(char *)(lVar44 + -1 + lVar33) == '\0')) {
                if ((*(char *)(lVar36 + lVar33) == '\0') && (*(char *)(lVar44 + lVar33) == '\0')) {
                  uVar51 = lVar17 + lVar33;
                  uVar28 = uVar51 & 0xffffffff;
                  goto LAB_0027fa98;
                }
                puVar2[UF::length_] = UF::length_;
                uVar24 = UF::length_;
                UF::length_ = UF::length_ + 1;
              }
              else {
                if (*(char *)(lVar36 + lVar33) == '\0') goto LAB_0027f938;
                uVar24 = *(uint *)(lVar26 + lVar33 * 4);
              }
              *(uint *)(lVar26 + 8 + lVar33 * 4) = uVar24;
              lVar48 = lVar17 + lVar33;
              lVar33 = lVar33 + 2;
              if ((long)(uVar10 & 0xffffffff) <= lVar48 + 2) {
                iVar29 = iVar23 + (int)lVar33 + 2;
                iVar23 = iVar23 + (int)lVar33;
                break;
              }
            } while( true );
          }
          lVar26 = (long)iVar29;
          if (local_e8 < iVar29) {
            if ((*(char *)(lVar20 + lVar26) == '\0') && (*(char *)(lVar40 + lVar26) == '\0'))
            goto LAB_0027fc15;
          }
          else if ((*(char *)(lVar20 + lVar26) == '\0') && (*(char *)(lVar40 + lVar26) == '\0')) {
            if (*(char *)((long)iVar23 + 3 + lVar20) != '\0') goto LAB_0027fcc2;
            cVar7 = *(char *)(lVar40 + 3 + (long)iVar23);
            goto joined_r0x0027fcbc;
          }
          uVar24 = *(uint *)(lVar32 + (long)iVar23 * 4);
          goto LAB_0027fcd0;
        }
LAB_0027fa98:
        *(undefined4 *)(lVar32 + uVar51 * 4) = 0;
        iVar23 = (int)uVar28;
        uVar24 = iVar23 + 2;
        uVar14 = uVar28;
        uVar28 = (ulong)uVar24;
      } while ((int)uVar24 < local_e8);
      lVar31 = (long)(iVar23 + 3);
    }
    lVar26 = (long)(int)uVar24;
    if (local_e8 < (int)uVar24) {
      if (*(char *)(lVar20 + lVar26) == '\0') {
        cVar7 = *(char *)(lVar40 + lVar26);
joined_r0x0027fcbc:
        if (cVar7 == '\0') goto LAB_0027fc15;
      }
LAB_0027fcc2:
      puVar2[UF::length_] = UF::length_;
      uVar24 = UF::length_;
      UF::length_ = UF::length_ + 1;
    }
    else {
      if ((((*(char *)(lVar20 + lVar26) != '\0') || (*(char *)(lVar40 + lVar26) != '\0')) ||
          (*(char *)(lVar20 + lVar31) != '\0')) || (*(char *)(lVar40 + lVar31) != '\0'))
      goto LAB_0027fcc2;
LAB_0027fc15:
      uVar24 = 0;
    }
LAB_0027fcd0:
    *(uint *)(lVar32 + lVar26 * 4) = uVar24;
    if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
      lVar40 = 2;
      lVar20 = 1;
      lVar32 = 3;
      lVar31 = 0;
LAB_0027fcf8:
      pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar36 = *(long *)&pMVar4->field_0x10;
      lVar17 = **(long **)&pMVar4->field_0x48;
      lVar27 = lVar17 * lVar40;
      lVar26 = lVar36 + lVar27;
      pcVar34 = (char *)(lVar26 - lVar17);
      pcVar1 = (char *)(lVar26 + lVar17);
      lVar33 = *(long *)&pMVar5->field_0x10;
      lVar44 = **(long **)&pMVar5->field_0x48;
      lVar48 = lVar44 * lVar40;
      puVar2 = (uint *)(lVar33 + lVar48);
      puVar50 = (uint *)((long)puVar2 + lVar44 * -2);
      cVar7 = *(char *)(lVar36 + lVar27);
      if (2 < (int)uVar18) {
        if (cVar7 == '\0') {
          if (*pcVar1 == '\0') {
            if (*(char *)(lVar26 + 1) == '\0') {
              if (pcVar1[1] == '\0') {
                uVar14 = 0;
                puVar22 = puVar2;
                goto LAB_002828ac;
              }
              UF::P_[UF::length_] = UF::length_;
              uVar24 = UF::length_ + 1;
              *puVar2 = UF::length_;
              UF::length_ = uVar24;
              iVar23 = 0;
              goto LAB_002834ce;
            }
            if (pcVar34[1] != '\0') goto LAB_0027ff45;
            cVar7 = *pcVar34;
            if (pcVar34[2] != '\0') {
              if (cVar7 == '\0') goto LAB_00280395;
              uVar24 = *puVar50;
              if (pcVar34[1 - lVar17] == '\0') {
                do {
                  uVar8 = uVar24;
                  uVar14 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar14];
                  uVar9 = puVar50[2];
                } while (UF::P_[uVar14] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar28 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar28];
                } while (UF::P_[uVar28] < uVar24);
                goto LAB_00280360;
              }
              goto LAB_002802c2;
            }
          }
          else {
            if (*(char *)(lVar26 + 1) == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar24 = UF::length_ + 1;
              *puVar2 = UF::length_;
              UF::length_ = uVar24;
              uVar14 = 0;
              goto LAB_0028586f;
            }
            if (pcVar34[1] != '\0') {
LAB_0027ff45:
              *puVar2 = *puVar50;
              uVar14 = 0;
              goto LAB_00284ea6;
            }
            cVar7 = *pcVar34;
            if (pcVar34[2] != '\0') {
              if (cVar7 == '\0') {
LAB_00280395:
                *puVar2 = puVar50[2];
                goto LAB_0028039d;
              }
              uVar24 = *puVar50;
              if (pcVar34[1 - lVar17] == '\0') {
                do {
                  uVar8 = uVar24;
                  uVar14 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar14];
                  uVar9 = puVar50[2];
                } while (UF::P_[uVar14] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar28 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar28];
                } while (UF::P_[uVar28] < uVar24);
                goto LAB_00280360;
              }
LAB_002802c2:
              *puVar2 = uVar24;
LAB_0028039d:
              uVar14 = 0;
              goto LAB_0028494f;
            }
          }
          if (cVar7 != '\0') {
            *puVar2 = *puVar50;
            uVar14 = 0;
            goto LAB_00284c69;
          }
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          *puVar2 = UF::length_;
          UF::length_ = uVar24;
        }
        else {
          if (pcVar34[1] != '\0') {
            *puVar2 = *puVar50;
            uVar14 = 0;
            goto LAB_002873f3;
          }
          if (*(char *)(lVar26 + 1) == '\0') {
            if (*pcVar34 == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar24 = UF::length_ + 1;
              *puVar2 = UF::length_;
              UF::length_ = uVar24;
              uVar14 = 0;
              goto LAB_00280c65;
            }
            *puVar2 = *puVar50;
            uVar14 = 0;
            goto LAB_0027ffb2;
          }
          if (pcVar34[2] != '\0') {
            if (*pcVar34 != '\0') {
              if (pcVar34[1 - lVar17] != '\0') {
                *puVar2 = *puVar50;
                uVar14 = 0;
                goto LAB_0028494f;
              }
              uVar24 = *puVar50;
              do {
                uVar8 = uVar24;
                uVar14 = (ulong)uVar8;
                uVar24 = UF::P_[uVar14];
                uVar9 = puVar50[2];
              } while (UF::P_[uVar14] < uVar8);
              do {
                uVar24 = uVar9;
                uVar28 = (ulong)uVar24;
                uVar9 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
LAB_00280360:
              if (uVar8 < uVar24) {
                UF::P_[uVar28] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar14] = uVar24;
              }
              *puVar2 = uVar24;
              uVar14 = 0;
              goto LAB_0028494f;
            }
            *puVar2 = puVar50[2];
            goto LAB_0028039d;
          }
          if (*pcVar34 != '\0') {
            *puVar2 = *puVar50;
            uVar14 = 0;
            goto LAB_00284c69;
          }
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          *puVar2 = UF::length_;
          UF::length_ = uVar24;
        }
        uVar14 = 0;
LAB_0028056a:
        puVar22 = UF::P_;
        iVar23 = (int)uVar14;
        uVar24 = iVar23 + 2;
        if ((int)uVar24 < local_e8) {
          lVar42 = (long)iVar23;
          lVar11 = lVar42 + 2;
          lVar47 = lVar42 << 0x20;
          lVar41 = lVar17 * lVar32 + lVar42;
          lVar12 = lVar36 + lVar42 + lVar27;
          lVar13 = lVar36 + lVar17 * lVar20 + lVar42;
          lVar25 = lVar48 + lVar42 * 4;
          lVar35 = lVar25 + lVar33 + 8;
          lVar52 = 0;
          lVar38 = 0;
LAB_00280612:
          lVar43 = lVar47 >> 0x1e;
          if (*(char *)(lVar12 + 2 + lVar38) == '\0') {
            if (*(char *)(lVar36 + lVar41 + 2 + lVar38) != '\0') {
              uVar14 = lVar11 + lVar38;
              lVar12 = lVar47 + 0x300000000 >> 0x20;
              if (*(char *)(lVar26 + lVar12) == '\0') {
                *(undefined4 *)(lVar25 + lVar33 + 8 + lVar38 * 4) =
                     *(undefined4 *)((long)puVar2 + lVar43);
                goto LAB_0028586f;
              }
              if (pcVar34[lVar12] != '\0') {
                uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar38 * 4);
                do {
                  uVar8 = uVar24;
                  uVar24 = UF::P_[uVar8];
                  uVar9 = *(uint *)((long)puVar2 + lVar43);
                } while (UF::P_[uVar8] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar9 = UF::P_[uVar24];
                } while (UF::P_[uVar24] < uVar24);
                if (uVar8 < uVar24) {
                  UF::P_[uVar24] = uVar8;
                  uVar24 = uVar8;
                }
                else {
                  UF::P_[uVar8] = uVar24;
                }
                *(uint *)(lVar25 + lVar33 + 8 + lVar38 * 4) = uVar24;
                goto LAB_00284ea6;
              }
              lVar13 = lVar47 + 0x400000000 >> 0x20;
              if (pcVar34[lVar13] == '\0') {
                uVar24 = *(uint *)((long)puVar2 + lVar43);
                goto LAB_00284565;
              }
              if (pcVar34[lVar12 - lVar17] != '\0') {
                uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar38 * 4);
                do {
                  uVar8 = uVar24;
                  uVar14 = (ulong)uVar8;
                  uVar9 = *(uint *)((long)puVar2 + lVar43);
                  uVar24 = UF::P_[uVar14];
                } while (UF::P_[uVar14] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar28 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar28];
                } while (UF::P_[uVar28] < uVar24);
                goto LAB_00281801;
              }
              uVar24 = puVar50[lVar13];
              do {
                uVar8 = uVar24;
                uVar14 = (ulong)uVar8;
                uVar9 = *(uint *)((long)puVar2 + lVar43);
                uVar24 = UF::P_[uVar14];
              } while (UF::P_[uVar14] < uVar8);
              do {
                uVar24 = uVar9;
                uVar28 = (ulong)uVar24;
                uVar9 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
              goto LAB_002821d1;
            }
            if (*(char *)(lVar12 + 3 + lVar38) == '\0') {
              uVar14 = lVar11 + lVar38;
              if (*(char *)(lVar38 + 3 + lVar41 + lVar36) == '\0') {
                puVar22 = (uint *)(lVar52 + lVar25 + lVar33 + 8);
                goto LAB_002828ac;
              }
              UF::P_[UF::length_] = UF::length_;
              uVar24 = UF::length_ + 1;
              *(uint *)(lVar25 + lVar33 + 8 + lVar38 * 4) = UF::length_;
              UF::length_ = uVar24;
              iVar23 = (int)uVar14;
              goto LAB_002834ce;
            }
            iVar29 = (int)lVar11;
            if (*(char *)(lVar13 + 3 + lVar38) != '\0') {
              uVar14 = (ulong)(uint)(iVar29 + (int)lVar38);
              *(undefined4 *)(lVar35 + lVar38 * 4) =
                   *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar38 * 4);
              goto LAB_00284ea6;
            }
            if (*(char *)(lVar13 + 4 + lVar38) == '\0') goto code_r0x00280651;
            uVar14 = (ulong)(uint)(iVar29 + (int)lVar38);
            *(undefined4 *)(lVar35 + lVar38 * 4) =
                 *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 0x10 + lVar38 * 4);
            goto LAB_0028494f;
          }
          uVar14 = lVar11 + lVar38;
          lVar12 = lVar47 + 0x300000000 >> 0x20;
          if (pcVar34[lVar12] != '\0') {
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar38 * 4);
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = *(uint *)((long)puVar2 + lVar43);
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            *(uint *)(lVar25 + lVar33 + 8 + lVar38 * 4) = uVar24;
            goto LAB_002873f3;
          }
          if (*(char *)(lVar26 + lVar12) == '\0') {
            uVar28 = uVar14 & 0xffffffff;
            uVar24 = *(uint *)((long)puVar2 + lVar43);
            goto LAB_00287c5a;
          }
          lVar13 = lVar47 + 0x400000000 >> 0x20;
          if (pcVar34[lVar13] == '\0') {
            uVar28 = uVar14 & 0xffffffff;
            uVar24 = *(uint *)((long)puVar2 + lVar43);
            goto LAB_00288196;
          }
          if (pcVar34[lVar12 - lVar17] == '\0') {
            uVar24 = puVar50[lVar13];
            do {
              uVar8 = uVar24;
              uVar14 = (ulong)uVar8;
              uVar9 = *(uint *)((long)puVar2 + lVar43);
              uVar24 = UF::P_[uVar14];
            } while (UF::P_[uVar14] < uVar8);
            do {
              uVar24 = uVar9;
              uVar28 = (ulong)uVar24;
              uVar9 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
LAB_002821d1:
            if (uVar8 < uVar24) {
LAB_0028180a:
              uVar24 = uVar8;
              UF::P_[uVar28] = uVar24;
              goto LAB_002821e4;
            }
          }
          else {
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar38 * 4);
            do {
              uVar8 = uVar24;
              uVar14 = (ulong)uVar8;
              uVar9 = *(uint *)((long)puVar2 + lVar43);
              uVar24 = UF::P_[uVar14];
            } while (UF::P_[uVar14] < uVar8);
            do {
              uVar24 = uVar9;
              uVar28 = (ulong)uVar24;
              uVar9 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
LAB_00281801:
            if (uVar8 < uVar24) goto LAB_0028180a;
          }
          UF::P_[uVar14] = uVar24;
LAB_002821e4:
          uVar14 = lVar11 + lVar38;
          *(uint *)(lVar25 + lVar33 + 8 + lVar38 * 4) = uVar24;
LAB_0028494f:
          puVar22 = UF::P_;
          uVar24 = (int)uVar14 + 2;
          uVar28 = (ulong)uVar24;
          if ((int)uVar24 < local_e8) {
            lVar11 = (long)(int)uVar14;
            uVar28 = lVar11 + 2;
            do {
              uVar14 = uVar28;
              iVar23 = (int)lVar11;
              if (*(char *)(lVar26 + uVar14) == '\0') {
                cVar7 = *(char *)(lVar11 + 3 + lVar26);
                if (pcVar1[uVar14] == '\0') {
                  if (cVar7 == '\0') {
                    if (pcVar1[lVar11 + 3] != '\0') goto LAB_00285284;
                    puVar22 = puVar2 + uVar14;
                    goto LAB_002828ac;
                  }
                  if (pcVar34[lVar11 + 3] != '\0') goto LAB_00284bc0;
                  if (pcVar34[lVar11 + 4] == '\0') {
                    puVar2[uVar14] = puVar50[uVar14];
                    uVar14 = uVar14 & 0xffffffff;
                    goto LAB_00284c69;
                  }
                  uVar24 = puVar50[uVar14];
                  if (pcVar34[lVar11 + (3 - lVar17)] != '\0') goto LAB_00284ad6;
                  do {
                    uVar8 = uVar24;
                    uVar28 = (ulong)uVar8;
                    uVar24 = puVar22[uVar28];
                    uVar9 = puVar50[lVar11 + 4];
                  } while (puVar22[uVar28] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar51 = (ulong)uVar24;
                    uVar9 = puVar22[uVar51];
                  } while (puVar22[uVar51] < uVar24);
                }
                else {
                  if (cVar7 == '\0') {
                    puVar2[uVar14] = puVar2[iVar23];
                    goto LAB_0028586f;
                  }
                  if (pcVar34[lVar11 + 3] != '\0') {
LAB_00284bc0:
                    puVar2[uVar14] = puVar50[uVar14];
                    goto LAB_00284ea6;
                  }
                  if (pcVar34[lVar11 + 4] == '\0') goto LAB_00284b5d;
                  if (pcVar34[lVar11 + (3 - lVar17)] != '\0') goto LAB_00284a22;
                  uVar24 = puVar50[lVar11 + 4];
                  do {
                    uVar8 = uVar24;
                    uVar28 = (ulong)uVar8;
                    uVar24 = puVar22[uVar28];
                    uVar9 = puVar2[lVar11];
                  } while (puVar22[uVar28] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar51 = (ulong)uVar24;
                    uVar9 = puVar22[uVar51];
                  } while (puVar22[uVar51] < uVar24);
                }
LAB_00284ab5:
                if (uVar8 < uVar24) {
                  puVar22[uVar51] = uVar8;
                  uVar24 = uVar8;
                }
                else {
                  puVar22[uVar28] = uVar24;
                }
              }
              else {
                if (pcVar34[lVar11 + 3] != '\0') {
                  puVar2[uVar14] = puVar50[uVar14];
                  goto LAB_002873f3;
                }
                if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
                  uVar24 = puVar2[iVar23];
LAB_00284bb6:
                  uVar28 = uVar14 & 0xffffffff;
                  goto LAB_00287c5a;
                }
                if (pcVar34[lVar11 + 4] == '\0') goto LAB_00284b5d;
                if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
                  uVar24 = puVar50[lVar11 + 4];
                  do {
                    uVar8 = uVar24;
                    uVar28 = (ulong)uVar8;
                    uVar24 = puVar22[uVar28];
                    uVar9 = puVar2[lVar11];
                  } while (puVar22[uVar28] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar51 = (ulong)uVar24;
                    uVar9 = puVar22[uVar51];
                  } while (puVar22[uVar51] < uVar24);
                  goto LAB_00284ab5;
                }
LAB_00284a22:
                uVar24 = puVar50[uVar14];
              }
LAB_00284ad6:
              puVar2[uVar14] = uVar24;
              uVar28 = uVar14 + 2;
              lVar11 = lVar11 + 2;
              if ((long)uVar10 <= (long)uVar28) break;
            } while( true );
          }
          local_a8 = (int)uVar14;
          if (local_e8 < (int)uVar28) goto LAB_00285011;
          uVar51 = uVar28 & 0xffffffff;
          if (*(char *)(lVar26 + uVar51) != '\0') {
            lVar26 = (long)local_a8;
            if (pcVar34[lVar26 + 3] == '\0') goto LAB_00287961;
            uVar24 = puVar50[uVar51];
            goto LAB_00287966;
          }
          uVar14 = (ulong)(local_a8 + 3);
          if (pcVar1[uVar51] == '\0') {
            if (*(char *)(lVar26 + uVar14) == '\0') {
LAB_00285d43:
              cVar7 = pcVar1[uVar14];
              goto joined_r0x00282a52;
            }
          }
          else if ((*(char *)(lVar26 + uVar14) == '\0') || (pcVar34[uVar14] == '\0')) {
LAB_00285121:
            lVar26 = (long)local_a8;
            goto LAB_00288090;
          }
LAB_0028785d:
          uVar24 = puVar50[uVar51];
          goto LAB_00289fa8;
        }
LAB_002806d3:
        uVar51 = (ulong)uVar24;
        uVar28 = uVar51;
        if (local_e8 < (int)uVar24) {
LAB_00285011:
          uVar51 = uVar28 & 0xffffffff;
          if (*(char *)(lVar26 + uVar51) == '\0') {
            if (pcVar1[uVar51] == '\0') {
LAB_0028881d:
              puVar2[uVar51] = 0;
              goto LAB_00289fad;
            }
            uVar24 = puVar2[(long)(int)uVar28 + -2];
            goto LAB_00289fa8;
          }
          uVar24 = puVar2[(long)(int)uVar28 + -2];
LAB_00287966:
          puVar2[uVar51] = uVar24;
          goto LAB_00289fad;
        }
        if (*(char *)(lVar26 + uVar51) != '\0') {
          lVar26 = (long)iVar23;
          if (pcVar34[lVar26 + 3] == '\0') {
LAB_00287961:
            uVar24 = puVar2[lVar26];
            goto LAB_00287966;
          }
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[lVar26];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        uVar14 = (ulong)(iVar23 + 3);
        if (pcVar1[uVar51] == '\0') {
          if (*(char *)(lVar26 + uVar14) == '\0') {
LAB_00288813:
            cVar7 = pcVar1[uVar14];
joined_r0x00282a52:
            if (cVar7 == '\0') goto LAB_0028881d;
          }
          else {
            cVar7 = pcVar34[uVar14];
joined_r0x00281033:
            if (cVar7 != '\0') {
LAB_00287d9f:
              uVar24 = puVar50[uVar51];
              goto LAB_00289fa8;
            }
          }
LAB_00289148:
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          puVar2[uVar51] = UF::length_;
          UF::length_ = uVar24;
          goto LAB_00289fad;
        }
        if ((*(char *)(lVar26 + uVar14) != '\0') && (pcVar34[uVar14] != '\0')) {
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[iVar23];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        lVar26 = (long)iVar23;
LAB_00288090:
        uVar24 = puVar2[lVar26];
        goto LAB_00289fa8;
      }
      if (uVar18 == 2) {
        if (cVar7 == '\0') {
          if (*pcVar1 == '\0') {
            if (*(char *)(lVar26 + 1) != '\0') goto LAB_0028016e;
            if (pcVar1[1] == '\0') {
              *puVar2 = 0;
              goto LAB_00289fad;
            }
          }
          else if (*(char *)(lVar26 + 1) != '\0') {
LAB_0028016e:
            if ((pcVar34[1] != '\0') || (*pcVar34 != '\0')) goto LAB_0028017f;
          }
LAB_00280317:
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          *puVar2 = UF::length_;
          UF::length_ = uVar24;
        }
        else {
          if (pcVar34[1] != '\0') {
            *puVar2 = *puVar50;
            goto LAB_00289fad;
          }
          if (*pcVar34 == '\0') goto LAB_00280317;
LAB_0028017f:
          *puVar2 = *puVar50;
        }
      }
      else if (cVar7 == '\0') {
        if (*pcVar1 != '\0') goto LAB_0027ff0b;
        *puVar2 = 0;
      }
      else if (*pcVar34 == '\0') {
LAB_0027ff0b:
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        *puVar2 = UF::length_;
        UF::length_ = uVar24;
      }
      else {
        *puVar2 = *puVar50;
      }
      goto LAB_00289fad;
    }
    if ((uVar15 & 0x80000001) != 1) {
      return;
    }
    goto LAB_0028a4c3;
  }
  lVar40 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  uVar15 = uVar18 - 2;
  if (2 < (int)uVar18) {
    iVar29 = -2;
    iVar23 = 0;
LAB_0027f707:
    lVar31 = (long)iVar23;
    cVar7 = *(char *)(lVar20 + 3 + (long)iVar29);
    if (*(char *)(lVar20 + lVar31) == '\0') {
      if (cVar7 != '\0') {
        puVar2[UF::length_] = UF::length_;
        uVar18 = UF::length_ + 1;
        *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
        UF::length_ = uVar18;
        goto LAB_0027f750;
      }
LAB_0027f7b1:
      uVar39 = 0;
      goto LAB_0027f7b4;
    }
    puVar2[UF::length_] = UF::length_;
    uVar18 = UF::length_ + 1;
    *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
    UF::length_ = uVar18;
    iVar29 = iVar23;
    if (cVar7 == '\0') goto LAB_0027f7b8;
LAB_0027f750:
    iVar29 = iVar23 + 2;
    if (iVar29 < (int)uVar15) {
      lVar31 = (long)iVar29;
      do {
        iVar29 = iVar23;
        lVar32 = (long)iVar29;
        cVar7 = *(char *)(lVar20 + 3 + lVar32);
        if (*(char *)(lVar20 + lVar31) == '\0') {
          if (cVar7 == '\0') {
            iVar23 = iVar29 + 2;
            goto LAB_0027f7b1;
          }
          puVar2[UF::length_] = UF::length_;
          uVar18 = UF::length_;
          UF::length_ = UF::length_ + 1;
        }
        else {
          if (cVar7 == '\0') goto LAB_0027f7a4;
          uVar18 = *(uint *)(lVar40 + lVar32 * 4);
        }
        *(uint *)(lVar40 + lVar31 * 4) = uVar18;
        lVar31 = lVar31 + 2;
        iVar23 = iVar29 + 2;
        if ((long)(ulong)uVar15 <= lVar31) {
          iVar29 = iVar29 + 4;
          break;
        }
      } while( true );
    }
    lVar31 = (long)iVar29;
    if ((int)uVar15 < iVar29) {
      if (*(char *)(lVar20 + lVar31) == '\0') goto LAB_0028bfc3;
      uVar39 = *(undefined4 *)(lVar40 + (long)iVar23 * 4);
LAB_0028c166:
      *(undefined4 *)(lVar40 + lVar31 * 4) = uVar39;
      return;
    }
    if (*(char *)(lVar20 + lVar31) != '\0') {
      uVar39 = *(undefined4 *)(lVar40 + (long)iVar23 * 4);
      goto LAB_0028c166;
    }
    cVar7 = *(char *)(lVar20 + 3 + (long)iVar23);
    goto joined_r0x0027fc56;
  }
  iVar23 = 0;
  lVar32 = -2;
  goto LAB_0027fac6;
LAB_0027f938:
  iVar23 = (int)lVar17 + (int)lVar33;
  *(undefined4 *)(lVar26 + 8 + lVar33 * 4) = *(undefined4 *)(lVar26 + lVar33 * 4);
LAB_0027f94c:
  iVar29 = iVar23 + 2;
  if (local_e8 <= iVar29) {
LAB_0027fbec:
    lVar26 = (long)iVar29;
    if (local_e8 < iVar29) {
      if ((*(char *)(lVar20 + lVar26) == '\0') && (*(char *)(lVar40 + lVar26) == '\0'))
      goto LAB_0027fc15;
    }
    else if (*(char *)(lVar20 + lVar26) == '\0') {
      if (*(char *)(lVar40 + lVar26) != '\0') {
        if (*(char *)(lVar40 + 1 + (long)iVar23) == '\0') goto LAB_0027fcc2;
        uVar24 = *(uint *)(lVar32 + (long)iVar23 * 4);
        goto LAB_0027fcd0;
      }
      if (*(char *)((long)iVar23 + 3 + lVar20) != '\0') goto LAB_0027fcc2;
      cVar7 = *(char *)(lVar40 + 3 + (long)iVar23);
      goto joined_r0x0027fcbc;
    }
    if (*(char *)(lVar40 + 1 + (long)iVar23) == '\0') goto LAB_0027fcc2;
    uVar24 = *(uint *)(lVar32 + (long)iVar23 * 4);
    goto LAB_0027fcd0;
  }
  lVar33 = (long)iVar23;
  lVar26 = lVar33 + 2;
  lVar48 = (lVar33 << 0x20) + 0x300000000;
  lVar36 = lVar32 + lVar33 * 4;
  lVar17 = lVar31 + 1 + lVar20 + lVar33;
  lVar33 = lVar33 + lVar20 + 2;
  lVar44 = 0;
  while (*(char *)(lVar33 + lVar44) != '\0') {
    cVar7 = *(char *)(lVar33 + 1 + lVar44);
    if (*(char *)(lVar17 + lVar44) == '\0') {
      if (cVar7 != '\0') goto LAB_0027fa6b;
LAB_0027f9d3:
      puVar2[UF::length_] = UF::length_;
      uVar24 = UF::length_;
      UF::length_ = UF::length_ + 1;
    }
    else {
      if (cVar7 != '\0') goto LAB_0027fa50;
LAB_0027f9c3:
      uVar24 = *(uint *)(lVar36 + lVar44 * 4);
    }
    *(uint *)(lVar36 + 8 + lVar44 * 4) = uVar24;
    lVar48 = lVar48 + 0x200000000;
    lVar27 = lVar26 + lVar44;
    lVar44 = lVar44 + 2;
    if ((long)(uVar10 & 0xffffffff) <= lVar27 + 2) {
      iVar29 = iVar23 + (int)lVar44 + 2;
      iVar23 = iVar23 + (int)lVar44;
      goto LAB_0027fbec;
    }
  }
  if (*(char *)(lVar17 + 1 + lVar44) == '\0') {
    uVar51 = lVar26 + lVar44;
    if ((*(char *)(lVar20 + (lVar48 >> 0x20)) == '\0') &&
       (*(char *)(lVar40 + (lVar48 >> 0x20)) == '\0')) {
      uVar28 = uVar51 & 0xffffffff;
      goto LAB_0027fa98;
    }
  }
  else {
    if (*(char *)(lVar33 + 1 + lVar44) == '\0') {
      if (*(char *)(lVar17 + lVar44) == '\0') goto LAB_0027f9d3;
      goto LAB_0027f9c3;
    }
    if (*(char *)(lVar44 + lVar17) != '\0') {
LAB_0027fa50:
      uVar24 = *(uint *)(lVar36 + lVar44 * 4);
LAB_0027fa7e:
      uVar51 = lVar26 + lVar44;
      iVar23 = (int)uVar51;
      goto LAB_0027f8a9;
    }
  }
LAB_0027fa6b:
  puVar2[UF::length_] = UF::length_;
  uVar24 = UF::length_;
  UF::length_ = UF::length_ + 1;
  goto LAB_0027fa7e;
code_r0x00280651:
  puVar22[UF::length_] = UF::length_;
  uVar24 = UF::length_ + 1;
  *(uint *)(lVar35 + lVar38 * 4) = UF::length_;
  UF::length_ = uVar24;
  lVar47 = lVar47 + 0x200000000;
  lVar52 = lVar52 + 8;
  lVar43 = lVar11 + lVar38;
  lVar38 = lVar38 + 2;
  if ((long)uVar10 <= lVar43 + 2) {
    iVar23 = iVar23 + (int)lVar38;
    uVar24 = iVar29 + (int)lVar38;
    goto LAB_002806d3;
  }
  goto LAB_00280612;
LAB_00284b5d:
  uVar28 = uVar14 & 0xffffffff;
  uVar24 = puVar2[iVar23];
LAB_00288196:
  puVar2[uVar14] = uVar24;
  iVar23 = (int)uVar28;
  uVar24 = iVar23 + 2;
  if ((int)uVar24 < local_e8) {
    lVar42 = (long)iVar23;
    lVar11 = lVar42 + 2;
    lVar38 = lVar42 << 0x20;
    lVar12 = lVar48 + lVar42 * 4;
    lVar41 = lVar12 + lVar33 + 8;
    lVar13 = lVar36 + lVar27 + lVar42;
    lVar52 = lVar13 + 3;
    lVar25 = lVar36 + lVar17 * lVar20 + lVar42;
    lVar35 = 0;
    lVar47 = 0;
LAB_00288228:
    lVar45 = lVar38 >> 0x1e;
    lVar43 = lVar38 >> 0x20;
    if (*(char *)(lVar13 + 2 + lVar47) != '\0') {
      if (*(char *)(lVar25 + 3 + lVar47) != '\0') {
        uVar14 = lVar11 + lVar47;
        if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar42 + lVar36) == '\0') {
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = *(uint *)((long)puVar2 + lVar45);
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
LAB_00288c38:
          if (uVar24 <= uVar8) {
            UF::P_[uVar28] = uVar24;
            goto LAB_00288c4a;
          }
        }
        else {
          if (pcVar34[lVar43] == '\0') {
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar2[lVar43];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            goto LAB_00288c38;
          }
          if (pcVar34[lVar43 + (1 - lVar17)] != '\0') {
            *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar43];
            goto LAB_002873f3;
          }
          uVar24 = puVar50[lVar43];
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
          if (uVar24 <= uVar8) {
            UF::P_[uVar8] = uVar24;
            goto LAB_00288c4a;
          }
        }
        uVar24 = uVar8;
        UF::P_[uVar51] = uVar24;
LAB_00288c4a:
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        goto LAB_002873f3;
      }
      if (*(char *)(lVar52 + lVar47) != '\0') {
        if (*(char *)(lVar25 + 4 + lVar47) != '\0') {
          lVar13 = lVar17 * lVar31 + lVar42 + lVar36;
          if (*(char *)(lVar47 + 3 + lVar13) == '\0') {
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 0x10 + lVar47 * 4);
            do {
              uVar8 = uVar24;
              uVar14 = (ulong)uVar8;
              uVar24 = UF::P_[uVar14];
              uVar9 = *(uint *)((long)puVar2 + lVar45);
            } while (UF::P_[uVar14] < uVar8);
            do {
              uVar24 = uVar9;
              uVar28 = (ulong)uVar24;
              uVar9 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
          }
          else if (*(char *)(lVar47 + 2 + lVar13) == '\0') {
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
            do {
              uVar8 = uVar24;
              uVar14 = (ulong)uVar8;
              uVar24 = UF::P_[uVar14];
              uVar9 = *(uint *)((long)puVar2 + lVar45);
            } while (UF::P_[uVar14] < uVar8);
            do {
              uVar24 = uVar9;
              uVar28 = (ulong)uVar24;
              uVar9 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
          }
          else {
            if (pcVar34[lVar43] != '\0') {
              uVar24 = puVar50[lVar43];
              if (pcVar34[lVar43 + (1 - lVar17)] != '\0') goto LAB_0028875a;
              do {
                uVar8 = uVar24;
                uVar14 = (ulong)uVar8;
                uVar24 = UF::P_[uVar14];
                uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
              } while (UF::P_[uVar14] < uVar8);
              do {
                uVar24 = uVar9;
                uVar28 = (ulong)uVar24;
                uVar9 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
              goto LAB_00289ccf;
            }
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
            do {
              uVar8 = uVar24;
              uVar14 = (ulong)uVar8;
              uVar24 = UF::P_[uVar14];
              uVar9 = puVar2[lVar43];
            } while (UF::P_[uVar14] < uVar8);
            do {
              uVar24 = uVar9;
              uVar28 = (ulong)uVar24;
              uVar9 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
          }
          goto LAB_0028990d;
        }
        goto LAB_0028827c;
      }
      uVar14 = lVar11 + lVar47;
      uVar24 = *(uint *)((long)puVar2 + lVar45);
      goto LAB_00284bb6;
    }
    if (*(char *)(lVar36 + lVar17 * lVar32 + lVar42 + 2 + lVar47) == '\0') {
      uVar14 = lVar11 + lVar47;
      lVar11 = lVar38 + 0x300000000 >> 0x20;
      if (*(char *)(lVar26 + lVar11) == '\0') {
        if (pcVar1[lVar11] == '\0') {
          puVar22 = (uint *)(lVar35 + lVar12 + lVar33 + 8);
          goto LAB_002828ac;
        }
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
        UF::length_ = uVar24;
        iVar23 = (int)uVar14;
        goto LAB_002834ce;
      }
      if (pcVar34[lVar11] != '\0') {
        *(undefined4 *)(lVar41 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        goto LAB_00284ea6;
      }
      lVar11 = lVar38 + 0x400000000 >> 0x20;
      if (pcVar34[lVar11] != '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar11];
        goto LAB_0028494f;
      }
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_ + 1;
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
      UF::length_ = uVar24;
LAB_00289d43:
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_0028056a;
    }
    if (*(char *)(lVar52 + lVar47) == '\0') {
      uVar14 = (ulong)(uint)((int)lVar11 + (int)lVar47);
      *(undefined4 *)(lVar12 + lVar33 + 8 + lVar47 * 4) = *(undefined4 *)((long)puVar2 + lVar45);
      goto LAB_0028586f;
    }
    if (*(char *)(lVar25 + 3 + lVar47) != '\0') goto LAB_00288670;
    if (*(char *)(lVar25 + 4 + lVar47) == '\0') {
LAB_0028827c:
      *(undefined4 *)(lVar41 + lVar47 * 4) = *(undefined4 *)(lVar12 + lVar33 + lVar47 * 4);
      lVar38 = lVar38 + 0x200000000;
      lVar35 = lVar35 + 8;
      lVar43 = lVar11 + lVar47;
      lVar47 = lVar47 + 2;
      if ((long)uVar10 <= lVar43 + 2) {
        iVar23 = iVar23 + (int)lVar47;
        uVar24 = (int)lVar11 + (int)lVar47;
        goto LAB_002882d7;
      }
      goto LAB_00288228;
    }
    lVar13 = lVar17 * lVar31 + lVar42 + lVar36;
    if (*(char *)(lVar47 + 3 + lVar13) == '\0') {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 0x10 + lVar47 * 4);
      do {
        uVar8 = uVar24;
        uVar14 = (ulong)uVar8;
        uVar24 = UF::P_[uVar14];
        uVar9 = *(uint *)((long)puVar2 + lVar45);
      } while (UF::P_[uVar14] < uVar8);
      do {
        uVar24 = uVar9;
        uVar28 = (ulong)uVar24;
        uVar9 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
LAB_0028990d:
      if (uVar8 < uVar24) {
LAB_00289912:
        uVar24 = uVar8;
        UF::P_[uVar28] = uVar24;
      }
      else {
        UF::P_[uVar14] = uVar24;
      }
    }
    else {
      if (*(char *)(lVar47 + 2 + lVar13) == '\0') {
        uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        do {
          uVar8 = uVar24;
          uVar14 = (ulong)uVar8;
          uVar24 = UF::P_[uVar14];
          uVar9 = *(uint *)((long)puVar2 + lVar45);
        } while (UF::P_[uVar14] < uVar8);
        do {
          uVar24 = uVar9;
          uVar28 = (ulong)uVar24;
          uVar9 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
        goto LAB_0028990d;
      }
      if (pcVar34[lVar43] == '\0') {
        uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        do {
          uVar8 = uVar24;
          uVar14 = (ulong)uVar8;
          uVar24 = UF::P_[uVar14];
          uVar9 = puVar2[lVar43];
        } while (UF::P_[uVar14] < uVar8);
        do {
          uVar24 = uVar9;
          uVar28 = (ulong)uVar24;
          uVar9 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
        goto LAB_0028990d;
      }
      uVar24 = puVar50[lVar43];
      if (pcVar34[lVar43 + (1 - lVar17)] != '\0') {
LAB_0028875a:
        uVar14 = lVar11 + lVar47;
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        goto LAB_0028494f;
      }
      do {
        uVar8 = uVar24;
        uVar14 = (ulong)uVar8;
        uVar24 = UF::P_[uVar14];
        uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      } while (UF::P_[uVar14] < uVar8);
      do {
        uVar24 = uVar9;
        uVar28 = (ulong)uVar24;
        uVar9 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
LAB_00289ccf:
      if (uVar8 < uVar24) goto LAB_00289912;
      UF::P_[uVar14] = uVar24;
    }
    uVar14 = lVar11 + lVar47;
LAB_00289938:
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
    goto LAB_0028494f;
  }
LAB_002882d7:
  uVar51 = (ulong)uVar24;
  uVar28 = uVar51;
  if (local_e8 < (int)uVar24) goto LAB_00285011;
  if (*(char *)(lVar26 + uVar51) == '\0') {
    uVar14 = (ulong)(iVar23 + 3);
    if (pcVar1[uVar51] == '\0') {
      if (*(char *)(lVar26 + uVar14) == '\0') {
        cVar7 = pcVar1[uVar14];
        goto joined_r0x00282a52;
      }
      cVar7 = pcVar34[uVar14];
      goto joined_r0x00281033;
    }
    if ((*(char *)(lVar26 + uVar14) == '\0') || (pcVar34[uVar14] == '\0')) {
      puVar2[uVar51] = puVar2[iVar23];
      goto LAB_00289fad;
    }
    if (pcVar34[uVar51 - lVar17] == '\0') {
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[iVar23];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else if (pcVar34[iVar23] == '\0') {
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[iVar23];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else {
      uVar24 = puVar50[iVar23];
      if (pcVar34[(long)iVar23 + (1 - lVar17)] != '\0') goto LAB_00288333;
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar50[uVar51];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
  }
  else {
    if (pcVar34[(long)iVar23 + 3] == '\0') {
      puVar2[uVar51] = puVar2[iVar23];
      goto LAB_00289fad;
    }
    if (pcVar34[uVar51 - lVar17] == '\0') {
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[iVar23];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else {
      if (pcVar34[iVar23] == '\0') {
        uVar24 = puVar50[uVar51];
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = puVar2[iVar23];
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
        goto LAB_00289f91;
      }
      uVar24 = puVar50[iVar23];
      if (pcVar34[(long)iVar23 + (1 - lVar17)] != '\0') {
LAB_00288333:
        puVar2[uVar51] = uVar24;
        goto LAB_00289fad;
      }
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar50[uVar51];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
  }
  goto LAB_00289f91;
LAB_00288670:
  uVar14 = lVar11 + lVar47;
  if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar42 + lVar36) == '\0') {
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
    do {
      uVar8 = uVar24;
      uVar24 = UF::P_[uVar8];
      uVar9 = *(uint *)((long)puVar2 + lVar45);
    } while (UF::P_[uVar8] < uVar8);
    do {
      uVar24 = uVar9;
      uVar9 = UF::P_[uVar24];
    } while (UF::P_[uVar24] < uVar24);
    if (uVar8 < uVar24) {
      UF::P_[uVar24] = uVar8;
      uVar24 = uVar8;
    }
    else {
      UF::P_[uVar8] = uVar24;
    }
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
  }
  else {
    if (pcVar34[lVar43] == '\0') {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = puVar2[lVar43];
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
    }
    else {
      if (pcVar34[lVar43 + (1 - lVar17)] != '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar43];
        goto LAB_00284ea6;
      }
      uVar24 = puVar50[lVar43];
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
    }
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
  }
LAB_00284ea6:
  puVar22 = UF::P_;
  uVar24 = (int)uVar14 + 2;
  uVar28 = (ulong)uVar24;
  if ((int)uVar24 < local_e8) {
    lVar11 = (long)(int)uVar14;
    uVar28 = lVar11 + 2;
    while( true ) {
      uVar14 = uVar28;
      iVar23 = (int)lVar11;
      if (*(char *)(lVar26 + uVar14) != '\0') goto LAB_00284fc7;
      cVar7 = *(char *)(lVar11 + 3 + lVar26);
      if (pcVar1[uVar14] == '\0') break;
      if (cVar7 == '\0') {
        uVar24 = puVar2[iVar23];
        goto LAB_0028514f;
      }
      if (pcVar34[lVar11 + 3] == '\0') {
        lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
        if (pcVar34[lVar12] == '\0') goto LAB_00287b70;
        if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
          uVar24 = puVar50[lVar12];
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar2[iVar23];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
          goto LAB_00288fe1;
        }
        if (pcVar34[uVar14] != '\0') goto LAB_002877bb;
        if (pcVar34[uVar14 - lVar17] == '\0') {
          uVar24 = puVar50[uVar14];
          do {
            uVar9 = uVar24;
            uVar28 = (ulong)uVar9;
            uVar24 = UF::P_[uVar28];
            uVar8 = puVar2[iVar23];
          } while (UF::P_[uVar28] < uVar9);
          do {
            uVar24 = uVar8;
            uVar51 = (ulong)uVar24;
            uVar8 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
          goto LAB_00289db0;
        }
        goto LAB_0028814c;
      }
      if (pcVar34[uVar14] != '\0') goto LAB_00284f21;
      if (pcVar34[uVar14 - lVar17] == '\0') {
        uVar24 = puVar50[uVar14];
        do {
          uVar8 = uVar24;
          uVar24 = puVar22[uVar8];
          uVar9 = puVar2[lVar11];
        } while (puVar22[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = puVar22[uVar24];
        } while (puVar22[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          puVar22[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          puVar22[uVar8] = uVar24;
        }
      }
      else {
        uVar24 = puVar50[lVar11];
      }
LAB_00284f25:
      puVar2[uVar14] = uVar24;
      uVar28 = uVar14 + 2;
      lVar11 = lVar11 + 2;
      if ((long)uVar10 <= (long)uVar28) goto LAB_0028500d;
    }
    if (cVar7 == '\0') {
      cVar7 = pcVar1[lVar11 + 3];
      goto joined_r0x002818c3;
    }
    if (pcVar34[lVar11 + 3] != '\0') {
LAB_00284f21:
      uVar24 = puVar50[uVar14];
      goto LAB_00284f25;
    }
    lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
    cVar7 = pcVar34[uVar14];
    uVar24 = UF::length_;
    if (pcVar34[lVar12] == '\0') goto joined_r0x00282364;
    if (cVar7 == '\0') {
LAB_00288a81:
      uVar24 = puVar50[lVar12];
LAB_002890b2:
      puVar2[uVar14] = uVar24;
    }
    else {
      uVar24 = puVar50[uVar14];
      if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
        do {
          uVar9 = uVar24;
          uVar28 = (ulong)uVar9;
          uVar24 = UF::P_[uVar28];
          uVar8 = puVar50[lVar12];
        } while (UF::P_[uVar28] < uVar9);
        do {
          uVar24 = uVar8;
          uVar51 = (ulong)uVar24;
          uVar8 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_00289db0;
      }
LAB_002852f5:
      puVar2[uVar14] = uVar24;
    }
    goto LAB_0028494f;
  }
LAB_0028500d:
  local_a8 = (int)uVar14;
  if (local_e8 < (int)uVar28) goto LAB_00285011;
  uVar51 = uVar28 & 0xffffffff;
  if (*(char *)(lVar26 + uVar51) == '\0') {
    uVar14 = (ulong)(local_a8 + 3);
    cVar7 = *(char *)(lVar26 + uVar14);
    if (pcVar1[uVar51] == '\0') {
LAB_00285129:
      if (cVar7 == '\0') goto LAB_00285d43;
      cVar7 = pcVar34[uVar14];
joined_r0x0028184d:
      if (cVar7 != '\0') goto LAB_0028785d;
      cVar7 = pcVar34[uVar51];
joined_r0x002809df:
      if (cVar7 == '\0') goto LAB_00289148;
      goto LAB_0028785d;
    }
    if ((cVar7 == '\0') || (pcVar34[uVar14] == '\0')) goto LAB_00285121;
    if (pcVar34[uVar51] != '\0') goto LAB_0028785d;
    if (pcVar34[uVar51 - lVar17] == '\0') {
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[local_a8];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
      goto LAB_00289f91;
    }
LAB_00287755:
    uVar24 = puVar50[local_a8];
    goto LAB_00289fa8;
  }
  lVar26 = (long)local_a8;
  if (pcVar34[lVar26 + 3] == '\0') goto LAB_00287961;
  if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
  if (pcVar34[uVar51 - lVar17] != '\0') {
LAB_002877ef:
    uVar24 = puVar50[lVar26];
    goto LAB_00289fa8;
  }
  uVar24 = puVar50[uVar51];
  do {
    uVar9 = uVar24;
    uVar14 = (ulong)uVar9;
    uVar24 = UF::P_[uVar14];
    uVar8 = puVar2[lVar26];
  } while (UF::P_[uVar14] < uVar9);
  do {
    uVar24 = uVar8;
    uVar28 = (ulong)uVar24;
    uVar8 = UF::P_[uVar28];
  } while (UF::P_[uVar28] < uVar24);
LAB_00289f91:
  puVar22 = UF::P_;
  if (uVar9 < uVar24) {
LAB_00289f96:
    uVar24 = uVar9;
    puVar22[uVar28] = uVar24;
  }
  else {
    UF::P_[uVar14] = uVar24;
  }
LAB_00289fa8:
  puVar2[uVar51] = uVar24;
LAB_00289fad:
  lVar40 = lVar40 + 2;
  lVar31 = lVar31 + 2;
  lVar20 = lVar20 + 2;
  lVar32 = lVar32 + 2;
  if (*(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 <= lVar40)
  goto LAB_0028a4b8;
  goto LAB_0027fcf8;
LAB_00284fc7:
  lVar12 = lVar11 << 0x20;
  lVar13 = lVar12 + 0x300000000 >> 0x20;
  if (pcVar34[lVar13] != '\0') {
    if (pcVar34[uVar14] != '\0') {
LAB_00284ff5:
      puVar2[uVar14] = puVar50[uVar14];
      goto LAB_002873f3;
    }
    if (pcVar34[uVar14 - lVar17] == '\0') {
      uVar24 = puVar50[uVar14];
      do {
        uVar8 = uVar24;
        uVar28 = (ulong)uVar8;
        uVar24 = UF::P_[uVar28];
        uVar9 = puVar2[iVar23];
      } while (UF::P_[uVar28] < uVar8);
      do {
        uVar24 = uVar9;
        uVar51 = (ulong)uVar24;
        uVar9 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
LAB_002855db:
      if (uVar8 < uVar24) {
        UF::P_[uVar51] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar28] = uVar24;
      }
    }
    else {
LAB_002853f7:
      uVar24 = puVar50[(int)lVar11];
    }
    puVar2[uVar14] = uVar24;
    goto LAB_002873f3;
  }
  if (*(char *)(lVar26 + lVar13) == '\0') {
    uVar24 = *(uint *)((long)puVar2 + (lVar12 >> 0x1e));
LAB_002854c6:
    uVar28 = uVar14 & 0xffffffff;
LAB_00287c5a:
    puVar2[uVar14] = uVar24;
    puVar22 = UF::P_;
    iVar23 = (int)uVar28;
    lVar11 = (long)iVar23;
    uVar14 = lVar11 + 2;
    if (local_e8 <= (int)uVar14) {
      uVar51 = uVar14 & 0xffffffff;
      if (local_e8 < (int)uVar14) {
        if (*(char *)(lVar26 + uVar51) == '\0') {
          if (pcVar1[uVar51] == '\0') goto LAB_0028881d;
          if (pcVar1[lVar11 + 1] == '\0') goto LAB_00289148;
        }
        else {
          cVar7 = pcVar34[uVar51];
          if (pcVar1[iVar23 + 1] == '\0') goto joined_r0x00281033;
          if (cVar7 != '\0') {
            if (pcVar34[lVar11] == '\0') {
              uVar24 = puVar50[uVar51];
              do {
                uVar9 = uVar24;
                uVar14 = (ulong)uVar9;
                uVar24 = UF::P_[uVar14];
                uVar8 = puVar2[lVar11];
              } while (UF::P_[uVar14] < uVar9);
              do {
                uVar24 = uVar8;
                uVar28 = (ulong)uVar24;
                uVar8 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
            }
            else {
              uVar24 = puVar50[lVar11];
              if (pcVar34[(ulong)(iVar23 + 1) - lVar17] != '\0') goto LAB_00284d04;
              do {
                uVar9 = uVar24;
                uVar14 = (ulong)uVar9;
                uVar24 = UF::P_[uVar14];
                uVar8 = puVar50[uVar51];
              } while (UF::P_[uVar14] < uVar9);
              do {
                uVar24 = uVar8;
                uVar28 = (ulong)uVar24;
                uVar8 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
            }
            goto LAB_00289f91;
          }
        }
LAB_00287e33:
        uVar24 = puVar2[lVar11];
        goto LAB_00289fa8;
      }
      if (*(char *)(lVar26 + uVar51) == '\0') {
        uVar14 = (ulong)(iVar23 + 3);
        if (pcVar1[uVar51] == '\0') {
          if (*(char *)(lVar26 + uVar14) == '\0') goto LAB_00288813;
          cVar21 = pcVar34[uVar14];
joined_r0x00285d38:
          if (cVar21 == '\0') goto LAB_00289138;
          goto LAB_00287d9f;
        }
        if (*(char *)(lVar26 + uVar14) == '\0') {
          if (pcVar1[lVar11 + 1] == '\0') goto LAB_00289148;
LAB_00288bd0:
          uVar24 = puVar2[lVar11];
          goto LAB_00289fa8;
        }
        uVar28 = (ulong)(iVar23 + 1);
        cVar21 = pcVar34[uVar14];
        if (pcVar1[uVar28] == '\0') goto joined_r0x00285d38;
        if (cVar21 == '\0') {
          if (pcVar34[uVar51] == '\0') goto LAB_00288bd0;
          if (pcVar34[lVar11] == '\0') {
            uVar24 = puVar50[uVar51];
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar2[lVar11];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
            goto LAB_00289f91;
          }
          uVar24 = puVar50[lVar11];
          if (pcVar34[uVar28 - lVar17] != '\0') goto LAB_00284d04;
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
LAB_002895ae:
          if (uVar8 < uVar24) {
            UF::P_[uVar28] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar14] = uVar24;
          }
          puVar2[uVar51] = uVar24;
          goto LAB_00289fad;
        }
        if (pcVar34[lVar11] == '\0') {
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[lVar11];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        if (pcVar34[uVar28 - lVar17] != '\0') {
          if (pcVar34[uVar51] != '\0') goto LAB_00287d84;
          uVar24 = puVar50[lVar11];
          if (pcVar34[uVar51 - lVar17] == '\0') {
            do {
              uVar8 = uVar24;
              uVar14 = (ulong)uVar8;
              uVar24 = UF::P_[uVar14];
              uVar9 = puVar50[uVar51];
            } while (UF::P_[uVar14] < uVar8);
            do {
              uVar24 = uVar9;
              uVar28 = (ulong)uVar24;
              uVar9 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
            goto LAB_002895ae;
          }
LAB_00284d04:
          puVar2[uVar51] = uVar24;
          goto LAB_00289fad;
        }
        uVar24 = puVar50[lVar11];
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = puVar50[uVar51];
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
      }
      else {
        uVar14 = (ulong)(iVar23 + 1);
        cVar7 = pcVar34[lVar11 + 3];
        if (pcVar1[uVar14] == '\0') {
joined_r0x00283a97:
          if (cVar7 != '\0') goto LAB_00287d9f;
LAB_00289138:
          cVar7 = pcVar34[uVar51];
          goto joined_r0x00281033;
        }
        if (cVar7 == '\0') {
          if (pcVar34[uVar51] == '\0') goto LAB_00288bd0;
          if (pcVar34[lVar11] == '\0') {
            uVar24 = puVar50[uVar51];
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar2[lVar11];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
          }
          else {
            uVar24 = puVar50[lVar11];
            if (pcVar34[uVar14 - lVar17] != '\0') goto LAB_00284d04;
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar50[uVar51];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
          }
        }
        else if (pcVar34[lVar11] == '\0') {
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[lVar11];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        else {
          if (pcVar34[uVar14 - lVar17] == '\0') {
            uVar24 = puVar50[lVar11];
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar50[uVar51];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
            goto LAB_00289f91;
          }
          if (pcVar34[uVar51] != '\0') {
LAB_00287d84:
            uVar24 = puVar50[lVar11];
            goto LAB_00289fa8;
          }
          uVar24 = puVar50[lVar11];
          if (pcVar34[uVar51 - lVar17] != '\0') goto LAB_00284d04;
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
      }
      goto LAB_00289f91;
    }
    if (*(char *)(lVar26 + uVar14) == '\0') {
      cVar7 = *(char *)(lVar11 + 3 + lVar26);
      if (pcVar1[lVar11 + 2] == '\0') {
        if (cVar7 == '\0') {
          if (pcVar1[lVar11 + 3] != '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar24 = UF::length_ + 1;
            puVar2[lVar11 + 2] = UF::length_;
            UF::length_ = uVar24;
            goto LAB_002852a4;
          }
LAB_00287a3f:
          puVar22 = puVar2 + uVar14;
          goto LAB_002828ac;
        }
        if (pcVar34[lVar11 + 3] != '\0') {
LAB_00284e9c:
          uVar24 = puVar50[lVar11 + 2];
LAB_00284ea1:
          puVar2[lVar11 + 2] = uVar24;
          goto LAB_00284ea6;
        }
        cVar7 = pcVar34[lVar11 + 2];
        if (pcVar34[lVar11 + 4] == '\0') {
LAB_00288bda:
          if (cVar7 != '\0') {
            puVar2[lVar11 + 2] = puVar50[lVar11 + 2];
LAB_002899f5:
            uVar14 = uVar14 & 0xffffffff;
LAB_00284c69:
            iVar29 = (int)uVar14;
            lVar11 = (long)iVar29;
            uVar14 = lVar11 + 2;
            iVar23 = (int)uVar14;
            if (local_e8 <= iVar23) {
              if (local_e8 < iVar23) {
                uVar28 = uVar14 & 0xffffffff;
                goto LAB_00285011;
              }
              uVar51 = uVar14 & 0xffffffff;
              if (*(char *)(lVar26 + uVar51) == '\0') {
                uVar14 = (ulong)(iVar29 + 3);
                if (pcVar1[uVar51] == '\0') {
                  if (*(char *)(lVar26 + uVar14) != '\0') {
                    cVar7 = pcVar34[uVar14];
                    goto joined_r0x00281033;
                  }
                  cVar7 = pcVar1[uVar14];
                  goto joined_r0x00282a52;
                }
                if ((*(char *)(lVar26 + uVar14) == '\0') || (pcVar34[uVar14] == '\0'))
                goto LAB_00287e33;
                if (pcVar34[uVar51 - lVar17] == '\0') {
                  uVar24 = puVar50[uVar51];
                  do {
                    uVar9 = uVar24;
                    uVar14 = (ulong)uVar9;
                    uVar24 = UF::P_[uVar14];
                    uVar8 = puVar2[lVar11];
                  } while (UF::P_[uVar14] < uVar9);
                  do {
                    uVar24 = uVar8;
                    uVar28 = (ulong)uVar24;
                    uVar8 = UF::P_[uVar28];
                  } while (UF::P_[uVar28] < uVar24);
                }
                else {
                  uVar24 = puVar50[lVar11];
                  if (pcVar34[lVar11 + (1 - lVar17)] != '\0') goto LAB_00284d04;
                  do {
                    uVar9 = uVar24;
                    uVar14 = (ulong)uVar9;
                    uVar24 = UF::P_[uVar14];
                    uVar8 = puVar50[uVar51];
                  } while (UF::P_[uVar14] < uVar9);
                  do {
                    uVar24 = uVar8;
                    uVar28 = (ulong)uVar24;
                    uVar8 = UF::P_[uVar28];
                  } while (UF::P_[uVar28] < uVar24);
                }
              }
              else {
                if (pcVar34[lVar11 + 3] == '\0') {
                  uVar24 = puVar2[lVar11];
                  goto LAB_00287966;
                }
                if (pcVar34[uVar51 - lVar17] == '\0') {
                  uVar24 = puVar50[uVar51];
                  do {
                    uVar9 = uVar24;
                    uVar14 = (ulong)uVar9;
                    uVar24 = UF::P_[uVar14];
                    uVar8 = puVar2[lVar11];
                  } while (UF::P_[uVar14] < uVar9);
                  do {
                    uVar24 = uVar8;
                    uVar28 = (ulong)uVar24;
                    uVar8 = UF::P_[uVar28];
                  } while (UF::P_[uVar28] < uVar24);
                  goto LAB_00289f91;
                }
                uVar24 = puVar50[lVar11];
                if (pcVar34[lVar11 + (1 - lVar17)] != '\0') goto LAB_00284d04;
                do {
                  uVar9 = uVar24;
                  uVar14 = (ulong)uVar9;
                  uVar24 = UF::P_[uVar14];
                  uVar8 = puVar50[uVar51];
                } while (UF::P_[uVar14] < uVar9);
                do {
                  uVar24 = uVar8;
                  uVar28 = (ulong)uVar24;
                  uVar8 = UF::P_[uVar28];
                } while (UF::P_[uVar28] < uVar24);
              }
              goto LAB_00289f91;
            }
            if (*(char *)(lVar26 + uVar14) == '\0') {
              cVar7 = *(char *)(lVar11 + 3 + lVar26);
              if (pcVar1[lVar11 + 2] == '\0') {
                if (cVar7 == '\0') {
                  if (pcVar1[lVar11 + 3] == '\0') {
                    puVar22 = puVar2 + uVar14;
                    goto LAB_002828ac;
                  }
                  UF::P_[UF::length_] = UF::length_;
                  uVar24 = UF::length_ + 1;
                  puVar2[lVar11 + 2] = UF::length_;
                  UF::length_ = uVar24;
                  goto LAB_002834ce;
                }
                if (pcVar34[lVar11 + 3] != '\0') goto LAB_00284e9c;
                if (pcVar34[lVar11 + 4] != '\0') goto LAB_00285589;
                UF::P_[UF::length_] = UF::length_;
                uVar24 = UF::length_ + 1;
                puVar2[lVar11 + 2] = UF::length_;
                UF::length_ = uVar24;
                uVar14 = uVar14 & 0xffffffff;
                goto LAB_0028056a;
              }
              if (cVar7 == '\0') {
LAB_002880b3:
                puVar2[lVar11 + 2] = puVar2[lVar11];
LAB_0028586f:
                puVar22 = UF::P_;
                local_a8 = (int)uVar14;
                uVar24 = local_a8 + 2;
                if (local_e8 <= (int)uVar24) {
LAB_002859a9:
                  puVar22 = UF::P_;
                  uVar51 = (ulong)uVar24;
                  if (local_e8 < (int)uVar24) {
                    if (*(char *)(lVar26 + uVar51) == '\0') {
                      cVar7 = pcVar1[uVar51];
joined_r0x00285c93:
                      if (cVar7 == '\0') goto LAB_0028881d;
                      lVar26 = (long)local_a8;
                      cVar7 = pcVar1[lVar26 + 1];
joined_r0x0028163c:
                      if (cVar7 == '\0') goto LAB_00289148;
                      goto LAB_00288090;
                    }
                    uVar24 = local_a8 + 1;
                    if (pcVar1[uVar24] == '\0') {
                      if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
                      if (pcVar34[uVar24] == '\0') goto LAB_00289148;
                      lVar26 = (long)local_a8;
                      goto LAB_002877ef;
                    }
                    if (pcVar34[uVar24] == '\0') {
                      if (pcVar34[uVar51] != '\0') {
                        uVar24 = puVar50[uVar51];
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar2[local_a8];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      lVar26 = (long)local_a8;
                      goto LAB_00288090;
                    }
                    uVar24 = puVar50[local_a8];
                    do {
                      uVar9 = uVar24;
                      uVar14 = (ulong)uVar9;
                      uVar24 = UF::P_[uVar14];
                      uVar8 = puVar2[local_a8];
                    } while (UF::P_[uVar14] < uVar9);
                    do {
                      uVar24 = uVar8;
                      uVar28 = (ulong)uVar24;
                      uVar8 = UF::P_[uVar28];
                    } while (UF::P_[uVar28] < uVar24);
                  }
                  else if (*(char *)(lVar26 + uVar51) == '\0') {
                    uVar14 = (ulong)(local_a8 + 3);
                    cVar21 = *(char *)(lVar26 + uVar14);
                    if (pcVar1[uVar51] == '\0') {
LAB_00285d29:
                      if (cVar21 == '\0') goto LAB_00285d43;
                      cVar21 = pcVar34[uVar14];
                      goto joined_r0x00285d38;
                    }
                    lVar26 = (long)local_a8;
                    cVar7 = pcVar1[lVar26 + 1];
                    if (cVar21 == '\0') goto joined_r0x0028163c;
                    cVar21 = pcVar34[uVar14];
                    if (cVar7 == '\0') goto joined_r0x00285d38;
                    if (cVar21 == '\0') {
                      if (pcVar34[uVar51] != '\0') {
                        uVar24 = puVar50[uVar51];
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar2[lVar26];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      goto LAB_00288090;
                    }
                    uVar24 = puVar50[uVar51];
                    do {
                      uVar9 = uVar24;
                      uVar14 = (ulong)uVar9;
                      uVar24 = UF::P_[uVar14];
                      uVar8 = puVar2[lVar26];
                    } while (UF::P_[uVar14] < uVar9);
                    do {
                      uVar24 = uVar8;
                      uVar28 = (ulong)uVar24;
                      uVar8 = UF::P_[uVar28];
                    } while (UF::P_[uVar28] < uVar24);
                  }
                  else {
                    uVar24 = local_a8 + 1;
                    lVar26 = (long)local_a8;
                    if (pcVar1[uVar24] == '\0') {
                      if (pcVar34[lVar26 + 3] == '\0') {
                        if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
                        cVar7 = pcVar34[uVar24];
joined_r0x002861bf:
                        if (cVar7 == '\0') goto LAB_00289148;
                        goto LAB_002877ef;
                      }
                      if ((pcVar34[uVar51] != '\0') || (pcVar34[uVar24] == '\0')) goto LAB_00287d9f;
                      uVar24 = puVar50[lVar26];
                      if (pcVar34[uVar51 - lVar17] == '\0') {
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar50[uVar51];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      goto LAB_00284d04;
                    }
                    if (pcVar34[lVar26 + 3] != '\0') {
                      if (pcVar34[uVar51] != '\0') {
                        uVar24 = puVar50[uVar51];
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar2[lVar26];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      if (pcVar34[uVar24] == '\0') {
                        uVar24 = puVar50[uVar51];
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar2[lVar26];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      if (pcVar34[uVar51 - lVar17] != '\0') {
                        uVar24 = puVar50[lVar26];
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar2[lVar26];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      uVar24 = puVar50[lVar26];
                      do {
                        uVar8 = uVar24;
                        uVar24 = UF::P_[uVar8];
                        uVar9 = puVar50[uVar51];
                      } while (UF::P_[uVar8] < uVar8);
                      do {
                        uVar24 = uVar9;
                        uVar9 = UF::P_[uVar24];
                      } while (UF::P_[uVar24] < uVar24);
                      if (uVar8 < uVar24) {
                        UF::P_[uVar24] = uVar8;
                        uVar24 = uVar8;
                      }
                      else {
                        UF::P_[uVar8] = uVar24;
                      }
                      do {
                        uVar9 = uVar24;
                        uVar8 = puVar2[lVar26];
                        uVar24 = puVar22[uVar9];
                      } while (puVar22[uVar9] < uVar9);
                      do {
                        uVar24 = uVar8;
                        uVar28 = (ulong)uVar24;
                        uVar8 = puVar22[uVar28];
                      } while (puVar22[uVar28] < uVar24);
                      if (uVar9 < uVar24) goto LAB_00289f96;
                      puVar22[uVar9] = uVar24;
                      goto LAB_00289fa8;
                    }
                    if (pcVar34[uVar24] == '\0') {
                      if (pcVar34[uVar51] != '\0') {
                        uVar24 = puVar50[uVar51];
                        do {
                          uVar9 = uVar24;
                          uVar14 = (ulong)uVar9;
                          uVar24 = UF::P_[uVar14];
                          uVar8 = puVar2[lVar26];
                        } while (UF::P_[uVar14] < uVar9);
                        do {
                          uVar24 = uVar8;
                          uVar28 = (ulong)uVar24;
                          uVar8 = UF::P_[uVar28];
                        } while (UF::P_[uVar28] < uVar24);
                        goto LAB_00289f91;
                      }
                      goto LAB_00288090;
                    }
                    uVar24 = puVar50[lVar26];
                    do {
                      uVar9 = uVar24;
                      uVar14 = (ulong)uVar9;
                      uVar24 = UF::P_[uVar14];
                      uVar8 = puVar2[lVar26];
                    } while (UF::P_[uVar14] < uVar9);
                    do {
                      uVar24 = uVar8;
                      uVar28 = (ulong)uVar24;
                      uVar8 = UF::P_[uVar28];
                    } while (UF::P_[uVar28] < uVar24);
                  }
                  goto LAB_00289f91;
                }
                lVar42 = (long)local_a8;
                lVar11 = lVar42 + 2;
                lVar41 = lVar42 << 0x20;
                lVar25 = lVar36 + 3 + lVar27 + lVar42;
                lVar12 = lVar48 + lVar42 * 4;
                lVar38 = lVar33 + lVar12 + 8;
                lVar13 = lVar36 + lVar17 * lVar32 + lVar42;
                lVar35 = 0;
                lVar47 = 0;
LAB_002858f6:
                puVar16 = UF::P_;
                lVar52 = lVar41 >> 0x20;
                if (*(char *)(lVar25 + -1 + lVar47) != '\0') goto LAB_00285a94;
                if (*(char *)(lVar13 + 2 + lVar47) == '\0') {
                  uVar14 = lVar11 + lVar47;
                  iVar23 = (int)uVar14;
                  lVar13 = lVar41 + 0x300000000 >> 0x20;
                  if (*(char *)(lVar26 + lVar13) == '\0') {
                    if (pcVar1[lVar13] != '\0') {
                      UF::P_[UF::length_] = UF::length_;
                      uVar24 = UF::length_ + 1;
                      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
                      UF::length_ = uVar24;
                      goto LAB_002834ce;
                    }
                    uVar14 = uVar14 & 0xffffffff;
                    puVar22 = (uint *)(lVar35 + lVar12 + lVar33 + 8);
                    goto LAB_002828ac;
                  }
                  if (pcVar34[lVar13] != '\0') {
                    *(undefined4 *)(lVar38 + lVar47 * 4) =
                         *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                    goto LAB_00286202;
                  }
                  lVar25 = lVar41 + 0x400000000 >> 0x20;
                  cVar7 = *(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36);
                  if (pcVar34[lVar25] == '\0') {
                    if (cVar7 == '\0') {
                      UF::P_[UF::length_] = UF::length_;
                      uVar24 = UF::length_ + 1;
                      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
                      UF::length_ = uVar24;
                      goto LAB_0028056a;
                    }
                    *(undefined4 *)(lVar38 + lVar47 * 4) =
                         *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                    goto LAB_00284c69;
                  }
                  if (cVar7 == '\0') {
                    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar25];
LAB_00286afe:
                    uVar14 = lVar11 + lVar47;
                  }
                  else {
                    uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                    if (pcVar34[lVar13 - lVar17] == '\0') {
                      do {
                        uVar8 = uVar24;
                        uVar14 = (ulong)uVar8;
                        uVar24 = UF::P_[uVar14];
                        uVar9 = puVar50[lVar25];
                      } while (UF::P_[uVar14] < uVar8);
                      do {
                        uVar24 = uVar9;
                        uVar28 = (ulong)uVar24;
                        uVar9 = UF::P_[uVar28];
                      } while (UF::P_[uVar28] < uVar24);
                      if (uVar8 < uVar24) {
LAB_002869a3:
                        UF::P_[uVar28] = uVar8;
                      }
                      else {
LAB_00286de7:
                        UF::P_[uVar14] = uVar24;
                        uVar8 = uVar24;
                      }
                      uVar14 = lVar11 + lVar47;
LAB_00286dfd:
                      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar8;
LAB_00286f3d:
                      uVar14 = uVar14 & 0xffffffff;
                    }
                    else {
LAB_002860aa:
                      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
                      uVar14 = uVar14 & 0xffffffff;
                    }
                  }
                  goto LAB_0028494f;
                }
                if (*(char *)(lVar25 + lVar47) == '\0') goto code_r0x00285917;
                uVar14 = lVar11 + lVar47;
                lVar13 = lVar17 * lVar20 + lVar42 + lVar36;
                cVar7 = *(char *)(lVar47 + 3 + lVar13);
                if (pcVar1[lVar52 + 1] == '\0') {
                  if (cVar7 != '\0') {
                    *(undefined4 *)(lVar38 + lVar47 * 4) =
                         *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                    uVar14 = uVar14 & 0xffffffff;
                    goto LAB_00284ea6;
                  }
                  lVar25 = lVar41 + 0x400000000 >> 0x20;
                  cVar7 = *(char *)(lVar47 + 2 + lVar13);
                  if (pcVar34[lVar25] == '\0') {
                    if (cVar7 != '\0') {
                      *(undefined4 *)(lVar38 + lVar47 * 4) =
                           *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                      goto LAB_00284c69;
                    }
                    UF::P_[UF::length_] = UF::length_;
                    uVar24 = UF::length_ + 1;
                    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
                    UF::length_ = uVar24;
                    goto LAB_0028056a;
                  }
                  if (cVar7 == '\0') {
                    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar25];
                    goto LAB_00286afe;
                  }
                  uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                  if (*(char *)(lVar47 + 3 + lVar17 * lVar31 + lVar42 + lVar36) == '\0') {
                    do {
                      uVar8 = uVar24;
                      uVar14 = (ulong)uVar8;
                      uVar24 = UF::P_[uVar14];
                      uVar9 = puVar50[lVar25];
                    } while (UF::P_[uVar14] < uVar8);
                    do {
                      uVar24 = uVar9;
                      uVar28 = (ulong)uVar24;
                      uVar9 = UF::P_[uVar28];
                    } while (UF::P_[uVar28] < uVar24);
                    if (uVar8 < uVar24) goto LAB_002869a3;
                    goto LAB_00286de7;
                  }
                  *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
LAB_00286416:
                  uVar14 = uVar14 & 0xffffffff;
                  goto LAB_0028494f;
                }
                if (cVar7 != '\0') goto code_r0x00285c24;
                lVar25 = lVar41 + 0x400000000 >> 0x20;
                if (pcVar34[lVar25] == '\0') {
                  if (*(char *)(lVar47 + 2 + lVar13) == '\0') {
                    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar2[lVar52];
                    goto LAB_0028056a;
                  }
                  uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                  do {
                    uVar8 = uVar24;
                    uVar24 = UF::P_[uVar8];
                    uVar9 = puVar2[lVar52];
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar9 = UF::P_[uVar24];
                  } while (UF::P_[uVar24] < uVar24);
                  if (uVar8 < uVar24) {
                    UF::P_[uVar24] = uVar8;
                    uVar24 = uVar8;
                  }
                  else {
                    UF::P_[uVar8] = uVar24;
                  }
                  *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
                  goto LAB_00284c69;
                }
                if (*(char *)(lVar47 + 3 + lVar17 * lVar31 + lVar42 + lVar36) != '\0') {
                  uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                  do {
                    uVar9 = uVar24;
                    uVar14 = (ulong)uVar9;
                    uVar24 = UF::P_[uVar14];
                    uVar8 = puVar2[lVar52];
                  } while (UF::P_[uVar14] < uVar9);
                  do {
                    uVar24 = uVar8;
                    uVar28 = (ulong)uVar24;
                    uVar8 = UF::P_[uVar28];
                  } while (UF::P_[uVar28] < uVar24);
                  goto LAB_0028614e;
                }
                if (*(char *)(lVar47 + 2 + lVar13) != '\0') {
                  uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
                  do {
                    uVar8 = uVar24;
                    uVar24 = UF::P_[uVar8];
                    uVar9 = puVar50[lVar25];
                  } while (UF::P_[uVar8] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar9 = UF::P_[uVar24];
                  } while (UF::P_[uVar24] < uVar24);
                  if (uVar8 < uVar24) {
                    UF::P_[uVar24] = uVar8;
                    uVar24 = uVar8;
                  }
                  else {
                    UF::P_[uVar8] = uVar24;
                  }
                  do {
                    uVar9 = uVar24;
                    uVar8 = puVar2[lVar52];
                    uVar24 = puVar16[uVar9];
                  } while (puVar16[uVar9] < uVar9);
                  do {
                    uVar24 = uVar8;
                    uVar8 = puVar16[uVar24];
                  } while (puVar16[uVar24] < uVar24);
                  if (uVar9 < uVar24) {
                    puVar16[uVar24] = uVar9;
                    uVar24 = uVar9;
                  }
                  else {
                    puVar16[uVar9] = uVar24;
                  }
                  *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
                  goto LAB_00286f3d;
                }
                uVar24 = puVar50[lVar25];
                do {
                  uVar8 = uVar24;
                  uVar24 = UF::P_[uVar8];
                  uVar9 = puVar2[lVar52];
                } while (UF::P_[uVar8] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar9 = UF::P_[uVar24];
                } while (UF::P_[uVar24] < uVar24);
                if (uVar8 < uVar24) {
                  UF::P_[uVar24] = uVar8;
                  uVar24 = uVar8;
                }
                else {
                  UF::P_[uVar8] = uVar24;
                }
                *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
                uVar14 = uVar14 & 0xffffffff;
                goto LAB_0028494f;
              }
              if (pcVar34[lVar11 + 3] == '\0') {
                if (pcVar34[lVar11 + 4] == '\0') goto LAB_00285441;
                if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
                  uVar24 = puVar50[lVar11 + 4];
                  do {
                    uVar8 = uVar24;
                    uVar28 = (ulong)uVar8;
                    uVar24 = UF::P_[uVar28];
                    uVar9 = puVar2[lVar11];
                  } while (UF::P_[uVar28] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar51 = (ulong)uVar24;
                    uVar9 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar24);
                }
                else if (pcVar34[uVar14 - lVar17] == '\0') {
                  uVar24 = puVar50[lVar11 + 2];
                  do {
                    uVar8 = uVar24;
                    uVar28 = (ulong)uVar8;
                    uVar24 = UF::P_[uVar28];
                    uVar9 = puVar2[lVar11];
                  } while (UF::P_[uVar28] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar51 = (ulong)uVar24;
                    uVar9 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar24);
                }
                else {
                  uVar24 = puVar50[lVar11];
                  if (pcVar34[lVar11 + (1 - lVar17)] != '\0') goto LAB_00285437;
                  do {
                    uVar8 = uVar24;
                    uVar28 = (ulong)uVar8;
                    uVar24 = UF::P_[uVar28];
                    uVar9 = puVar50[lVar11 + 2];
                  } while (UF::P_[uVar28] < uVar8);
                  do {
                    uVar24 = uVar9;
                    uVar51 = (ulong)uVar24;
                    uVar9 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar24);
                }
                goto LAB_0028583a;
              }
              if (pcVar34[uVar14 - lVar17] == '\0') {
                uVar24 = puVar50[lVar11 + 2];
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar2[lVar11];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
              }
              else {
                if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
                  puVar2[lVar11 + 2] = puVar50[lVar11];
                  goto LAB_00284ea6;
                }
                uVar24 = puVar50[lVar11];
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar50[lVar11 + 2];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
              }
              if (uVar8 < uVar24) {
                UF::P_[uVar51] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar28] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
              goto LAB_00284ea6;
            }
            if (pcVar34[lVar11 + 3] != '\0') {
              if (pcVar34[uVar14 - lVar17] == '\0') {
                uVar24 = puVar50[lVar11 + 2];
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar2[lVar11];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
              }
              else {
                if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
                  puVar2[lVar11 + 2] = puVar50[lVar11];
                  goto LAB_002873f3;
                }
                uVar24 = puVar50[lVar11];
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar50[lVar11 + 2];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
              }
              if (uVar8 < uVar24) {
                UF::P_[uVar51] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar28] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
              goto LAB_002873f3;
            }
            if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
              uVar28 = uVar14 & 0xffffffff;
              uVar24 = puVar2[lVar11];
              goto LAB_00287c5a;
            }
            if (pcVar34[lVar11 + 4] == '\0') {
LAB_00285441:
              uVar28 = uVar14 & 0xffffffff;
              uVar24 = puVar2[lVar11];
              goto LAB_00288196;
            }
            if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
              uVar24 = puVar50[lVar11 + 4];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar2[lVar11];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            else if (pcVar34[uVar14 - lVar17] == '\0') {
              uVar24 = puVar50[lVar11 + 2];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar2[lVar11];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            else {
              uVar24 = puVar50[lVar11];
              if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
LAB_00285437:
                puVar2[lVar11 + 2] = uVar24;
                goto LAB_0028494f;
              }
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar50[lVar11 + 2];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
LAB_0028583a:
            if (uVar8 < uVar24) {
              UF::P_[uVar51] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar28] = uVar24;
            }
            puVar2[lVar11 + 2] = uVar24;
            goto LAB_0028494f;
          }
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          puVar2[lVar11 + 2] = UF::length_;
          UF::length_ = uVar24;
LAB_00289a1d:
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_0028056a;
        }
        if (cVar7 == '\0') {
LAB_00285589:
          uVar24 = puVar50[lVar11 + 4];
LAB_0028558e:
          puVar2[lVar11 + 2] = uVar24;
          goto LAB_0028494f;
        }
        uVar24 = puVar50[lVar11 + 2];
        if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar50[lVar11 + 4];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
          goto LAB_0028812f;
        }
      }
      else {
        if (cVar7 == '\0') {
          if (pcVar1[lVar11 + 1] != '\0') goto LAB_002880b3;
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          puVar2[lVar11 + 2] = UF::length_;
          UF::length_ = uVar24;
          goto LAB_0028586f;
        }
        if (pcVar1[lVar11 + 1] == '\0') {
          if (pcVar34[lVar11 + 3] != '\0') goto LAB_00284e9c;
          cVar7 = pcVar34[lVar11 + 2];
          if (pcVar34[lVar11 + 4] == '\0') goto LAB_00288bda;
          if (cVar7 == '\0') goto LAB_00285589;
          uVar24 = puVar50[lVar11 + 2];
          if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar50[lVar11 + 4];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            goto LAB_0028a136;
          }
        }
        else {
          if (pcVar34[lVar11 + 3] != '\0') {
            if (pcVar34[lVar11] == '\0') {
              uVar24 = puVar50[lVar11 + 2];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar2[lVar11];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            else if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
              uVar24 = puVar50[lVar11];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar50[lVar11 + 2];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            else {
              if (pcVar34[uVar14] != '\0') {
                uVar24 = puVar50[lVar11];
                goto LAB_00284ea1;
              }
              if (pcVar34[uVar14 - lVar17] != '\0') {
                puVar2[lVar11 + 2] = puVar50[lVar11];
                goto LAB_00284ea6;
              }
              uVar24 = puVar50[lVar11];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar50[lVar11 + 2];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            if (uVar8 < uVar24) {
              UF::P_[uVar51] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar28] = uVar24;
            }
            puVar2[lVar11 + 2] = uVar24;
            goto LAB_00284ea6;
          }
          if (pcVar34[lVar11 + 4] == '\0') {
            if (pcVar34[lVar11 + 2] != '\0') {
              if (pcVar34[lVar11] == '\0') {
                uVar24 = puVar50[lVar11 + 2];
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar2[lVar11];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
              }
              else {
                uVar24 = puVar50[lVar11];
                if (pcVar34[lVar11 + (1 - lVar17)] != '\0') goto LAB_00289839;
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar50[lVar11 + 2];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
              }
              if (uVar8 < uVar24) {
                UF::P_[uVar51] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar28] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
              uVar14 = uVar14 & 0xffffffff;
              goto LAB_00284c69;
            }
            goto LAB_00289843;
          }
          if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
            if (pcVar34[uVar14] == '\0') {
              uVar24 = puVar50[lVar11 + 4];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar2[lVar11];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
LAB_0028a136:
              if (uVar8 < uVar24) {
                UF::P_[uVar51] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar28] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            else if (pcVar34[lVar11] == '\0') {
              uVar24 = puVar50[lVar11 + 2];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[lVar11 + 4];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              do {
                uVar9 = uVar24;
                uVar8 = puVar2[lVar11];
                uVar24 = puVar22[uVar9];
              } while (puVar22[uVar9] < uVar9);
              do {
                uVar24 = uVar8;
                uVar8 = puVar22[uVar24];
              } while (puVar22[uVar24] < uVar24);
              if (uVar9 < uVar24) {
                puVar22[uVar24] = uVar9;
                uVar24 = uVar9;
              }
              else {
                puVar22[uVar9] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            else if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
              uVar24 = puVar50[lVar11];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[lVar11 + 2];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              do {
                uVar9 = uVar24;
                uVar8 = puVar50[lVar11 + 4];
                uVar24 = puVar22[uVar9];
              } while (puVar22[uVar9] < uVar9);
              do {
                uVar24 = uVar8;
                uVar8 = puVar22[uVar24];
              } while (puVar22[uVar24] < uVar24);
              if (uVar9 < uVar24) {
                puVar22[uVar24] = uVar9;
                uVar24 = uVar9;
              }
              else {
                puVar22[uVar9] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            else {
              uVar24 = puVar50[lVar11];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[lVar11 + 4];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            goto LAB_0028494f;
          }
          if (pcVar34[lVar11] == '\0') {
            uVar24 = puVar50[lVar11 + 2];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar2[lVar11];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            goto LAB_00289e99;
          }
          if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
            uVar24 = puVar50[lVar11];
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = puVar50[lVar11 + 2];
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            puVar2[lVar11 + 2] = uVar24;
            goto LAB_0028494f;
          }
          if (pcVar34[uVar14] != '\0') goto LAB_00288d73;
          uVar24 = puVar50[lVar11];
          if (pcVar34[uVar14 - lVar17] == '\0') {
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = puVar50[lVar11 + 2];
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            puVar2[lVar11 + 2] = uVar24;
            goto LAB_0028494f;
          }
        }
      }
    }
    else {
      if (pcVar1[lVar11 + 1] != '\0') {
        if (pcVar34[lVar11 + 3] != '\0') {
          if (pcVar34[lVar11] == '\0') {
            uVar24 = puVar50[lVar11 + 2];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar2[lVar11];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
          }
          else if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
            uVar24 = puVar50[lVar11];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar50[lVar11 + 2];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
          }
          else {
            if (pcVar34[uVar14] != '\0') {
              uVar24 = puVar50[lVar11];
              goto LAB_00287e0f;
            }
            if (pcVar34[uVar14 - lVar17] != '\0') {
              puVar2[lVar11 + 2] = puVar50[lVar11];
              goto LAB_002873f3;
            }
            uVar24 = puVar50[lVar11];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar50[lVar11 + 2];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
          }
          if (uVar8 < uVar24) {
            UF::P_[uVar51] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar28] = uVar24;
          }
          puVar2[lVar11 + 2] = uVar24;
          goto LAB_002873f3;
        }
        if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
          if (pcVar34[lVar11 + 2] == '\0') {
            puVar2[lVar11 + 2] = puVar2[lVar11];
            goto LAB_00280c65;
          }
          if (pcVar34[lVar11] == '\0') {
            uVar24 = puVar50[lVar11 + 2];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar2[lVar11];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
          }
          else {
            if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
              puVar2[lVar11 + 2] = puVar50[lVar11];
              goto LAB_0027ffb2;
            }
            uVar24 = puVar50[lVar11];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar50[lVar11 + 2];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
          }
          if (uVar8 < uVar24) {
            UF::P_[uVar51] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar28] = uVar24;
          }
          puVar2[lVar11 + 2] = uVar24;
          goto LAB_0027ffb2;
        }
        if (pcVar34[lVar11 + 4] == '\0') {
          if (pcVar34[lVar11 + 2] != '\0') {
            if (pcVar34[lVar11] == '\0') {
              uVar24 = puVar50[lVar11 + 2];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar2[lVar11];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            else {
              uVar24 = puVar50[lVar11];
              if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
LAB_00289839:
                puVar2[lVar11 + 2] = uVar24;
                goto LAB_0028177f;
              }
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar50[lVar11 + 2];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
            }
            if (uVar8 < uVar24) {
              UF::P_[uVar51] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar28] = uVar24;
            }
            puVar2[lVar11 + 2] = uVar24;
            goto LAB_002899f5;
          }
LAB_00289843:
          puVar2[lVar11 + 2] = puVar2[lVar11];
LAB_00281dcc:
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_0028056a;
        }
        if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
          if (pcVar34[uVar14] != '\0') {
            if (pcVar34[lVar11] == '\0') {
              uVar24 = puVar50[lVar11 + 2];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[lVar11 + 4];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              do {
                uVar9 = uVar24;
                uVar8 = puVar2[lVar11];
                uVar24 = UF::P_[uVar9];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar24 = uVar8;
                uVar8 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar9 < uVar24) {
                UF::P_[uVar24] = uVar9;
                uVar24 = uVar9;
              }
              else {
                UF::P_[uVar9] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            else if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
              uVar24 = puVar50[lVar11];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[lVar11 + 2];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              do {
                uVar9 = uVar24;
                uVar8 = puVar50[lVar11 + 4];
                uVar24 = UF::P_[uVar9];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar24 = uVar8;
                uVar8 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar9 < uVar24) {
                UF::P_[uVar24] = uVar9;
                uVar24 = uVar9;
              }
              else {
                UF::P_[uVar9] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            else {
              uVar24 = puVar50[lVar11];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[lVar11 + 4];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              puVar2[lVar11 + 2] = uVar24;
            }
            goto LAB_0028494f;
          }
          uVar24 = puVar50[lVar11 + 4];
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar2[lVar11];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
        else if (pcVar34[lVar11] == '\0') {
          uVar24 = puVar50[lVar11 + 2];
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar2[lVar11];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
        else {
          if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
            if (pcVar34[uVar14] == '\0') {
              uVar24 = puVar50[lVar11];
              if (pcVar34[uVar14 - lVar17] == '\0') {
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar50[lVar11 + 2];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
                goto LAB_0028a136;
              }
              goto LAB_0028896e;
            }
LAB_00288d73:
            uVar24 = puVar50[lVar11];
            goto LAB_0028558e;
          }
          uVar24 = puVar50[lVar11];
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar50[lVar11 + 2];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
LAB_00289e99:
        if (uVar8 < uVar24) {
          UF::P_[uVar51] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar28] = uVar24;
        }
        puVar2[lVar11 + 2] = uVar24;
        goto LAB_0028494f;
      }
      if (pcVar34[lVar11 + 3] != '\0') {
        uVar24 = puVar50[lVar11 + 2];
LAB_00287e0f:
        puVar2[lVar11 + 2] = uVar24;
        goto LAB_002873f3;
      }
      if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
        if (pcVar34[uVar14] == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          puVar2[lVar11 + 2] = UF::length_;
          UF::length_ = uVar24;
          goto LAB_00280c65;
        }
        puVar2[lVar11 + 2] = puVar50[lVar11 + 2];
        goto LAB_0027ffb2;
      }
      cVar7 = pcVar34[lVar11 + 2];
      if (pcVar34[lVar11 + 4] == '\0') goto LAB_00288bda;
      if (cVar7 == '\0') goto LAB_00285589;
      uVar24 = puVar50[lVar11 + 2];
      if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[lVar11 + 4];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
LAB_0028812f:
        if (uVar8 < uVar24) {
          UF::P_[uVar51] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar28] = uVar24;
        }
        puVar2[lVar11 + 2] = uVar24;
        goto LAB_0028494f;
      }
    }
LAB_0028896e:
    puVar2[lVar11 + 2] = uVar24;
    goto LAB_0028494f;
  }
  lVar12 = lVar12 + 0x400000000 >> 0x20;
  if (pcVar34[lVar12] == '\0') goto LAB_00287b70;
  if (pcVar34[lVar13 - lVar17] == '\0') {
    uVar24 = puVar50[lVar12];
    do {
      uVar8 = uVar24;
      uVar28 = (ulong)uVar8;
      uVar24 = UF::P_[uVar28];
      uVar9 = puVar2[iVar23];
    } while (UF::P_[uVar28] < uVar8);
    do {
      uVar24 = uVar9;
      uVar51 = (ulong)uVar24;
      uVar9 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar24);
    goto LAB_00288fe1;
  }
  if (pcVar34[uVar14] != '\0') {
LAB_002877bb:
    uVar24 = puVar50[uVar14];
    goto LAB_00289dd1;
  }
  if (pcVar34[uVar14 - lVar17] != '\0') goto LAB_0028814c;
  uVar24 = puVar50[uVar14];
  do {
    uVar9 = uVar24;
    uVar28 = (ulong)uVar9;
    uVar24 = UF::P_[uVar28];
    uVar8 = puVar2[iVar23];
  } while (UF::P_[uVar28] < uVar9);
  do {
    uVar24 = uVar8;
    uVar51 = (ulong)uVar24;
    uVar8 = UF::P_[uVar51];
  } while (UF::P_[uVar51] < uVar24);
LAB_00289db0:
  puVar16 = UF::P_;
  if (uVar9 < uVar24) {
LAB_00289db5:
    uVar24 = uVar9;
    puVar16[uVar51] = uVar24;
  }
  else {
    UF::P_[uVar28] = uVar24;
  }
LAB_00289dd1:
  puVar2[uVar14] = uVar24;
  goto LAB_0028494f;
code_r0x00285917:
  if (*(char *)(lVar13 + 1 + lVar47) == '\0') {
    puVar22[UF::length_] = UF::length_;
    uVar24 = UF::length_;
    UF::length_ = UF::length_ + 1;
  }
  else {
    uVar24 = *(uint *)(lVar33 + lVar12 + lVar47 * 4);
  }
  *(uint *)(lVar38 + lVar47 * 4) = uVar24;
  lVar41 = lVar41 + 0x200000000;
  lVar35 = lVar35 + 8;
  lVar52 = lVar11 + lVar47;
  lVar47 = lVar47 + 2;
  if ((long)uVar10 <= lVar52 + 2) {
    local_a8 = local_a8 + (int)lVar47;
    uVar24 = (int)lVar11 + (int)lVar47;
    goto LAB_002859a9;
  }
  goto LAB_002858f6;
code_r0x00285c24:
  uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
  do {
    uVar8 = uVar24;
    uVar24 = UF::P_[uVar8];
    uVar9 = puVar2[lVar52];
  } while (UF::P_[uVar8] < uVar8);
  do {
    uVar24 = uVar9;
    uVar9 = UF::P_[uVar24];
  } while (UF::P_[uVar24] < uVar24);
  if (uVar8 < uVar24) {
    UF::P_[uVar24] = uVar8;
    uVar24 = uVar8;
  }
  else {
    UF::P_[uVar8] = uVar24;
  }
  *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
LAB_00286202:
  uVar14 = lVar11 + lVar47 & 0xffffffff;
  goto LAB_00284ea6;
LAB_00285a94:
  uVar14 = lVar11 + lVar47;
  lVar13 = lVar41 + 0x100000000 >> 0x20;
  lVar25 = lVar41 + 0x300000000 >> 0x20;
  lVar35 = lVar41 >> 0x1e;
  if (pcVar1[lVar13] == '\0') {
    if (pcVar34[lVar25] != '\0') {
      if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36) != '\0') {
        *(undefined4 *)(lVar38 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_002873f3;
      }
      if (pcVar34[lVar13] == '\0') {
        *(undefined4 *)(lVar38 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      }
      else {
        if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar42 + lVar36) == '\0') {
          uVar24 = *(uint *)((long)puVar50 + lVar35);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_002873f3;
        }
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = *(uint *)((long)puVar50 + lVar35);
      }
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_002873f3;
    }
    if (*(char *)(lVar26 + lVar25) == '\0') {
      if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36) == '\0') {
        if (pcVar34[lVar13] == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_;
LAB_002871dc:
          UF::length_ = uVar24 + 1;
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        }
        else {
          uVar24 = *(uint *)((long)puVar50 + lVar35);
LAB_00286d92:
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        }
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_00280c65;
      }
      *(undefined4 *)(lVar38 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      uVar14 = uVar14 & 0xffffffff;
LAB_0027ffb2:
      puVar22 = UF::P_;
      uVar24 = (int)uVar14 + 2;
      uVar28 = (ulong)uVar24;
      if ((int)uVar24 < local_e8) {
        lVar11 = (long)(int)uVar14;
        uVar28 = lVar11 + 2;
        while( true ) {
          uVar14 = uVar28;
          puVar16 = UF::P_;
          iVar23 = (int)lVar11;
          uVar24 = UF::length_;
          if (*(char *)(lVar26 + uVar14) == '\0') goto LAB_00280481;
          if (pcVar1[lVar11 + 1] != '\0') break;
          if (pcVar34[lVar11 + 3] != '\0') goto LAB_00284ff5;
          if (*(char *)(lVar26 + 3 + lVar11) != '\0') {
            lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
            cVar7 = pcVar34[uVar14];
            if (pcVar34[lVar12] == '\0') goto joined_r0x00282364;
            if (cVar7 == '\0') goto LAB_00288a81;
            uVar24 = puVar50[uVar14];
            if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
              do {
                uVar9 = uVar24;
                uVar28 = (ulong)uVar9;
                uVar24 = UF::P_[uVar28];
                uVar8 = puVar50[lVar12];
              } while (UF::P_[uVar28] < uVar9);
              do {
                uVar24 = uVar8;
                uVar51 = (ulong)uVar24;
                uVar8 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
              goto LAB_00289db0;
            }
            goto LAB_002852f5;
          }
          if (pcVar34[uVar14] == '\0') {
            UF::P_[UF::length_] = UF::length_;
            uVar24 = UF::length_ + 1;
            puVar2[uVar14] = UF::length_;
            UF::length_ = uVar24;
            goto LAB_00280c65;
          }
          uVar24 = puVar50[uVar14];
LAB_002800c2:
          puVar2[uVar14] = uVar24;
          uVar28 = uVar14 + 2;
          lVar11 = lVar11 + 2;
          if ((long)uVar10 <= (long)uVar28) goto LAB_002800dd;
        }
        if (pcVar34[lVar11 + 3] == '\0') {
          if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
            if (pcVar34[uVar14] == '\0') {
              puVar2[uVar14] = puVar2[iVar23];
              goto LAB_00280c65;
            }
            uVar24 = puVar50[lVar11];
            if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
              do {
                uVar8 = uVar24;
                uVar24 = puVar22[uVar8];
                uVar9 = puVar50[uVar14];
              } while (puVar22[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = puVar22[uVar24];
              } while (puVar22[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                puVar22[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                puVar22[uVar8] = uVar24;
              }
            }
            goto LAB_002800c2;
          }
          lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
          if (pcVar34[lVar12] == '\0') {
            if (pcVar34[uVar14] != '\0') {
              uVar24 = puVar50[iVar23];
              if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
                do {
                  uVar8 = uVar24;
                  uVar28 = (ulong)uVar8;
                  uVar24 = UF::P_[uVar28];
                  uVar9 = puVar50[uVar14];
                } while (UF::P_[uVar28] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar51 = (ulong)uVar24;
                  uVar9 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar24);
                goto LAB_002820e4;
              }
              goto LAB_0028177a;
            }
            puVar2[uVar14] = puVar2[iVar23];
            goto LAB_00281dcc;
          }
          if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
            if (pcVar34[uVar14] == '\0') {
              uVar24 = puVar50[lVar12];
              do {
                uVar8 = uVar24;
                uVar28 = (ulong)uVar8;
                uVar24 = UF::P_[uVar28];
                uVar9 = puVar2[iVar23];
              } while (UF::P_[uVar28] < uVar8);
              do {
                uVar24 = uVar9;
                uVar51 = (ulong)uVar24;
                uVar9 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
              goto LAB_00288fe1;
            }
            if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
              uVar24 = puVar50[iVar23];
              do {
                uVar9 = uVar24;
                uVar28 = (ulong)uVar9;
                uVar24 = UF::P_[uVar28];
                uVar8 = puVar50[lVar12];
              } while (UF::P_[uVar28] < uVar9);
              do {
                uVar24 = uVar8;
                uVar51 = (ulong)uVar24;
                uVar8 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar24);
              goto LAB_00289db0;
            }
            uVar24 = puVar50[iVar23];
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = puVar50[uVar14];
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            do {
              uVar9 = uVar24;
              uVar8 = puVar50[lVar12];
              uVar24 = puVar16[uVar9];
            } while (puVar16[uVar9] < uVar9);
            do {
              uVar24 = uVar8;
              uVar51 = (ulong)uVar24;
              uVar8 = puVar16[uVar51];
            } while (puVar16[uVar51] < uVar24);
            if (uVar9 < uVar24) goto LAB_00289db5;
            puVar16[uVar9] = uVar24;
            goto LAB_00289dd1;
          }
          if (pcVar34[lVar11 + (1 - lVar17)] == '\0') {
            uVar24 = puVar50[iVar23];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar50[uVar14];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            goto LAB_00288fe1;
          }
          if (pcVar34[uVar14] != '\0') goto LAB_0028814c;
          uVar24 = puVar50[iVar23];
          if (pcVar34[uVar14 - lVar17] == '\0') {
            do {
              uVar9 = uVar24;
              uVar28 = (ulong)uVar9;
              uVar24 = UF::P_[uVar28];
              uVar8 = puVar50[uVar14];
            } while (UF::P_[uVar28] < uVar9);
            do {
              uVar24 = uVar8;
              uVar51 = (ulong)uVar24;
              uVar8 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            goto LAB_00289db0;
          }
          goto LAB_002852f5;
        }
        if (pcVar34[lVar11 + (1 - lVar17)] != '\0') {
          if (pcVar34[uVar14] == '\0') {
            if (pcVar34[uVar14 - lVar17] != '\0') {
              puVar2[uVar14] = puVar50[iVar23];
              goto LAB_002873f3;
            }
            uVar24 = puVar50[iVar23];
            do {
              uVar8 = uVar24;
              uVar28 = (ulong)uVar8;
              uVar24 = UF::P_[uVar28];
              uVar9 = puVar50[uVar14];
            } while (UF::P_[uVar28] < uVar8);
            do {
              uVar24 = uVar9;
              uVar51 = (ulong)uVar24;
              uVar9 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            goto LAB_002855db;
          }
          goto LAB_002853f7;
        }
        uVar24 = puVar50[iVar23];
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[uVar14];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_002855db;
      }
LAB_002800dd:
      uVar51 = uVar28 & 0xffffffff;
      local_a8 = (int)uVar14;
      if (local_e8 < (int)uVar28) {
        if (*(char *)(lVar26 + uVar51) == '\0') {
LAB_00280ec9:
          cVar7 = pcVar1[uVar51];
          goto joined_r0x00285c93;
        }
        cVar7 = pcVar34[uVar51];
        if (pcVar1[local_a8 + 1] == '\0') goto joined_r0x002809df;
        if (cVar7 == '\0') goto LAB_00285121;
        uVar24 = puVar50[local_a8];
        if (pcVar34[(ulong)(local_a8 + 1) - lVar17] != '\0') goto LAB_00284d04;
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = puVar50[uVar51];
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
      }
      else if (*(char *)(lVar26 + uVar51) == '\0') {
        uVar14 = (ulong)(local_a8 + 3);
        cVar7 = *(char *)(lVar26 + uVar14);
        if (pcVar1[uVar51] == '\0') goto LAB_00285129;
        if (cVar7 == '\0') {
          lVar26 = (long)local_a8;
          cVar7 = pcVar1[lVar26 + 1];
          goto joined_r0x0028163c;
        }
        uVar28 = (ulong)(local_a8 + 1);
        cVar7 = pcVar34[uVar14];
        if (pcVar1[uVar28] == '\0') goto joined_r0x0028184d;
        if (cVar7 == '\0') {
          if (pcVar34[uVar51] == '\0') goto LAB_00285121;
          uVar24 = puVar50[local_a8];
          if (pcVar34[uVar28 - lVar17] != '\0') goto LAB_00284d04;
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        else if (pcVar34[uVar28 - lVar17] == '\0') {
          uVar24 = puVar50[local_a8];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        else {
          if (pcVar34[uVar51] != '\0') {
LAB_00287639:
            lVar26 = (long)local_a8;
            goto LAB_002877ef;
          }
          uVar24 = puVar50[local_a8];
          if (pcVar34[uVar51 - lVar17] != '\0') goto LAB_00284d04;
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
      }
      else {
        uVar14 = (ulong)(local_a8 + 1);
        lVar26 = (long)local_a8;
        cVar7 = pcVar34[lVar26 + 3];
        if (pcVar1[uVar14] == '\0') goto joined_r0x00283a97;
        if (cVar7 == '\0') {
          if (pcVar34[uVar51] == '\0') goto LAB_00288090;
          uVar24 = puVar50[lVar26];
          if (pcVar34[uVar14 - lVar17] != '\0') goto LAB_00284d04;
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        else {
          if (pcVar34[uVar14 - lVar17] == '\0') {
            uVar24 = puVar50[lVar26];
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar50[uVar51];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
            goto LAB_00289f91;
          }
          if (pcVar34[uVar51] != '\0') goto LAB_002877ef;
          uVar24 = puVar50[lVar26];
          if (pcVar34[uVar51 - lVar17] != '\0') goto LAB_00284d04;
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
      }
      goto LAB_00289f91;
    }
    lVar41 = lVar41 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36);
    if (pcVar34[lVar41] == '\0') {
      if (cVar7 != '\0') {
        *(undefined4 *)(lVar38 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        goto LAB_00284c69;
      }
      if (pcVar34[lVar13] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_;
LAB_002872f9:
        UF::length_ = uVar24 + 1;
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
      }
      else {
        uVar24 = *(uint *)((long)puVar50 + lVar35);
LAB_00286fef:
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
      }
      goto LAB_0028056a;
    }
    if (cVar7 == '\0') {
      if (pcVar34[lVar13] == '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar41];
        goto LAB_0028718c;
      }
      if (pcVar34[lVar25 - lVar17] != '\0') {
        if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar42 + lVar36) != '\0') {
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = *(uint *)((long)puVar50 + lVar35);
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_0028494f;
        }
        uVar24 = *(uint *)((long)puVar50 + lVar35);
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
        if (uVar9 < uVar24) goto LAB_00286157;
LAB_002873b9:
        UF::P_[uVar14] = uVar24;
        goto LAB_002872b2;
      }
      uVar24 = *(uint *)((long)puVar50 + lVar35);
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar50[lVar41];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      if (pcVar34[lVar25 - lVar17] != '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
LAB_0028718c:
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0028494f;
      }
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar50[lVar41];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    if (uVar9 < uVar24) goto LAB_00286157;
LAB_002872ab:
    UF::P_[uVar14] = uVar24;
  }
  else {
    if (pcVar34[lVar25] != '\0') {
      if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36) == '\0') {
        if (pcVar34[lVar13] == '\0') {
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar9 = uVar24;
            uVar28 = (ulong)uVar9;
            uVar24 = UF::P_[uVar28];
            uVar8 = *(uint *)((long)puVar2 + lVar35);
          } while (UF::P_[uVar28] < uVar9);
          do {
            uVar24 = uVar8;
            uVar51 = (ulong)uVar24;
            uVar8 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
          goto LAB_00285b5e;
        }
        if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar42 + lVar36) != '\0') {
          uVar24 = *(uint *)((long)puVar50 + lVar35);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = puVar2[lVar52];
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          goto LAB_00286218;
        }
        uVar24 = *(uint *)((long)puVar50 + lVar35);
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        do {
          uVar9 = uVar24;
          uVar8 = puVar2[lVar52];
          uVar24 = puVar16[uVar9];
        } while (puVar16[uVar9] < uVar9);
        do {
          uVar24 = uVar8;
          uVar51 = (ulong)uVar24;
          uVar8 = puVar16[uVar51];
        } while (puVar16[uVar51] < uVar24);
        if (uVar24 <= uVar9) {
          puVar16[uVar9] = uVar24;
          goto LAB_00286218;
        }
      }
      else {
        uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        do {
          uVar9 = uVar24;
          uVar28 = (ulong)uVar9;
          uVar24 = UF::P_[uVar28];
          uVar8 = *(uint *)((long)puVar2 + lVar35);
        } while (UF::P_[uVar28] < uVar9);
        do {
          uVar24 = uVar8;
          uVar51 = (ulong)uVar24;
          uVar8 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
LAB_00285b5e:
        if (uVar24 <= uVar9) {
          UF::P_[uVar28] = uVar24;
          goto LAB_00286218;
        }
      }
      uVar24 = uVar9;
      puVar16[uVar51] = uVar24;
LAB_00286218:
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_002873f3;
    }
    if (*(char *)(lVar26 + lVar25) == '\0') {
      if (pcVar34[lVar13] != '\0') {
        uVar24 = *(uint *)((long)puVar50 + lVar35);
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = *(uint *)((long)puVar2 + lVar35);
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        uVar28 = uVar14;
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        goto LAB_00287c5a;
      }
      if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36) == '\0') {
        *(undefined4 *)(lVar12 + lVar33 + 8 + lVar47 * 4) = *(undefined4 *)((long)puVar2 + lVar35);
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_00280c65;
      }
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)((long)puVar2 + lVar35);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_0027ffb2;
    }
    lVar38 = lVar41 + 0x400000000 >> 0x20;
    if (pcVar34[lVar38] == '\0') {
      if (pcVar34[lVar13] == '\0') {
        if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36) == '\0') {
          *(undefined4 *)(lVar12 + lVar33 + 8 + lVar47 * 4) = *(undefined4 *)((long)puVar2 + lVar35)
          ;
          goto LAB_0028056a;
        }
        uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = *(uint *)((long)puVar2 + lVar35);
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
LAB_00281e5f:
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        goto LAB_00284c69;
      }
      uVar24 = *(uint *)((long)puVar50 + lVar35);
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)((long)puVar2 + lVar35);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      uVar28 = uVar14;
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      goto LAB_00288196;
    }
    if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar42 + lVar36) == '\0') {
      if (pcVar34[lVar13] == '\0') {
        uVar24 = puVar50[lVar38];
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = *(uint *)((long)puVar2 + lVar35);
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
LAB_0028614e:
        if (uVar24 <= uVar9) goto LAB_002872ab;
      }
      else {
        if (pcVar34[lVar25 - lVar17] == '\0') {
          uVar24 = *(uint *)((long)puVar50 + lVar35);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = puVar50[lVar38];
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          do {
            uVar9 = uVar24;
            uVar8 = puVar2[lVar52];
            uVar24 = puVar16[uVar9];
          } while (puVar16[uVar9] < uVar9);
          do {
            uVar24 = uVar8;
            uVar8 = puVar16[uVar24];
          } while (puVar16[uVar24] < uVar24);
          if (uVar9 < uVar24) {
            puVar16[uVar24] = uVar9;
            uVar24 = uVar9;
          }
          else {
            puVar16[uVar9] = uVar24;
          }
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
          goto LAB_002872cf;
        }
        if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar42 + lVar36) == '\0') {
          uVar24 = *(uint *)((long)puVar50 + lVar35);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar8 = puVar2[lVar52];
            uVar24 = puVar16[uVar14];
          } while (puVar16[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = puVar16[uVar28];
          } while (puVar16[uVar28] < uVar24);
          goto LAB_00286025;
        }
        uVar24 = *(uint *)((long)puVar50 + lVar35);
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = puVar2[lVar52];
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
        if (uVar24 <= uVar9) goto LAB_002873b9;
      }
    }
    else {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar42 * 4 + lVar33 + 8 + lVar47 * 4);
      if (pcVar34[lVar25 - lVar17] == '\0') {
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = puVar50[lVar38];
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        do {
          uVar9 = uVar24;
          uVar8 = *(uint *)((long)puVar2 + lVar35);
          uVar24 = puVar16[uVar9];
        } while (puVar16[uVar9] < uVar9);
        do {
          uVar24 = uVar8;
          uVar8 = puVar16[uVar24];
        } while (puVar16[uVar24] < uVar24);
        if (uVar9 < uVar24) {
          puVar16[uVar24] = uVar9;
          uVar24 = uVar9;
        }
        else {
          puVar16[uVar9] = uVar24;
        }
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0028494f;
      }
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = *(uint *)((long)puVar2 + lVar35);
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
LAB_00286025:
      if (uVar24 <= uVar9) {
        puVar16[uVar14] = uVar24;
        goto LAB_002872b2;
      }
    }
LAB_00286157:
    uVar24 = uVar9;
    puVar16[uVar28] = uVar24;
  }
LAB_002872b2:
  uVar14 = lVar11 + lVar47;
LAB_002872c6:
  lVar12 = lVar12 + lVar33;
LAB_002872cb:
  *(uint *)(lVar12 + 8 + lVar47 * 4) = uVar24;
LAB_002872cf:
  uVar14 = uVar14 & 0xffffffff;
  goto LAB_0028494f;
LAB_00280481:
  lVar13 = lVar11 << 0x20;
  lVar12 = lVar13 + 0x300000000 >> 0x20;
  if (pcVar1[uVar14] == '\0') {
    if (*(char *)(lVar26 + lVar12) == '\0') {
      cVar7 = pcVar1[lVar12];
joined_r0x002818c3:
      if (cVar7 == '\0') goto LAB_00287a3f;
LAB_00285284:
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_ + 1;
      puVar2[uVar14] = UF::length_;
      UF::length_ = uVar24;
LAB_002852a4:
      iVar23 = (int)uVar14;
LAB_002834ce:
      puVar16 = UF::P_;
      uVar24 = iVar23 + 2;
      if (local_e8 <= (int)uVar24) {
LAB_0028360a:
        puVar22 = UF::P_;
        uVar51 = (ulong)uVar24;
        if (local_e8 < (int)uVar24) {
          if (*(char *)(lVar26 + uVar51) == '\0') {
            if (pcVar1[uVar51] != '\0') goto LAB_00283e7d;
            puVar2[uVar51] = 0;
            goto LAB_00289fad;
          }
          lVar26 = (long)iVar23;
          if (pcVar34[lVar26 + 1] != '\0') {
            uVar24 = puVar50[lVar26];
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar2[lVar26];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
            goto LAB_00289f91;
          }
          if (pcVar34[uVar51] == '\0') goto LAB_00288090;
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[lVar26];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        else {
          if (*(char *)(lVar26 + uVar51) == '\0') {
            uVar14 = (ulong)(iVar23 + 3);
            if (pcVar1[uVar51] == '\0') {
              if (*(char *)(lVar26 + uVar14) == '\0') {
                cVar7 = pcVar1[uVar14];
                goto joined_r0x00282a52;
              }
              cVar7 = pcVar34[uVar14];
              goto joined_r0x00283a97;
            }
            if (*(char *)(lVar26 + uVar14) != '\0') {
              if (pcVar34[uVar14] == '\0') {
                if (pcVar34[uVar51] == '\0') goto LAB_00283e7d;
                uVar24 = puVar50[uVar51];
                do {
                  uVar9 = uVar24;
                  uVar14 = (ulong)uVar9;
                  uVar24 = UF::P_[uVar14];
                  uVar8 = puVar2[iVar23];
                } while (UF::P_[uVar14] < uVar9);
                do {
                  uVar24 = uVar8;
                  uVar28 = (ulong)uVar24;
                  uVar8 = UF::P_[uVar28];
                } while (UF::P_[uVar28] < uVar24);
              }
              else {
                uVar24 = puVar50[uVar51];
                do {
                  uVar9 = uVar24;
                  uVar14 = (ulong)uVar9;
                  uVar24 = UF::P_[uVar14];
                  uVar8 = puVar2[iVar23];
                } while (UF::P_[uVar14] < uVar9);
                do {
                  uVar24 = uVar8;
                  uVar28 = (ulong)uVar24;
                  uVar8 = UF::P_[uVar28];
                } while (UF::P_[uVar28] < uVar24);
              }
              goto LAB_00289f91;
            }
LAB_00283e7d:
            puVar2[uVar51] = puVar2[iVar23];
            goto LAB_00289fad;
          }
          if (pcVar34[(long)iVar23 + 3] != '\0') {
            if (pcVar34[uVar51] != '\0') {
              uVar24 = puVar50[uVar51];
              do {
                uVar9 = uVar24;
                uVar14 = (ulong)uVar9;
                uVar24 = UF::P_[uVar14];
                uVar8 = puVar2[iVar23];
              } while (UF::P_[uVar14] < uVar9);
              do {
                uVar24 = uVar8;
                uVar28 = (ulong)uVar24;
                uVar8 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
              goto LAB_00289f91;
            }
            if (pcVar34[(long)iVar23 + 1] == '\0') {
              uVar24 = puVar50[uVar51];
              do {
                uVar9 = uVar24;
                uVar14 = (ulong)uVar9;
                uVar24 = UF::P_[uVar14];
                uVar8 = puVar2[iVar23];
              } while (UF::P_[uVar14] < uVar9);
              do {
                uVar24 = uVar8;
                uVar28 = (ulong)uVar24;
                uVar8 = UF::P_[uVar28];
              } while (UF::P_[uVar28] < uVar24);
              goto LAB_00289f91;
            }
            if (pcVar34[uVar51 - lVar17] == '\0') {
              uVar24 = puVar50[iVar23];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar50[uVar51];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              do {
                uVar9 = uVar24;
                uVar8 = puVar2[iVar23];
                uVar24 = puVar22[uVar9];
              } while (puVar22[uVar9] < uVar9);
              do {
                uVar24 = uVar8;
                uVar14 = (ulong)uVar24;
                uVar8 = puVar22[uVar14];
              } while (puVar22[uVar14] < uVar24);
              if (uVar9 < uVar24) goto LAB_002843f9;
              puVar22[uVar9] = uVar24;
            }
            else {
              uVar24 = puVar50[iVar23];
              do {
                uVar9 = uVar24;
                uVar24 = UF::P_[uVar9];
                uVar8 = puVar2[iVar23];
              } while (UF::P_[uVar9] < uVar9);
              do {
                uVar24 = uVar8;
                uVar14 = (ulong)uVar24;
                uVar8 = UF::P_[uVar14];
              } while (UF::P_[uVar14] < uVar24);
              if (uVar9 < uVar24) {
LAB_002843f9:
                uVar24 = uVar9;
                puVar22[uVar14] = uVar24;
              }
              else {
                UF::P_[uVar9] = uVar24;
              }
            }
            puVar2[uVar51] = uVar24;
            goto LAB_00289fad;
          }
          if (pcVar34[(long)iVar23 + 1] != '\0') {
            uVar24 = puVar50[iVar23];
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar24 = UF::P_[uVar14];
              uVar8 = puVar2[iVar23];
            } while (UF::P_[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = UF::P_[uVar28];
            } while (UF::P_[uVar28] < uVar24);
            goto LAB_00289f91;
          }
          if (pcVar34[uVar51] == '\0') {
            uVar24 = puVar2[iVar23];
            goto LAB_00289fa8;
          }
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[iVar23];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        goto LAB_00289f91;
      }
      lVar25 = (long)iVar23;
      lVar11 = lVar25 + 2;
      lVar38 = lVar25 << 0x20;
      lVar13 = lVar36 + lVar27 + lVar25;
      lVar35 = lVar36 + lVar17 * lVar32 + lVar25;
      lVar12 = lVar25 * 4;
      puVar19 = (uint *)(lVar33 + lVar48 + lVar25 * 4 + 8);
      lVar47 = 0;
      puVar22 = puVar19;
LAB_0028355b:
      puVar6 = UF::P_;
      lVar42 = lVar38 >> 0x1e;
      if (*(char *)(lVar13 + 2 + lVar47) == '\0') {
        if (*(char *)(lVar35 + 2 + lVar47) == '\0') {
          if (*(char *)(lVar13 + 3 + lVar47) != '\0') {
            uVar14 = lVar11 + lVar47;
            lVar11 = lVar17 * lVar20 + lVar25 + lVar36;
            if (*(char *)(lVar47 + 3 + lVar11) != '\0') {
              *(undefined4 *)(lVar33 + lVar12 + lVar48 + 8 + lVar47 * 4) =
                   *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
              goto LAB_00284ea6;
            }
            lVar13 = lVar38 + 0x400000000 >> 0x20;
            cVar7 = *(char *)(lVar47 + 2 + lVar11);
            if (pcVar34[lVar13] == '\0') {
              if (cVar7 != '\0') {
                *(undefined4 *)(lVar33 + lVar12 + lVar48 + 8 + lVar47 * 4) =
                     *(undefined4 *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
                goto LAB_002899f5;
              }
              UF::P_[UF::length_] = UF::length_;
              uVar24 = UF::length_ + 1;
              *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = UF::length_;
              UF::length_ = uVar24;
              uVar14 = uVar14 & 0xffffffff;
              goto LAB_0028056a;
            }
            if (cVar7 == '\0') {
              *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar13];
            }
            else {
              uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
              if (*(char *)(lVar47 + 3 + lVar17 * lVar31 + lVar25 + lVar36) == '\0') {
                do {
                  uVar8 = uVar24;
                  uVar24 = UF::P_[uVar8];
                  uVar9 = puVar50[lVar13];
                } while (UF::P_[uVar8] < uVar8);
                do {
                  uVar24 = uVar9;
                  uVar9 = UF::P_[uVar24];
                } while (UF::P_[uVar24] < uVar24);
                if (uVar8 < uVar24) {
                  UF::P_[uVar24] = uVar8;
                  uVar24 = uVar8;
                }
                else {
                  UF::P_[uVar8] = uVar24;
                }
                lVar12 = lVar12 + lVar48;
                goto LAB_00289938;
              }
              *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
            }
            goto LAB_0028494f;
          }
          if (*(char *)(lVar35 + 3 + lVar47) == '\0') goto LAB_00283958;
          puVar16[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          puVar19[lVar47] = UF::length_;
          UF::length_ = uVar24;
          lVar38 = lVar38 + 0x200000000;
          puVar22 = puVar22 + 2;
          lVar42 = lVar11 + lVar47;
          lVar47 = lVar47 + 2;
          if ((long)uVar10 <= lVar42 + 2) {
            iVar23 = iVar23 + (int)lVar47;
            uVar24 = (int)lVar11 + (int)lVar47;
            goto LAB_0028360a;
          }
          goto LAB_0028355b;
        }
        uVar14 = lVar11 + lVar47;
        lVar13 = lVar38 + 0x300000000 >> 0x20;
        if (*(char *)(lVar26 + lVar13) == '\0') {
          *(undefined4 *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) =
               *(undefined4 *)((long)puVar2 + lVar42);
          goto LAB_0028586f;
        }
        if (pcVar34[lVar13] != '\0') {
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = *(uint *)((long)puVar2 + lVar42);
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
          goto LAB_00284ea6;
        }
        lVar35 = lVar38 + 0x400000000 >> 0x20;
        if (pcVar34[lVar35] == '\0') {
          if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) == '\0') {
            *(undefined4 *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) =
                 *(undefined4 *)((long)puVar2 + lVar42);
            uVar14 = uVar14 & 0xffffffff;
            goto LAB_0028056a;
          }
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = *(uint *)((long)puVar2 + lVar42);
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_00284c69;
        }
        if (pcVar34[lVar13 - lVar17] == '\0') {
          if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) != '\0') {
            uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = puVar50[lVar35];
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            do {
              uVar9 = uVar24;
              uVar14 = (ulong)uVar9;
              uVar8 = *(uint *)((long)puVar2 + lVar42);
              uVar24 = puVar6[uVar14];
            } while (puVar6[uVar14] < uVar9);
            do {
              uVar24 = uVar8;
              uVar28 = (ulong)uVar24;
              uVar8 = puVar6[uVar28];
            } while (puVar6[uVar28] < uVar24);
            goto LAB_002848d1;
          }
          uVar24 = puVar50[lVar35];
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = *(uint *)((long)puVar2 + lVar42);
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
        else {
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = *(uint *)((long)puVar2 + lVar42);
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
        }
LAB_00283dea:
        if (uVar8 < uVar24) {
LAB_00283df3:
          uVar24 = uVar8;
          UF::P_[uVar28] = uVar24;
        }
        else {
          UF::P_[uVar14] = uVar24;
        }
LAB_00284157:
        uVar14 = lVar11 + lVar47;
        *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
        goto LAB_0028494f;
      }
      uVar14 = lVar11 + lVar47;
      lVar13 = lVar38 + 0x300000000 >> 0x20;
      lVar35 = lVar38 >> 0x20;
      if (pcVar34[lVar13] != '\0') {
        if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) == '\0') {
          if (pcVar34[lVar35 + 1] != '\0') {
            if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar25 + lVar36) != '\0') {
              uVar24 = puVar50[lVar35];
              do {
                uVar8 = uVar24;
                uVar24 = UF::P_[uVar8];
                uVar9 = puVar2[lVar35];
              } while (UF::P_[uVar8] < uVar8);
              do {
                uVar24 = uVar9;
                uVar9 = UF::P_[uVar24];
              } while (UF::P_[uVar24] < uVar24);
              if (uVar8 < uVar24) {
                UF::P_[uVar24] = uVar8;
                uVar24 = uVar8;
              }
              else {
                UF::P_[uVar8] = uVar24;
              }
              *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
              goto LAB_002873f3;
            }
            uVar24 = puVar50[lVar35];
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            do {
              uVar9 = uVar24;
              uVar8 = puVar2[lVar35];
              uVar24 = puVar6[uVar9];
            } while (puVar6[uVar9] < uVar9);
            do {
              uVar24 = uVar8;
              uVar8 = puVar6[uVar24];
            } while (puVar6[uVar24] < uVar24);
            if (uVar9 < uVar24) {
              puVar6[uVar24] = uVar9;
              uVar24 = uVar9;
            }
            else {
              puVar6[uVar9] = uVar24;
            }
            *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
            goto LAB_002873f3;
          }
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar2[lVar35];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
        else {
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = *(uint *)((long)puVar2 + lVar42);
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
        if (uVar8 < uVar24) {
          UF::P_[uVar51] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar28] = uVar24;
        }
        *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
        goto LAB_002873f3;
      }
      if (*(char *)(lVar26 + lVar13) == '\0') {
        if (pcVar34[lVar35 + 1] == '\0') {
          if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) == '\0') {
            *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = puVar2[lVar35];
            goto LAB_00280c65;
          }
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = puVar2[lVar35];
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
          goto LAB_0027ffb2;
        }
        uVar24 = puVar50[lVar35];
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = puVar2[lVar35];
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        goto LAB_002854c6;
      }
      lVar38 = lVar38 + 0x400000000 >> 0x20;
      if (pcVar34[lVar38] == '\0') {
        if (pcVar34[lVar35 + 1] == '\0') {
          if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) == '\0') {
            *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = puVar2[lVar35];
            uVar14 = uVar14 & 0xffffffff;
            goto LAB_0028056a;
          }
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = puVar2[lVar35];
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_00284c69;
        }
        uVar24 = puVar50[lVar35];
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = puVar2[lVar35];
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
LAB_00284565:
        uVar28 = uVar14 & 0xffffffff;
        goto LAB_00288196;
      }
      if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) == '\0') {
        if (pcVar34[lVar35 + 1] == '\0') {
          uVar24 = puVar50[lVar38];
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = puVar2[lVar35];
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00283dea;
        }
        if (pcVar34[lVar13 - lVar17] == '\0') {
          uVar24 = puVar50[lVar35];
          do {
            uVar8 = uVar24;
            uVar24 = UF::P_[uVar8];
            uVar9 = puVar50[lVar38];
          } while (UF::P_[uVar8] < uVar8);
          do {
            uVar24 = uVar9;
            uVar9 = UF::P_[uVar24];
          } while (UF::P_[uVar24] < uVar24);
          if (uVar8 < uVar24) {
            UF::P_[uVar24] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar8] = uVar24;
          }
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar8 = puVar2[lVar35];
            uVar24 = puVar6[uVar14];
          } while (puVar6[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = puVar6[uVar28];
          } while (puVar6[uVar28] < uVar24);
          goto LAB_002848d1;
        }
        if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar25 + lVar36) != '\0') {
          uVar24 = puVar50[lVar35];
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = puVar2[lVar35];
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00283b51;
        }
        uVar24 = puVar50[lVar35];
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        do {
          uVar9 = uVar24;
          uVar8 = puVar2[lVar35];
          uVar24 = puVar6[uVar9];
        } while (puVar6[uVar9] < uVar9);
        do {
          uVar24 = uVar8;
          uVar8 = puVar6[uVar24];
        } while (puVar6[uVar24] < uVar24);
        if (uVar9 < uVar24) {
          puVar6[uVar24] = uVar9;
          uVar24 = uVar9;
        }
        else {
          puVar6[uVar9] = uVar24;
        }
      }
      else {
        uVar24 = *(uint *)(lVar44 * lVar31 + lVar12 + lVar33 + 8 + lVar47 * 4);
        if (pcVar34[lVar13 - lVar17] != '\0') {
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = *(uint *)((long)puVar2 + lVar42);
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
LAB_00283b51:
          if (uVar8 < uVar24) goto LAB_00283df3;
          UF::P_[uVar14] = uVar24;
          goto LAB_00284157;
        }
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = puVar50[lVar38];
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar8 = *(uint *)((long)puVar2 + lVar42);
          uVar24 = puVar6[uVar14];
        } while (puVar6[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = puVar6[uVar28];
        } while (puVar6[uVar28] < uVar24);
LAB_002848d1:
        if (uVar9 < uVar24) {
          puVar6[uVar28] = uVar9;
          uVar24 = uVar9;
        }
        else {
          puVar6[uVar14] = uVar24;
        }
      }
      uVar14 = lVar11 + lVar47;
      *(uint *)(lVar12 + lVar48 + lVar33 + 8 + lVar47 * 4) = uVar24;
      goto LAB_0028494f;
    }
    if (pcVar34[lVar12] != '\0') {
LAB_00287821:
      uVar24 = puVar50[uVar14];
LAB_00287825:
      puVar2[uVar14] = uVar24;
      goto LAB_00284ea6;
    }
    lVar11 = lVar13 + 0x400000000 >> 0x20;
    cVar7 = pcVar34[uVar14];
    if (pcVar34[lVar11] == '\0') goto joined_r0x00282364;
    if (cVar7 == '\0') {
LAB_002890ae:
      uVar24 = puVar50[lVar11];
      goto LAB_002890b2;
    }
    uVar24 = puVar50[uVar14];
    if (pcVar34[lVar12 - lVar17] != '\0') {
LAB_00287c04:
      puVar2[uVar14] = uVar24;
      goto LAB_0028494f;
    }
    do {
      uVar9 = uVar24;
      uVar28 = (ulong)uVar9;
      uVar24 = UF::P_[uVar28];
      uVar8 = puVar50[lVar11];
    } while (UF::P_[uVar28] < uVar9);
    do {
      uVar24 = uVar8;
      uVar51 = (ulong)uVar24;
      uVar8 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar24);
  }
  else {
    if (*(char *)(lVar26 + lVar12) == '\0') {
      if (pcVar1[(lVar13 >> 0x20) + 1] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        puVar2[uVar14] = UF::length_;
        UF::length_ = uVar24;
      }
      else {
        uVar24 = puVar2[lVar13 >> 0x20];
LAB_0028514f:
        puVar2[uVar14] = uVar24;
      }
      goto LAB_0028586f;
    }
    lVar25 = lVar13 + 0x100000000 >> 0x20;
    if (pcVar1[lVar25] == '\0') {
      if (pcVar34[lVar12] != '\0') {
        puVar2[uVar14] = puVar50[uVar14];
        goto LAB_00284ea6;
      }
      lVar11 = lVar13 + 0x400000000 >> 0x20;
      cVar7 = pcVar34[uVar14];
      uVar9 = UF::length_;
      if (pcVar34[lVar11] == '\0') {
joined_r0x00282514:
        if (cVar7 != '\0') {
          uVar24 = puVar50[uVar14];
          UF::length_ = uVar9;
          goto LAB_002899f0;
        }
        *(uint *)((long)UF::P_ + (ulong)uVar9 * 4) = uVar9;
        UF::length_ = uVar9 + 1;
        puVar2[uVar14] = uVar9;
        goto LAB_00289a1d;
      }
      if (cVar7 == '\0') goto LAB_002890ae;
      uVar24 = puVar50[uVar14];
      if (pcVar34[lVar12 - lVar17] != '\0') goto LAB_00287c04;
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar50[lVar11];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
    }
    else {
      if (pcVar34[lVar12] != '\0') {
        if (pcVar34[lVar25 - lVar17] == '\0') {
          uVar24 = puVar50[iVar23];
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar50[uVar14];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
        else {
          if (pcVar34[uVar14] != '\0') {
LAB_002875ea:
            uVar24 = puVar50[(int)lVar11];
            goto LAB_002899d9;
          }
          uVar24 = puVar50[iVar23];
          if (pcVar34[uVar14 - lVar17] != '\0') {
LAB_00288f9e:
            puVar2[uVar14] = uVar24;
            goto LAB_00284ea6;
          }
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar50[uVar14];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
        }
LAB_002899b3:
        if (uVar8 < uVar24) {
          UF::P_[uVar51] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar28] = uVar24;
        }
LAB_002899d9:
        puVar2[uVar14] = uVar24;
        goto LAB_00284ea6;
      }
      lVar13 = lVar13 + 0x400000000 >> 0x20;
      if (pcVar34[lVar13] == '\0') {
        if (pcVar34[uVar14] == '\0') {
          uVar24 = puVar2[iVar23];
LAB_00289d3e:
          puVar2[uVar14] = uVar24;
          goto LAB_00289d43;
        }
        uVar24 = puVar50[iVar23];
        if (pcVar34[lVar25 - lVar17] != '\0') {
LAB_0028177a:
          puVar2[uVar14] = uVar24;
LAB_0028177f:
          uVar14 = uVar14 & 0xffffffff;
          goto LAB_00284c69;
        }
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[uVar14];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
LAB_002820e4:
        if (uVar8 < uVar24) {
          UF::P_[uVar51] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar28] = uVar24;
        }
LAB_002899f0:
        puVar2[uVar14] = uVar24;
        goto LAB_002899f5;
      }
      if (pcVar34[lVar12 - lVar17] != '\0') {
        if (pcVar34[lVar25 - lVar17] != '\0') {
          if (pcVar34[uVar14] != '\0') goto LAB_0028814c;
          uVar24 = puVar50[iVar23];
          if (pcVar34[uVar14 - lVar17] != '\0') goto LAB_002852f5;
          do {
            uVar8 = uVar24;
            uVar28 = (ulong)uVar8;
            uVar24 = UF::P_[uVar28];
            uVar9 = puVar50[uVar14];
          } while (UF::P_[uVar28] < uVar8);
          do {
            uVar24 = uVar9;
            uVar51 = (ulong)uVar24;
            uVar9 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
LAB_00289d27:
          if (uVar8 < uVar24) {
            UF::P_[uVar51] = uVar8;
            uVar24 = uVar8;
          }
          else {
            UF::P_[uVar28] = uVar24;
          }
          puVar2[uVar14] = uVar24;
          goto LAB_0028494f;
        }
        uVar24 = puVar50[iVar23];
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[uVar14];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
LAB_00288fe1:
        if (uVar8 < uVar24) {
          UF::P_[uVar51] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar28] = uVar24;
        }
        puVar2[uVar14] = uVar24;
        goto LAB_0028494f;
      }
      if (pcVar34[uVar14] == '\0') {
        uVar24 = puVar50[lVar13];
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar2[iVar23];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_00288fe1;
      }
      if (pcVar34[lVar25 - lVar17] == '\0') {
        uVar24 = puVar50[iVar23];
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = puVar50[uVar14];
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        do {
          uVar9 = uVar24;
          uVar8 = puVar50[lVar13];
          uVar24 = puVar16[uVar9];
        } while (puVar16[uVar9] < uVar9);
        do {
          uVar24 = uVar8;
          uVar8 = puVar16[uVar24];
        } while (puVar16[uVar24] < uVar24);
        if (uVar9 < uVar24) {
          puVar16[uVar24] = uVar9;
          uVar24 = uVar9;
        }
        else {
          puVar16[uVar9] = uVar24;
        }
        puVar2[uVar14] = uVar24;
        goto LAB_0028494f;
      }
      uVar24 = puVar50[iVar23];
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar50[lVar13];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
    }
  }
  goto LAB_00289db0;
LAB_00283958:
  uVar14 = (ulong)(uint)((int)lVar11 + (int)lVar47);
LAB_002828ac:
  *puVar22 = 0;
  iVar23 = (int)uVar14;
  uVar24 = iVar23 + 2;
  if (local_e8 <= (int)uVar24) {
LAB_0028299a:
    uVar51 = (ulong)uVar24;
    if (local_e8 < (int)uVar24) {
      if (*(char *)(lVar26 + uVar51) == '\0') {
        cVar7 = pcVar1[uVar51];
        goto joined_r0x00282a52;
      }
      if (pcVar34[uVar51] != '\0') goto LAB_0028785d;
    }
    else {
      if (*(char *)(lVar26 + uVar51) == '\0') {
        uVar14 = (ulong)(iVar23 + 3);
        if (pcVar1[uVar51] == '\0') {
          if (*(char *)(lVar26 + uVar14) == '\0') goto LAB_00288813;
        }
        else if (*(char *)(lVar26 + uVar14) == '\0') goto LAB_00289148;
        cVar7 = pcVar34[uVar14];
        goto joined_r0x0028184d;
      }
      if (pcVar34[(long)iVar23 + 3] != '\0') {
        if ((pcVar34[uVar51] != '\0') || (pcVar34[(long)iVar23 + 1] == '\0')) goto LAB_00287d9f;
        uVar24 = puVar50[iVar23];
        if (pcVar34[uVar51 - lVar17] == '\0') {
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        goto LAB_00284d04;
      }
      if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
    }
    lVar26 = (long)iVar23;
    cVar7 = pcVar34[lVar26 + 1];
    goto joined_r0x002861bf;
  }
  lVar25 = (long)iVar23;
  lVar11 = lVar25 + 2;
  lVar35 = lVar25 << 0x20;
  lVar13 = lVar27 + lVar25 + lVar36;
  lVar38 = lVar36 + lVar17 * lVar32 + lVar25;
  lVar12 = lVar48 + lVar25 * 4;
  lVar42 = lVar33 + lVar12 + 8;
  lVar47 = 0;
LAB_0028291c:
  if (*(char *)(lVar13 + 2 + lVar47) == '\0') {
    if (*(char *)(lVar38 + 2 + lVar47) == '\0') {
      if (*(char *)(lVar13 + 3 + lVar47) == '\0') {
        if (*(char *)(lVar38 + 3 + lVar47) == '\0') goto code_r0x00282948;
        iVar23 = (int)lVar11 + (int)lVar47;
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
        UF::length_ = uVar24;
        goto LAB_002834ce;
      }
      uVar14 = lVar11 + lVar47;
      lVar13 = lVar17 * lVar20 + lVar25 + lVar36;
      if (*(char *)(lVar47 + 3 + lVar13) != '\0') {
        *(undefined4 *)(lVar42 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_00284ea6;
      }
      lVar35 = lVar35 + 0x400000000 >> 0x20;
      cVar7 = *(char *)(lVar47 + 2 + lVar13);
      if (pcVar34[lVar35] == '\0') {
        if (cVar7 == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
          UF::length_ = uVar24;
          goto LAB_0028056a;
        }
        *(undefined4 *)(lVar42 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        goto LAB_00284c69;
      }
      if (cVar7 == '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar35];
        uVar14 = uVar14 & 0xffffffff;
      }
      else {
        uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        if (*(char *)(lVar47 + 3 + lVar17 * lVar31 + lVar25 + lVar36) == '\0') {
          do {
            uVar8 = uVar24;
            uVar14 = (ulong)uVar8;
            uVar24 = UF::P_[uVar14];
            uVar9 = puVar50[lVar35];
          } while (UF::P_[uVar14] < uVar8);
          do {
            uVar24 = uVar9;
            uVar28 = (ulong)uVar24;
            uVar9 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_002831f9;
        }
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        uVar14 = uVar14 & 0xffffffff;
      }
      goto LAB_0028494f;
    }
    uVar14 = lVar11 + lVar47;
    lVar11 = lVar35 + 0x300000000 >> 0x20;
    if (*(char *)(lVar26 + lVar11) == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_ + 1;
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
      UF::length_ = uVar24;
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_0028586f;
    }
    if (pcVar34[lVar11] != '\0') {
      *(undefined4 *)(lVar42 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_00284ea6;
    }
    lVar13 = lVar35 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36);
    if (pcVar34[lVar13] == '\0') {
      if (cVar7 == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
        UF::length_ = uVar24;
        goto LAB_0028056a;
      }
      *(undefined4 *)(lVar42 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      goto LAB_00284c69;
    }
    if (cVar7 == '\0') {
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar13];
      uVar14 = uVar14 & 0xffffffff;
    }
    else {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      if (pcVar34[lVar11 - lVar17] == '\0') {
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = puVar50[lVar13];
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        uVar14 = uVar14 & 0xffffffff;
      }
      else {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        uVar14 = uVar14 & 0xffffffff;
      }
    }
    goto LAB_0028494f;
  }
  uVar14 = lVar11 + lVar47;
  lVar13 = lVar35 + 0x300000000 >> 0x20;
  lVar38 = lVar35 >> 0x20;
  if (pcVar34[lVar13] == '\0') {
    if (*(char *)(lVar26 + lVar13) == '\0') {
      if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) != '\0') {
        *(undefined4 *)(lVar42 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0027ffb2;
      }
      if (pcVar34[lVar38 + 1] != '\0') {
        uVar24 = puVar50[lVar38];
        goto LAB_00286d92;
      }
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_;
      goto LAB_002871dc;
    }
    lVar35 = lVar35 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36);
    if (pcVar34[lVar35] == '\0') {
      if (cVar7 != '\0') {
        *(undefined4 *)(lVar42 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        goto LAB_00284c69;
      }
      if (pcVar34[lVar38 + 1] == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_;
        goto LAB_002872f9;
      }
      uVar24 = puVar50[lVar38];
      goto LAB_00286fef;
    }
    if (cVar7 == '\0') {
      if (pcVar34[lVar38 + 1] == '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar35];
        goto LAB_0028494f;
      }
      if (pcVar34[lVar13 - lVar17] == '\0') {
        uVar24 = puVar50[lVar38];
        do {
          uVar8 = uVar24;
          uVar14 = (ulong)uVar8;
          uVar24 = UF::P_[uVar14];
          uVar9 = puVar50[lVar35];
        } while (UF::P_[uVar14] < uVar8);
        do {
          uVar24 = uVar9;
          uVar28 = (ulong)uVar24;
          uVar9 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
LAB_002831f9:
        if (uVar8 < uVar24) goto LAB_00283202;
        goto LAB_00283289;
      }
      if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar25 + lVar36) != '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar38];
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0028494f;
      }
      uVar24 = puVar50[lVar38];
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
    }
    else {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      if (pcVar34[lVar13 - lVar17] != '\0') {
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        goto LAB_00286416;
      }
      do {
        uVar8 = uVar24;
        uVar14 = (ulong)uVar8;
        uVar24 = UF::P_[uVar14];
        uVar9 = puVar50[lVar35];
      } while (UF::P_[uVar14] < uVar8);
      do {
        uVar24 = uVar9;
        uVar28 = (ulong)uVar24;
        uVar9 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
      if (uVar8 < uVar24) {
LAB_00283202:
        UF::P_[uVar28] = uVar8;
        uVar24 = uVar8;
      }
      else {
LAB_00283289:
        UF::P_[uVar14] = uVar24;
      }
    }
    uVar14 = lVar11 + lVar47;
    goto LAB_002872c6;
  }
  if (*(char *)(lVar47 + 2 + lVar17 * lVar20 + lVar25 + lVar36) == '\0') {
    if (pcVar34[lVar38 + 1] == '\0') {
      *(undefined4 *)(lVar42 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    }
    else {
      if (*(char *)(lVar47 + 2 + lVar17 * lVar31 + lVar25 + lVar36) == '\0') {
        uVar24 = puVar50[lVar38];
        do {
          uVar8 = uVar24;
          uVar24 = UF::P_[uVar8];
          uVar9 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        } while (UF::P_[uVar8] < uVar8);
        do {
          uVar24 = uVar9;
          uVar9 = UF::P_[uVar24];
        } while (UF::P_[uVar24] < uVar24);
        if (uVar8 < uVar24) {
          UF::P_[uVar24] = uVar8;
          uVar24 = uVar8;
        }
        else {
          UF::P_[uVar8] = uVar24;
        }
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_002873f3;
      }
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar38];
    }
    uVar14 = uVar14 & 0xffffffff;
  }
  else {
    *(undefined4 *)(lVar42 + lVar47 * 4) =
         *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    uVar14 = uVar14 & 0xffffffff;
  }
LAB_002873f3:
  puVar22 = UF::P_;
  uVar24 = (int)uVar14 + 2;
  uVar28 = (ulong)uVar24;
  if (local_e8 <= (int)uVar24) {
LAB_0028760a:
    uVar51 = uVar28 & 0xffffffff;
    local_a8 = (int)uVar14;
    if (local_e8 < (int)uVar28) {
      if (*(char *)(lVar26 + uVar51) == '\0') {
        if (pcVar1[uVar51] == '\0') {
          puVar2[uVar51] = 0;
        }
        else {
          if ((pcVar1[local_a8 + 1] != '\0') || (*(char *)(lVar26 + (ulong)(local_a8 + 1)) != '\0'))
          goto LAB_0028795e;
          UF::P_[UF::length_] = UF::length_;
          uVar24 = UF::length_ + 1;
          puVar2[uVar51] = UF::length_;
          UF::length_ = uVar24;
        }
        goto LAB_00289fad;
      }
      if (*(char *)(lVar26 + (ulong)(local_a8 + 1)) == '\0') {
        if ((pcVar1[local_a8 + 1] != '\0') || (pcVar34[uVar51] == '\0')) goto LAB_00287639;
        goto LAB_00287d9f;
      }
LAB_0028795e:
      lVar26 = (long)local_a8;
      goto LAB_00287961;
    }
    if (*(char *)(lVar26 + uVar51) == '\0') {
      uVar14 = (ulong)(local_a8 + 3);
      if (pcVar1[uVar51] == '\0') {
        if (*(char *)(lVar26 + uVar14) != '\0') {
          cVar7 = pcVar34[uVar14];
          goto joined_r0x0028184d;
        }
        cVar7 = pcVar1[uVar14];
        goto joined_r0x00282a52;
      }
      uVar28 = (ulong)(local_a8 + 1);
      if (*(char *)(lVar26 + uVar14) == '\0') {
        if (pcVar1[uVar28] == '\0') {
          if (*(char *)(lVar26 + uVar28) == '\0') goto LAB_00289148;
          lVar26 = (long)local_a8;
          goto LAB_00288090;
        }
        goto LAB_0028795e;
      }
      if (*(char *)(lVar26 + uVar28) == '\0') {
        cVar7 = pcVar34[uVar14];
        if (pcVar1[uVar28] == '\0') goto joined_r0x0028184d;
        if (cVar7 == '\0') {
          lVar26 = (long)local_a8;
          if (pcVar34[uVar51] == '\0') goto LAB_00288090;
          goto LAB_002877ef;
        }
        if (pcVar34[uVar51] != '\0') goto LAB_00287639;
        uVar24 = puVar50[local_a8];
        if (pcVar34[uVar51 - lVar17] == '\0') {
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        goto LAB_00284d04;
      }
      if (pcVar34[uVar14] == '\0') goto LAB_0028795e;
      if (pcVar34[uVar51] != '\0') goto LAB_0028785d;
      if (pcVar34[uVar51 - lVar17] != '\0') goto LAB_00287755;
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[local_a8];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else if (*(char *)(lVar26 + (ulong)(local_a8 + 1)) == '\0') {
      lVar26 = (long)local_a8;
      if (pcVar1[local_a8 + 1] != '\0') {
        if ((pcVar34[lVar26 + 3] == '\0') || (pcVar34[uVar51] != '\0')) goto LAB_002877ef;
        uVar24 = puVar50[lVar26];
        if (pcVar34[uVar51 - lVar17] == '\0') {
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar50[uVar51];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        goto LAB_00284d04;
      }
      if (pcVar34[lVar26 + 3] == '\0') {
        if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
        goto LAB_002877ef;
      }
      if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
      uVar24 = puVar50[lVar26];
      if (pcVar34[uVar51 - lVar17] != '\0') goto LAB_00284d04;
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar50[uVar51];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else {
      lVar26 = (long)local_a8;
      if (pcVar34[lVar26 + 3] == '\0') goto LAB_00288090;
      if (pcVar34[uVar51] != '\0') goto LAB_00287d9f;
      if (pcVar34[uVar51 - lVar17] != '\0') goto LAB_002877ef;
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[lVar26];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    goto LAB_00289f91;
  }
  lVar11 = (long)(int)uVar14;
  uVar28 = lVar11 + 2;
LAB_00287421:
  uVar14 = uVar28;
  iVar23 = (int)lVar11;
  if (*(char *)(lVar26 + uVar14) == '\0') goto LAB_00287569;
  if (*(char *)(lVar11 + 1 + lVar26) != '\0') {
    if (pcVar34[lVar11 + 3] != '\0') {
      if (pcVar34[uVar14] != '\0') goto LAB_0028744a;
      if (pcVar34[uVar14 - lVar17] != '\0') goto LAB_002874a9;
      uVar24 = puVar50[uVar14];
      do {
        uVar8 = uVar24;
        uVar28 = (ulong)uVar8;
        uVar24 = puVar22[uVar28];
        uVar9 = puVar2[lVar11];
      } while (puVar22[uVar28] < uVar8);
      do {
        uVar24 = uVar9;
        uVar51 = (ulong)uVar24;
        uVar9 = puVar22[uVar51];
      } while (puVar22[uVar51] < uVar24);
LAB_002874fa:
      if (uVar8 < uVar24) {
        puVar22[uVar51] = uVar8;
        uVar24 = uVar8;
      }
      else {
        puVar22[uVar28] = uVar24;
      }
      goto LAB_00287520;
    }
    if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
      uVar24 = *(uint *)((long)puVar2 + ((lVar11 << 0x20) >> 0x1e));
LAB_00287c44:
      uVar28 = uVar14 & 0xffffffff;
      goto LAB_00287c5a;
    }
    lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
    if (pcVar34[lVar12] == '\0') {
      uVar24 = puVar2[iVar23];
LAB_0028817f:
      uVar28 = uVar14 & 0xffffffff;
      goto LAB_00288196;
    }
    if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
      uVar24 = puVar50[lVar12];
      do {
        uVar8 = uVar24;
        uVar28 = (ulong)uVar8;
        uVar24 = UF::P_[uVar28];
        uVar9 = puVar2[iVar23];
      } while (UF::P_[uVar28] < uVar8);
      do {
        uVar24 = uVar9;
        uVar51 = (ulong)uVar24;
        uVar9 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
      goto LAB_00288fe1;
    }
    if (pcVar34[uVar14] != '\0') goto LAB_002877bb;
    if (pcVar34[uVar14 - lVar17] == '\0') {
      uVar24 = puVar50[uVar14];
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar2[iVar23];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
      goto LAB_00289db0;
    }
    goto LAB_0028814c;
  }
  if (pcVar1[lVar11 + 1] != '\0') {
    if (pcVar34[lVar11 + 3] == '\0') {
      if (*(char *)(lVar26 + 3 + lVar11) == '\0') {
        uVar24 = *(uint *)((long)puVar50 + ((lVar11 << 0x20) >> 0x1e));
        goto LAB_00287c44;
      }
      lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
      if (pcVar34[lVar12] == '\0') {
        uVar24 = puVar50[iVar23];
        goto LAB_0028817f;
      }
      if (pcVar34[lVar11 + (3 - lVar17)] == '\0') {
        uVar24 = puVar50[iVar23];
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[lVar12];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_00288fe1;
      }
      if (pcVar34[uVar14] != '\0') goto LAB_0028814c;
      uVar24 = puVar50[iVar23];
      if (pcVar34[uVar14 - lVar17] == '\0') {
        do {
          uVar9 = uVar24;
          uVar28 = (ulong)uVar9;
          uVar24 = UF::P_[uVar28];
          uVar8 = puVar50[uVar14];
        } while (UF::P_[uVar28] < uVar9);
        do {
          uVar24 = uVar8;
          uVar51 = (ulong)uVar24;
          uVar8 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_00289db0;
      }
      goto LAB_002852f5;
    }
    if (pcVar34[uVar14] == '\0') {
      uVar24 = puVar50[lVar11];
      if (pcVar34[uVar14 - lVar17] == '\0') {
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = puVar22[uVar28];
          uVar9 = puVar50[uVar14];
        } while (puVar22[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = puVar22[uVar51];
        } while (puVar22[uVar51] < uVar24);
        goto LAB_002874fa;
      }
    }
    else {
LAB_002874a9:
      uVar24 = puVar50[lVar11];
    }
LAB_00287520:
    puVar2[uVar14] = uVar24;
    uVar28 = uVar14 + 2;
    lVar11 = lVar11 + 2;
    if ((long)uVar10 <= (long)uVar28) goto LAB_0028760a;
    goto LAB_00287421;
  }
  if (pcVar34[lVar11 + 3] != '\0') {
    if (pcVar34[uVar14] == '\0') {
      uVar24 = puVar50[lVar11];
      if (pcVar34[uVar14 - lVar17] == '\0') {
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = puVar22[uVar28];
          uVar9 = puVar50[uVar14];
        } while (puVar22[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = puVar22[uVar51];
        } while (puVar22[uVar51] < uVar24);
        goto LAB_002874fa;
      }
    }
    else {
LAB_0028744a:
      uVar24 = puVar50[uVar14];
    }
    goto LAB_00287520;
  }
  if (*(char *)(lVar26 + 3 + lVar11) != '\0') {
    lVar12 = (lVar11 << 0x20) + 0x400000000 >> 0x20;
    if (pcVar34[lVar12] == '\0') {
      if (pcVar34[uVar14] == '\0') {
        puVar2[uVar14] = puVar50[iVar23];
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_0028056a;
      }
      puVar2[uVar14] = puVar50[uVar14];
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_00284c69;
    }
    if (pcVar34[uVar14] == '\0') {
      if (pcVar34[lVar11 + (3 - lVar17)] != '\0') {
        if (pcVar34[uVar14 - lVar17] == '\0') {
          uVar24 = puVar50[iVar23];
          do {
            uVar9 = uVar24;
            uVar28 = (ulong)uVar9;
            uVar24 = UF::P_[uVar28];
            uVar8 = puVar50[uVar14];
          } while (UF::P_[uVar28] < uVar9);
          do {
            uVar24 = uVar8;
            uVar51 = (ulong)uVar24;
            uVar8 = UF::P_[uVar51];
          } while (UF::P_[uVar51] < uVar24);
          goto LAB_00289db0;
        }
        puVar2[uVar14] = puVar50[iVar23];
        goto LAB_0028494f;
      }
      uVar24 = puVar50[iVar23];
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar50[lVar12];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
    }
    else {
      if (pcVar34[lVar11 + (3 - lVar17)] != '\0') {
        puVar2[uVar14] = puVar50[uVar14];
        goto LAB_0028494f;
      }
      uVar24 = puVar50[uVar14];
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar50[lVar12];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
    }
    goto LAB_00289db0;
  }
  if (pcVar34[uVar14] != '\0') {
    puVar2[uVar14] = puVar50[uVar14];
    goto LAB_0027ffb2;
  }
  puVar2[uVar14] = puVar50[iVar23];
LAB_00280c65:
  puVar22 = UF::P_;
  local_a8 = (int)uVar14;
  uVar24 = local_a8 + 2;
  if (local_e8 <= (int)uVar24) {
LAB_00280df6:
    uVar51 = (ulong)uVar24;
    if (local_e8 < (int)uVar24) {
      if (*(char *)(lVar26 + uVar51) == '\0') goto LAB_00280ec9;
      lVar26 = (long)local_a8;
      cVar7 = pcVar34[uVar51];
      if (pcVar1[lVar26 + 1] == '\0') goto joined_r0x00281033;
      if (cVar7 == '\0') goto LAB_00288090;
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[lVar26];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    else if (*(char *)(lVar26 + uVar51) == '\0') {
      uVar14 = (ulong)(local_a8 + 3);
      cVar21 = *(char *)(lVar26 + uVar14);
      if (pcVar1[uVar51] == '\0') goto LAB_00285d29;
      lVar26 = (long)local_a8;
      cVar7 = pcVar1[lVar26 + 1];
      if (cVar21 == '\0') goto joined_r0x0028163c;
      cVar21 = pcVar34[uVar14];
      if (cVar7 == '\0') goto joined_r0x00285d38;
      if (cVar21 == '\0') {
        if (pcVar34[uVar51] == '\0') goto LAB_00288090;
        uVar24 = puVar50[uVar51];
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = puVar2[lVar26];
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
      }
      else {
        uVar24 = puVar50[uVar51];
        do {
          uVar9 = uVar24;
          uVar14 = (ulong)uVar9;
          uVar24 = UF::P_[uVar14];
          uVar8 = puVar2[lVar26];
        } while (UF::P_[uVar14] < uVar9);
        do {
          uVar24 = uVar8;
          uVar28 = (ulong)uVar24;
          uVar8 = UF::P_[uVar28];
        } while (UF::P_[uVar28] < uVar24);
      }
    }
    else {
      lVar26 = (long)local_a8;
      cVar7 = pcVar34[lVar26 + 3];
      if (pcVar1[lVar26 + 1] == '\0') goto joined_r0x00283a97;
      if (cVar7 == '\0') {
        if (pcVar34[uVar51] != '\0') {
          uVar24 = puVar50[uVar51];
          do {
            uVar9 = uVar24;
            uVar14 = (ulong)uVar9;
            uVar24 = UF::P_[uVar14];
            uVar8 = puVar2[lVar26];
          } while (UF::P_[uVar14] < uVar9);
          do {
            uVar24 = uVar8;
            uVar28 = (ulong)uVar24;
            uVar8 = UF::P_[uVar28];
          } while (UF::P_[uVar28] < uVar24);
          goto LAB_00289f91;
        }
        goto LAB_00288090;
      }
      uVar24 = puVar50[uVar51];
      do {
        uVar9 = uVar24;
        uVar14 = (ulong)uVar9;
        uVar24 = UF::P_[uVar14];
        uVar8 = puVar2[lVar26];
      } while (UF::P_[uVar14] < uVar9);
      do {
        uVar24 = uVar8;
        uVar28 = (ulong)uVar24;
        uVar8 = UF::P_[uVar28];
      } while (UF::P_[uVar28] < uVar24);
    }
    goto LAB_00289f91;
  }
  lVar25 = (long)local_a8;
  lVar11 = lVar25 + 2;
  lVar49 = lVar25 << 0x20;
  lVar12 = lVar48 + lVar25 * 4;
  lVar42 = lVar33 + lVar12;
  lVar41 = lVar42 + 8;
  lVar45 = lVar17 * lVar32 + lVar25;
  lVar13 = lVar36 + lVar27 + lVar25;
  lVar43 = lVar13 + 3;
  lVar52 = lVar17 * lVar20 + lVar25;
  lVar38 = lVar36 + lVar52 + 2;
  lVar35 = 0;
  lVar47 = 0;
LAB_00280d0e:
  puVar16 = UF::P_;
  if (*(char *)(lVar13 + 2 + lVar47) != '\0') goto code_r0x00280d1a;
  uVar14 = lVar11 + lVar47;
  iVar23 = (int)uVar14;
  lVar13 = lVar49 + 0x300000000 >> 0x20;
  if (*(char *)(lVar47 + 2 + lVar45 + lVar36) == '\0') {
    if (*(char *)(lVar26 + lVar13) == '\0') {
      if (pcVar1[lVar13] == '\0') {
        puVar22 = (uint *)(lVar35 + lVar12 + lVar33 + 8);
        uVar14 = uVar14 & 0xffffffff;
        goto LAB_002828ac;
      }
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_ + 1;
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
      UF::length_ = uVar24;
      goto LAB_002834ce;
    }
    if (pcVar34[lVar13] != '\0') {
      *(undefined4 *)(lVar41 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_00284ea6;
    }
    lVar35 = lVar49 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar47 + 2 + lVar52 + lVar36);
    if (pcVar34[lVar35] == '\0') {
      if (cVar7 == '\0') goto LAB_00282563;
      *(undefined4 *)(lVar41 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      goto LAB_00284c69;
    }
    if (cVar7 == '\0') goto LAB_0028233e;
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    if (pcVar34[lVar13 - lVar17] != '\0') goto LAB_002860aa;
    do {
      uVar30 = uVar24;
      uVar28 = (ulong)uVar30;
      uVar24 = UF::P_[uVar28];
      uVar9 = puVar50[lVar35];
    } while (UF::P_[uVar28] < uVar30);
    do {
      uVar8 = uVar9;
      uVar51 = (ulong)uVar8;
      uVar9 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar8);
LAB_00282714:
    if (uVar30 < uVar8) {
      UF::P_[uVar51] = uVar30;
      uVar8 = uVar30;
    }
    else {
      UF::P_[uVar28] = uVar8;
    }
    goto LAB_00286dfd;
  }
  lVar35 = lVar49 >> 0x20;
  if (*(char *)(lVar26 + lVar13) == '\0') {
    if (pcVar1[lVar35 + 1] == '\0') {
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_ + 1;
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
      UF::length_ = uVar24;
    }
    else {
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar2[lVar35];
    }
    uVar14 = uVar14 & 0xffffffff;
    goto LAB_0028586f;
  }
  if (pcVar1[lVar35 + 1] == '\0') {
    if (pcVar34[lVar13] != '\0') {
      *(undefined4 *)(lVar41 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      uVar14 = uVar14 & 0xffffffff;
      goto LAB_00284ea6;
    }
    lVar35 = lVar49 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar47 + 2 + lVar52 + lVar36);
    if (pcVar34[lVar35] == '\0') {
      if (cVar7 != '\0') {
        *(undefined4 *)(lVar41 + lVar47 * 4) =
             *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
        goto LAB_00284c69;
      }
LAB_00282563:
      UF::P_[UF::length_] = UF::length_;
      uVar24 = UF::length_ + 1;
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
      UF::length_ = uVar24;
LAB_00281db5:
      uVar14 = lVar11 + lVar47;
      goto LAB_0028056a;
    }
    if (cVar7 == '\0') {
LAB_0028233e:
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar35];
      goto LAB_0028494f;
    }
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    if (pcVar34[lVar13 - lVar17] != '\0') goto LAB_002860aa;
    do {
      uVar30 = uVar24;
      uVar28 = (ulong)uVar30;
      uVar24 = UF::P_[uVar28];
      uVar9 = puVar50[lVar35];
    } while (UF::P_[uVar28] < uVar30);
    do {
      uVar8 = uVar9;
      uVar51 = (ulong)uVar8;
      uVar9 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar8);
    goto LAB_00282714;
  }
  if (pcVar34[lVar13] != '\0') {
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    do {
      uVar8 = uVar24;
      uVar24 = UF::P_[uVar8];
      uVar9 = puVar2[lVar35];
    } while (UF::P_[uVar8] < uVar8);
    do {
      uVar24 = uVar9;
      uVar9 = UF::P_[uVar24];
    } while (UF::P_[uVar24] < uVar24);
    if (uVar8 < uVar24) {
      UF::P_[uVar24] = uVar8;
      uVar24 = uVar8;
    }
    else {
      UF::P_[uVar8] = uVar24;
    }
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
    uVar14 = uVar14 & 0xffffffff;
    goto LAB_00284ea6;
  }
  lVar11 = lVar49 + 0x400000000 >> 0x20;
  if (pcVar34[lVar11] == '\0') {
    if (*(char *)(lVar47 + 2 + lVar52 + lVar36) == '\0') {
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar2[lVar35];
      goto LAB_0028056a;
    }
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    do {
      uVar8 = uVar24;
      uVar24 = UF::P_[uVar8];
      uVar9 = puVar2[lVar35];
    } while (UF::P_[uVar8] < uVar8);
    do {
      uVar24 = uVar9;
      uVar9 = UF::P_[uVar24];
    } while (UF::P_[uVar24] < uVar24);
    if (uVar8 < uVar24) {
      UF::P_[uVar24] = uVar8;
      uVar24 = uVar8;
    }
    else {
      UF::P_[uVar8] = uVar24;
    }
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
    goto LAB_00284c69;
  }
  if (pcVar34[lVar13 - lVar17] == '\0') {
    if (*(char *)(lVar47 + 2 + lVar52 + lVar36) == '\0') {
      uVar24 = puVar50[lVar11];
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = puVar2[lVar35];
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
      uVar14 = uVar14 & 0xffffffff;
    }
    else {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = puVar50[lVar11];
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      do {
        uVar9 = uVar24;
        uVar8 = puVar2[lVar35];
        uVar24 = puVar16[uVar9];
      } while (puVar16[uVar9] < uVar9);
      do {
        uVar24 = uVar8;
        uVar8 = puVar16[uVar24];
      } while (puVar16[uVar24] < uVar24);
      if (uVar9 < uVar24) {
        puVar16[uVar24] = uVar9;
        uVar24 = uVar9;
      }
      else {
        puVar16[uVar9] = uVar24;
      }
      *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
      uVar14 = uVar14 & 0xffffffff;
    }
  }
  else {
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    do {
      uVar8 = uVar24;
      uVar24 = UF::P_[uVar8];
      uVar9 = puVar2[lVar35];
    } while (UF::P_[uVar8] < uVar8);
    do {
      uVar24 = uVar9;
      uVar9 = UF::P_[uVar24];
    } while (UF::P_[uVar24] < uVar24);
    if (uVar8 < uVar24) {
      UF::P_[uVar24] = uVar8;
      uVar24 = uVar8;
    }
    else {
      UF::P_[uVar8] = uVar24;
    }
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
    uVar14 = uVar14 & 0xffffffff;
  }
  goto LAB_0028494f;
code_r0x00282948:
  *(undefined4 *)(lVar42 + lVar47 * 4) = 0;
  lVar35 = lVar35 + 0x200000000;
  lVar41 = lVar11 + lVar47;
  lVar47 = lVar47 + 2;
  if ((long)uVar10 <= lVar41 + 2) {
    iVar23 = iVar23 + (int)lVar47;
    uVar24 = (int)lVar11 + (int)lVar47;
    goto LAB_0028299a;
  }
  goto LAB_0028291c;
LAB_00287569:
  lVar12 = lVar11 << 0x20;
  lVar13 = lVar12 + 0x300000000 >> 0x20;
  if (pcVar1[uVar14] == '\0') {
    if (*(char *)(lVar26 + lVar13) == '\0') {
      cVar7 = pcVar1[lVar13];
      goto joined_r0x002818c3;
    }
    if (pcVar34[lVar13] != '\0') goto LAB_00287821;
    lVar11 = lVar12 + 0x400000000 >> 0x20;
    cVar7 = pcVar34[uVar14];
    uVar24 = UF::length_;
    if (pcVar34[lVar11] == '\0') goto joined_r0x00282364;
    if (cVar7 == '\0') goto LAB_002890ae;
    uVar24 = puVar50[uVar14];
    if (pcVar34[lVar13 - lVar17] == '\0') {
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar50[lVar11];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
      goto LAB_00289db0;
    }
    goto LAB_00287c04;
  }
  lVar25 = (long)(iVar23 + 1);
  if (*(char *)(lVar26 + lVar13) == '\0') {
    if (pcVar1[lVar25] == '\0') {
      if (*(char *)(lVar26 + lVar25) == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        puVar2[uVar14] = UF::length_;
        UF::length_ = uVar24;
      }
      else {
        puVar2[uVar14] = puVar2[iVar23];
      }
    }
    else {
      puVar2[uVar14] = puVar2[iVar23];
    }
    goto LAB_0028586f;
  }
  if (*(char *)(lVar26 + lVar25) != '\0') {
    if (pcVar34[lVar13] != '\0') {
      if (pcVar34[uVar14] != '\0') goto LAB_00287821;
      if (pcVar34[uVar14 - lVar17] == '\0') {
        uVar24 = puVar50[uVar14];
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar2[iVar23];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_002899b3;
      }
      goto LAB_002875ea;
    }
    lVar12 = lVar12 + 0x400000000 >> 0x20;
    if (pcVar34[lVar12] == '\0') goto LAB_00287b70;
    if (pcVar34[lVar13 - lVar17] == '\0') {
      uVar24 = puVar50[lVar12];
      do {
        uVar8 = uVar24;
        uVar28 = (ulong)uVar8;
        uVar24 = UF::P_[uVar28];
        uVar9 = puVar2[iVar23];
      } while (UF::P_[uVar28] < uVar8);
      do {
        uVar24 = uVar9;
        uVar51 = (ulong)uVar24;
        uVar9 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
      goto LAB_00288fe1;
    }
    if (pcVar34[uVar14] == '\0') {
      if (pcVar34[uVar14 - lVar17] == '\0') {
        uVar24 = puVar50[uVar14];
        do {
          uVar9 = uVar24;
          uVar28 = (ulong)uVar9;
          uVar24 = UF::P_[uVar28];
          uVar8 = puVar2[iVar23];
        } while (UF::P_[uVar28] < uVar9);
        do {
          uVar24 = uVar8;
          uVar51 = (ulong)uVar24;
          uVar8 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_00289db0;
      }
      goto LAB_0028814c;
    }
    uVar24 = puVar50[uVar14];
    goto LAB_002890b2;
  }
  if (pcVar1[lVar25] == '\0') {
    if (pcVar34[lVar13] != '\0') {
      puVar2[uVar14] = puVar50[uVar14];
      goto LAB_00284ea6;
    }
    lVar11 = lVar12 + 0x400000000 >> 0x20;
    cVar7 = pcVar34[uVar14];
    uVar9 = UF::length_;
    if (pcVar34[lVar11] == '\0') goto joined_r0x00282514;
    if (cVar7 == '\0') goto LAB_002890ae;
    uVar24 = puVar50[uVar14];
    if (pcVar34[lVar13 - lVar17] == '\0') {
      do {
        uVar9 = uVar24;
        uVar28 = (ulong)uVar9;
        uVar24 = UF::P_[uVar28];
        uVar8 = puVar50[lVar11];
      } while (UF::P_[uVar28] < uVar9);
      do {
        uVar24 = uVar8;
        uVar51 = (ulong)uVar24;
        uVar8 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar24);
      goto LAB_00289db0;
    }
    goto LAB_00287c04;
  }
  if (pcVar34[lVar13] != '\0') {
    if (pcVar34[uVar14] == '\0') {
      uVar24 = puVar50[iVar23];
      if (pcVar34[uVar14 - lVar17] == '\0') {
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[uVar14];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_002899b3;
      }
      goto LAB_00288f9e;
    }
    uVar24 = puVar50[iVar23];
    goto LAB_00287825;
  }
  lVar11 = lVar12 + 0x400000000 >> 0x20;
  if (pcVar34[lVar11] == '\0') {
    if (pcVar34[uVar14] != '\0') {
      uVar9 = puVar50[iVar23];
      goto LAB_002853da;
    }
    uVar24 = puVar2[iVar23];
    goto LAB_00289d3e;
  }
  if (pcVar34[lVar13 - lVar17] != '\0') {
    if (pcVar34[uVar14] == '\0') {
      uVar24 = puVar50[iVar23];
      if (pcVar34[uVar14 - lVar17] == '\0') {
        do {
          uVar8 = uVar24;
          uVar28 = (ulong)uVar8;
          uVar24 = UF::P_[uVar28];
          uVar9 = puVar50[uVar14];
        } while (UF::P_[uVar28] < uVar8);
        do {
          uVar24 = uVar9;
          uVar51 = (ulong)uVar24;
          uVar9 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar24);
        goto LAB_00289d27;
      }
      goto LAB_002852f5;
    }
    lVar12 = (long)iVar23;
    goto LAB_00288a81;
  }
  if (pcVar34[uVar14] == '\0') {
    uVar24 = puVar50[lVar11];
    do {
      uVar8 = uVar24;
      uVar28 = (ulong)uVar8;
      uVar24 = UF::P_[uVar28];
      uVar9 = puVar2[iVar23];
    } while (UF::P_[uVar28] < uVar8);
    do {
      uVar24 = uVar9;
      uVar51 = (ulong)uVar24;
      uVar9 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar24);
  }
  else {
    uVar24 = puVar50[iVar23];
    do {
      uVar8 = uVar24;
      uVar28 = (ulong)uVar8;
      uVar24 = UF::P_[uVar28];
      uVar9 = puVar50[lVar11];
    } while (UF::P_[uVar28] < uVar8);
    do {
      uVar24 = uVar9;
      uVar51 = (ulong)uVar24;
      uVar9 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar24);
  }
  if (uVar8 < uVar24) {
    UF::P_[uVar51] = uVar8;
    uVar24 = uVar8;
  }
  else {
    UF::P_[uVar28] = uVar24;
  }
  puVar2[uVar14] = uVar24;
  goto LAB_0028494f;
LAB_00287b70:
  uVar28 = uVar14 & 0xffffffff;
  uVar24 = puVar2[(int)lVar11];
  goto LAB_00288196;
code_r0x00280d1a:
  cVar7 = *(char *)(lVar36 + lVar52 + 3 + lVar47);
  iVar23 = (int)lVar11;
  if (*(char *)(lVar36 + lVar45 + 1 + lVar47) == '\0') {
    if (cVar7 != '\0') {
      uVar14 = (ulong)(uint)(iVar23 + (int)lVar47);
      *(undefined4 *)(lVar41 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      goto LAB_002873f3;
    }
    if (*(char *)(lVar43 + lVar47) != '\0') {
      uVar14 = lVar11 + lVar47;
      lVar11 = lVar49 + 0x400000000 >> 0x20;
      cVar7 = *(char *)(lVar47 + 2 + lVar52 + lVar36);
      if (pcVar34[lVar11] != '\0') {
        if (cVar7 == '\0') {
          *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = puVar50[lVar11];
          uVar14 = uVar14 & 0xffffffff;
        }
        else {
          uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
          if (*(char *)(lVar47 + 3 + lVar17 * lVar31 + lVar25 + lVar36) == '\0') {
            do {
              uVar8 = uVar24;
              uVar24 = UF::P_[uVar8];
              uVar9 = puVar50[lVar11];
            } while (UF::P_[uVar8] < uVar8);
            do {
              uVar24 = uVar9;
              uVar9 = UF::P_[uVar24];
            } while (UF::P_[uVar24] < uVar24);
            if (uVar8 < uVar24) {
              UF::P_[uVar24] = uVar8;
              uVar24 = uVar8;
            }
            else {
              UF::P_[uVar8] = uVar24;
            }
            *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
            uVar14 = uVar14 & 0xffffffff;
          }
          else {
            *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
            uVar14 = uVar14 & 0xffffffff;
          }
        }
        goto LAB_0028494f;
      }
      if (cVar7 == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar24 = UF::length_ + 1;
        *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = UF::length_;
        UF::length_ = uVar24;
        goto LAB_0028056a;
      }
      *(undefined4 *)(lVar41 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      goto LAB_00284c69;
    }
    if (*(char *)(lVar38 + lVar47) != '\0') {
      uVar14 = (ulong)(uint)(iVar23 + (int)lVar47);
      *(undefined4 *)(lVar41 + lVar47 * 4) =
           *(undefined4 *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      goto LAB_0027ffb2;
    }
    puVar22[UF::length_] = UF::length_;
    uVar24 = UF::length_;
    UF::length_ = UF::length_ + 1;
LAB_00280d92:
    *(uint *)(lVar41 + lVar47 * 4) = uVar24;
    lVar49 = lVar49 + 0x200000000;
    lVar35 = lVar35 + 8;
    lVar3 = lVar11 + lVar47;
    lVar47 = lVar47 + 2;
    if ((long)uVar10 <= lVar3 + 2) {
      local_a8 = local_a8 + (int)lVar47;
      uVar24 = iVar23 + (int)lVar47;
      goto LAB_00280df6;
    }
    goto LAB_00280d0e;
  }
  if (cVar7 != '\0') goto LAB_0028103e;
  if (*(char *)(lVar43 + lVar47) != '\0') {
    uVar14 = lVar11 + lVar47;
    lVar13 = lVar49 + 0x400000000 >> 0x20;
    if (pcVar34[lVar13] == '\0') {
      if (*(char *)(lVar47 + 2 + lVar52 + lVar36) == '\0') {
        *(undefined4 *)(lVar12 + lVar33 + 8 + lVar47 * 4) =
             *(undefined4 *)(lVar12 + lVar33 + lVar47 * 4);
        goto LAB_00281db5;
      }
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)(lVar42 + lVar47 * 4);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      goto LAB_00281e5f;
    }
    if (*(char *)(lVar47 + 3 + lVar17 * lVar31 + lVar25 + lVar36) != '\0') {
      uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)(lVar42 + lVar47 * 4);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      goto LAB_002872c6;
    }
    if (*(char *)(lVar47 + 2 + lVar52 + lVar36) == '\0') {
      lVar12 = lVar12 + lVar33;
      uVar24 = puVar50[lVar13];
      do {
        uVar8 = uVar24;
        uVar24 = UF::P_[uVar8];
        uVar9 = *(uint *)(lVar12 + lVar47 * 4);
      } while (UF::P_[uVar8] < uVar8);
      do {
        uVar24 = uVar9;
        uVar9 = UF::P_[uVar24];
      } while (UF::P_[uVar24] < uVar24);
      if (uVar8 < uVar24) {
        UF::P_[uVar24] = uVar8;
        uVar24 = uVar8;
      }
      else {
        UF::P_[uVar8] = uVar24;
      }
      goto LAB_002872cb;
    }
    uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
    do {
      uVar8 = uVar24;
      uVar24 = UF::P_[uVar8];
      uVar9 = puVar50[lVar13];
    } while (UF::P_[uVar8] < uVar8);
    do {
      uVar24 = uVar9;
      uVar9 = UF::P_[uVar24];
    } while (UF::P_[uVar24] < uVar24);
    if (uVar8 < uVar24) {
      UF::P_[uVar24] = uVar8;
      uVar24 = uVar8;
    }
    else {
      UF::P_[uVar8] = uVar24;
    }
    do {
      uVar9 = uVar24;
      uVar8 = *(uint *)(lVar12 + lVar33 + lVar47 * 4);
      uVar24 = puVar16[uVar9];
    } while (puVar16[uVar9] < uVar9);
    do {
      uVar24 = uVar8;
      uVar8 = puVar16[uVar24];
    } while (puVar16[uVar24] < uVar24);
    if (uVar9 < uVar24) {
      puVar16[uVar24] = uVar9;
      uVar24 = uVar9;
    }
    else {
      puVar16[uVar9] = uVar24;
    }
    *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar24;
    goto LAB_002872cf;
  }
  if (*(char *)(lVar38 + lVar47) == '\0') {
    uVar24 = *(uint *)(lVar42 + lVar47 * 4);
    goto LAB_00280d92;
  }
  uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
  do {
    uVar9 = uVar24;
    uVar24 = UF::P_[uVar9];
  } while (UF::P_[uVar9] < uVar9);
  uVar24 = *(uint *)(lVar42 + lVar47 * 4);
  do {
    uVar8 = uVar24;
    uVar24 = UF::P_[uVar8];
  } while (UF::P_[uVar8] < uVar8);
  if (uVar9 < uVar8) {
    UF::P_[uVar8] = uVar9;
    uVar8 = uVar9;
  }
  else {
    UF::P_[uVar9] = uVar8;
  }
  *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar8;
  uVar14 = lVar11 + lVar47 & 0xffffffff;
  goto LAB_0027ffb2;
LAB_0028103e:
  uVar24 = *(uint *)(lVar44 * lVar31 + lVar25 * 4 + lVar33 + 8 + lVar47 * 4);
  do {
    uVar9 = uVar24;
    uVar24 = UF::P_[uVar9];
  } while (UF::P_[uVar9] < uVar9);
  uVar24 = *(uint *)(lVar42 + lVar47 * 4);
  do {
    uVar8 = uVar24;
    uVar24 = UF::P_[uVar8];
  } while (UF::P_[uVar8] < uVar8);
  if (uVar9 < uVar8) {
    UF::P_[uVar8] = uVar9;
    uVar8 = uVar9;
  }
  else {
    UF::P_[uVar9] = uVar8;
  }
  *(uint *)(lVar12 + lVar33 + 8 + lVar47 * 4) = uVar8;
  uVar14 = lVar11 + lVar47 & 0xffffffff;
  goto LAB_002873f3;
joined_r0x00282364:
  if (cVar7 == '\0') {
    UF::P_[uVar24] = uVar24;
    UF::length_ = uVar24 + 1;
    puVar2[uVar14] = uVar24;
    uVar14 = uVar14 & 0xffffffff;
    goto LAB_0028056a;
  }
  uVar9 = puVar50[uVar14];
  UF::length_ = uVar24;
LAB_002853da:
  puVar2[uVar14] = uVar9;
  uVar14 = uVar14 & 0xffffffff;
  goto LAB_00284c69;
LAB_0028814c:
  uVar24 = puVar50[(int)lVar11];
  goto LAB_00289dd1;
LAB_0028aef1:
  uVar14 = uVar28 & 0xffffffff;
LAB_0028aef4:
  *(undefined4 *)(lVar40 + uVar28 * 4) = *(undefined4 *)(lVar44 + uVar28 * 4);
  lVar36 = (long)(int)uVar14;
  uVar28 = lVar36 + 2;
  if (local_e8 <= (int)uVar28) {
    if ((int)uVar28 <= local_e8) {
      if (*(char *)(lVar20 + uVar28) == '\0') {
        if (*(char *)(lVar36 + 3 + lVar20) == '\0') {
          *(undefined4 *)(lVar40 + 8 + lVar36 * 4) = 0;
          return;
        }
        if (*(char *)(lVar17 + 3 + lVar36) == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar15 = UF::length_ + 1;
          *(uint *)(lVar40 + 8 + lVar36 * 4) = UF::length_;
          UF::length_ = uVar15;
          return;
        }
        uVar39 = *(undefined4 *)(lVar44 + 8 + lVar36 * 4);
      }
      else {
        if (*(char *)(lVar17 + 3 + lVar36) != '\0') {
          if (*(char *)(lVar25 + uVar28) == '\0') {
            uVar15 = *(uint *)(lVar44 + 8 + lVar36 * 4);
            do {
              uVar24 = uVar15;
              uVar10 = (ulong)uVar24;
              uVar15 = UF::P_[uVar10];
              uVar18 = *(uint *)(lVar40 + lVar36 * 4);
            } while (UF::P_[uVar10] < uVar24);
            do {
              uVar15 = uVar18;
              uVar14 = (ulong)uVar15;
              uVar18 = UF::P_[uVar14];
            } while (UF::P_[uVar14] < uVar15);
          }
          else {
            uVar15 = *(uint *)(lVar44 + lVar36 * 4);
            if (*(char *)(lVar25 + 1 + lVar36) != '\0') {
              *(uint *)(lVar40 + 8 + lVar36 * 4) = uVar15;
              return;
            }
            do {
              uVar24 = uVar15;
              uVar10 = (ulong)uVar24;
              uVar15 = UF::P_[uVar10];
              uVar18 = *(uint *)(lVar44 + 8 + lVar36 * 4);
            } while (UF::P_[uVar10] < uVar24);
            do {
              uVar15 = uVar18;
              uVar14 = (ulong)uVar15;
              uVar18 = UF::P_[uVar14];
            } while (UF::P_[uVar14] < uVar15);
          }
          if (uVar24 < uVar15) {
            UF::P_[uVar14] = uVar24;
            uVar15 = uVar24;
          }
          else {
            UF::P_[uVar10] = uVar15;
          }
          *(uint *)(lVar40 + 8 + lVar36 * 4) = uVar15;
          return;
        }
        uVar39 = *(undefined4 *)(lVar40 + lVar36 * 4);
      }
      *(undefined4 *)(lVar40 + 8 + lVar36 * 4) = uVar39;
      return;
    }
    goto LAB_0028be1f;
  }
  if (*(char *)(lVar20 + 2 + lVar36) == '\0') {
    if (*(char *)(lVar20 + 3 + lVar36) != '\0') {
      if (*(char *)(lVar17 + 3 + lVar36) == '\0') {
        if (*(char *)(lVar36 + 4 + lVar17) == '\0') {
LAB_0028ba2b:
          uVar14 = (ulong)UF::length_;
          UF::P_[uVar14] = UF::length_;
          UF::length_ = UF::length_ + 1;
LAB_0028ab38:
          iVar29 = (int)uVar28;
          uVar15 = (uint)uVar14;
LAB_0028ab3b:
          *(uint *)(lVar40 + uVar28 * 4) = uVar15;
          puVar2 = UF::P_;
          uVar15 = iVar29 + 2;
          if ((int)uVar15 < local_e8) {
            lVar42 = (long)iVar29;
            lVar33 = lVar42 + 2;
            lVar36 = lVar42 << 0x20;
            lVar35 = lVar32 + lVar42;
            lVar38 = 0;
            while (*(char *)(lVar26 + lVar42 + -1 + lVar38) == '\0') {
              if (*(char *)(lVar26 + lVar42 + lVar38) == '\0') {
                uVar28 = lVar33 + lVar38;
                goto LAB_0028b1a3;
              }
              if (*(char *)(lVar35 + -1 + lVar38) != '\0') {
                uVar28 = lVar33 + lVar38;
                iVar29 = (int)uVar28;
                goto LAB_0028b0b0;
              }
              if (*(char *)(lVar35 + lVar38) != '\0') {
                uVar28 = lVar33 + lVar38;
                uVar37 = (ulong)*(uint *)(lVar13 + lVar42 * 4 + 8 + lVar38 * 4);
                uVar14 = uVar28 & 0xffffffff;
                goto LAB_0028adaa;
              }
              puVar2[UF::length_] = UF::length_;
              uVar15 = UF::length_ + 1;
              *(uint *)(lVar31 + lVar42 * 4 + lVar38 * 4) = UF::length_;
              UF::length_ = uVar15;
              lVar36 = lVar36 + 0x200000000;
              lVar47 = lVar33 + lVar38;
              lVar38 = lVar38 + 2;
              if ((long)uVar10 <= lVar47 + 2) {
                uVar15 = iVar29 + (int)lVar38 + 2;
                iVar29 = iVar29 + (int)lVar38;
                goto LAB_0028be14;
              }
            }
            uVar28 = lVar33 + lVar38;
            lVar35 = lVar36 + 0x300000000 >> 0x20;
            lVar33 = lVar36 >> 0x1e;
            if (*(char *)(lVar17 + lVar35) != '\0') {
              uVar15 = *(uint *)(lVar13 + lVar42 * 4 + lVar38 * 4);
              do {
                uVar24 = uVar15;
                uVar14 = (ulong)uVar24;
                uVar15 = UF::P_[uVar14];
                uVar18 = *(uint *)(lVar40 + lVar33);
              } while (UF::P_[uVar14] < uVar24);
              do {
                uVar15 = uVar18;
                uVar51 = (ulong)uVar15;
                uVar18 = UF::P_[uVar51];
              } while (UF::P_[uVar51] < uVar15);
LAB_0028b712:
              if (uVar24 < uVar15) {
                UF::P_[uVar51] = uVar24;
                uVar15 = uVar24;
              }
              else {
                UF::P_[uVar14] = uVar15;
              }
LAB_0028b72e:
              uVar14 = uVar28 & 0xffffffff;
LAB_0028b733:
              *(uint *)(lVar40 + uVar28 * 4) = uVar15;
              puVar2 = UF::P_;
              iVar23 = (int)uVar14;
              uVar14 = (ulong)(iVar23 + 2U);
              if (local_e8 <= (int)(iVar23 + 2U)) {
LAB_0028bc26:
                lVar31 = (long)(int)uVar14;
                if (local_e8 < (int)uVar14) {
                  if (*(char *)(lVar20 + lVar31) == '\0') goto LAB_0028bfc3;
                  lVar32 = (long)iVar23;
                  if (*(char *)(lVar20 + 1 + lVar32) != '\0') {
                    uVar39 = *(undefined4 *)(lVar40 + lVar32 * 4);
                    goto LAB_0028c166;
                  }
                  if (*(char *)(lVar17 + lVar31) == '\0') {
                    uVar39 = *(undefined4 *)(lVar44 + lVar32 * 4);
                    goto LAB_0028c166;
                  }
                }
                else {
                  lVar32 = (long)iVar23;
                  if (*(char *)(lVar20 + lVar31) == '\0') {
                    if (*(char *)(lVar32 + 3 + lVar20) == '\0') goto LAB_0028bfc3;
                    cVar7 = *(char *)(lVar17 + 3 + lVar32);
joined_r0x0028bf2e:
                    if ((cVar7 == '\0') && (*(char *)(lVar17 + lVar31) == '\0')) {
LAB_0028c0a0:
                      UF::P_[UF::length_] = UF::length_;
                      uVar15 = UF::length_ + 1;
                      *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
                      UF::length_ = uVar15;
                      return;
                    }
                  }
                  else {
                    cVar7 = *(char *)(lVar17 + 3 + lVar32);
                    if (*(char *)(lVar20 + 1 + lVar32) == '\0') {
                      if (cVar7 == '\0') {
                        if (*(char *)(lVar17 + lVar31) == '\0') goto LAB_0028c179;
                      }
                      else if (*(char *)(lVar17 + lVar31) == '\0') {
                        uVar15 = *(uint *)(lVar44 + lVar32 * 4);
                        if (*(char *)(lVar25 + lVar31) != '\0') {
LAB_0028c022:
                          *(uint *)(lVar40 + lVar31 * 4) = uVar15;
                          return;
                        }
                        do {
                          uVar24 = uVar15;
                          uVar10 = (ulong)uVar24;
                          uVar15 = UF::P_[uVar10];
                          uVar18 = *(uint *)(lVar44 + lVar31 * 4);
                        } while (UF::P_[uVar10] < uVar24);
                        do {
                          uVar15 = uVar18;
                          uVar14 = (ulong)uVar15;
                          uVar18 = UF::P_[uVar14];
                        } while (UF::P_[uVar14] < uVar15);
LAB_0028c284:
                        if (uVar24 < uVar15) {
                          UF::P_[uVar14] = uVar24;
                          uVar15 = uVar24;
                        }
                        else {
                          UF::P_[uVar10] = uVar15;
                        }
                        *(uint *)(lVar40 + lVar31 * 4) = uVar15;
                        return;
                      }
                    }
                    else {
                      if (cVar7 == '\0') {
                        uVar39 = *(undefined4 *)(lVar40 + lVar32 * 4);
                        goto LAB_0028c166;
                      }
                      if (*(char *)(lVar17 + lVar31) == '\0') {
                        if (*(char *)(lVar25 + lVar31) == '\0') {
                          uVar15 = *(uint *)(lVar44 + lVar31 * 4);
                          do {
                            uVar24 = uVar15;
                            uVar10 = (ulong)uVar24;
                            uVar15 = UF::P_[uVar10];
                            uVar18 = *(uint *)(lVar40 + lVar32 * 4);
                          } while (UF::P_[uVar10] < uVar24);
                          do {
                            uVar15 = uVar18;
                            uVar14 = (ulong)uVar15;
                            uVar18 = UF::P_[uVar14];
                          } while (UF::P_[uVar14] < uVar15);
                          goto LAB_0028c284;
                        }
LAB_0028c179:
                        uVar39 = *(undefined4 *)(lVar44 + lVar32 * 4);
                        goto LAB_0028c166;
                      }
                    }
                  }
                }
LAB_0028c161:
                uVar39 = *(undefined4 *)(lVar44 + lVar31 * 4);
                goto LAB_0028c166;
              }
              lVar36 = (long)iVar23;
              uVar14 = lVar36 + 2;
LAB_0028b750:
              uVar28 = uVar14;
              iVar23 = (int)lVar36;
              if (*(char *)(lVar20 + uVar28) == '\0') {
                lVar33 = (lVar36 << 0x20) + 0x300000000 >> 0x20;
                if (*(char *)(lVar20 + lVar33) == '\0') goto LAB_0028b8c5;
                if (*(char *)(lVar17 + lVar33) != '\0') goto LAB_0028b0ad;
                lVar36 = (long)(iVar23 + 4);
                if (*(char *)(lVar17 + lVar36) == '\0') {
                  if (*(char *)(lVar17 + uVar28) == '\0') goto LAB_0028ba2b;
                  goto LAB_0028aef1;
                }
                if (*(char *)(lVar17 + uVar28) == '\0') goto LAB_0028bad6;
                uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                if (*(char *)(lVar25 + lVar33) == '\0') {
                  do {
                    uVar37 = (ulong)uVar15;
                    uVar14 = (ulong)uVar15;
                    bVar53 = UF::P_[uVar14] < uVar15;
                    uVar15 = UF::P_[uVar14];
                    uVar18 = *(uint *)(lVar44 + lVar36 * 4);
                  } while (bVar53);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar15);
                  goto LAB_0028bb90;
                }
                goto LAB_0028baf2;
              }
              cVar7 = *(char *)(lVar36 + 3 + lVar17);
              if (*(char *)(lVar20 + 1 + lVar36) != '\0') {
                if (cVar7 != '\0') {
                  if (*(char *)(lVar17 + uVar28) == '\0') {
                    if (*(char *)(lVar25 + uVar28) == '\0') {
                      uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                      do {
                        uVar24 = uVar15;
                        uVar14 = (ulong)uVar24;
                        uVar15 = puVar2[uVar14];
                        uVar18 = *(uint *)(lVar40 + lVar36 * 4);
                      } while (puVar2[uVar14] < uVar24);
                      do {
                        uVar15 = uVar18;
                        uVar51 = (ulong)uVar15;
                        uVar18 = puVar2[uVar51];
                      } while (puVar2[uVar51] < uVar15);
LAB_0028b818:
                      if (uVar24 < uVar15) {
                        puVar2[uVar51] = uVar24;
                        uVar15 = uVar24;
                      }
                      else {
                        puVar2[uVar14] = uVar15;
                      }
                    }
                    else {
                      uVar15 = *(uint *)(lVar44 + lVar36 * 4);
                    }
                  }
                  else {
LAB_0028b799:
                    uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                  }
                  goto LAB_0028b79e;
                }
                if (*(char *)(lVar20 + 3 + lVar36) == '\0') goto LAB_0028b908;
                if (*(char *)(lVar17 + (iVar23 + 4)) != '\0') {
                  if (*(char *)(lVar25 + 3 + lVar36) == '\0') {
                    uVar15 = *(uint *)(lVar44 + (long)(iVar23 + 4) * 4);
                    do {
                      uVar37 = (ulong)uVar15;
                      uVar14 = (ulong)uVar15;
                      bVar53 = UF::P_[uVar14] < uVar15;
                      uVar15 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar40 + lVar36 * 4);
                    } while (bVar53);
                    do {
                      uVar15 = uVar18;
                      uVar51 = (ulong)uVar15;
                      uVar18 = UF::P_[uVar51];
                    } while (UF::P_[uVar51] < uVar15);
                    goto LAB_0028bb90;
                  }
                  if (*(char *)(lVar17 + uVar28) != '\0') {
                    uVar37 = (ulong)*(uint *)(lVar44 + uVar28 * 4);
                    goto LAB_0028baf5;
                  }
                  if (*(char *)(lVar25 + uVar28) != '\0') {
LAB_0028bad6:
                    uVar37 = (ulong)*(uint *)(lVar44 + lVar36 * 4);
                    goto LAB_0028baf5;
                  }
                  uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                  do {
                    uVar37 = (ulong)uVar15;
                    uVar14 = (ulong)uVar15;
                    bVar53 = UF::P_[uVar14] < uVar15;
                    uVar15 = UF::P_[uVar14];
                    uVar18 = *(uint *)(lVar40 + lVar36 * 4);
                  } while (bVar53);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar15);
                  goto LAB_0028bb90;
                }
LAB_0028b997:
                lVar36 = lVar36 * 4;
LAB_0028b40f:
                *(undefined4 *)(lVar40 + uVar28 * 4) = *(undefined4 *)(lVar40 + lVar36);
                iVar23 = (int)uVar28;
                uVar15 = iVar23 + 2;
                if (local_e8 <= (int)uVar15) {
LAB_0028bd9b:
                  uVar28 = (ulong)uVar15;
                  if (local_e8 < (int)uVar15) goto LAB_0028be1f;
                  lVar31 = (long)(int)uVar15;
                  if (*(char *)(lVar20 + lVar31) == '\0') {
                    if (*(char *)((long)iVar23 + 3 + lVar20) == '\0') {
                      *(undefined4 *)(lVar40 + lVar31 * 4) = 0;
                      return;
                    }
                    if (*(char *)(lVar17 + 3 + (long)iVar23) == '\0') {
                      UF::P_[UF::length_] = UF::length_;
                      uVar15 = UF::length_ + 1;
                      *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
                      UF::length_ = uVar15;
                      return;
                    }
                    uVar39 = *(undefined4 *)(lVar44 + lVar31 * 4);
                  }
                  else {
                    lVar20 = (long)iVar23;
                    if (*(char *)(lVar17 + 3 + lVar20) != '\0') {
                      if (*(char *)(lVar25 + lVar31) == '\0') {
                        uVar15 = *(uint *)(lVar44 + lVar31 * 4);
                        do {
                          uVar24 = uVar15;
                          uVar10 = (ulong)uVar24;
                          uVar15 = UF::P_[uVar10];
                          uVar18 = *(uint *)(lVar40 + lVar20 * 4);
                        } while (UF::P_[uVar10] < uVar24);
                        do {
                          uVar15 = uVar18;
                          uVar14 = (ulong)uVar15;
                          uVar18 = UF::P_[uVar14];
                        } while (UF::P_[uVar14] < uVar15);
                      }
                      else if (*(char *)(lVar17 + lVar20) == '\0') {
                        uVar15 = *(uint *)(lVar44 + lVar31 * 4);
                        do {
                          uVar24 = uVar15;
                          uVar10 = (ulong)uVar24;
                          uVar15 = UF::P_[uVar10];
                          uVar18 = *(uint *)(lVar40 + lVar20 * 4);
                        } while (UF::P_[uVar10] < uVar24);
                        do {
                          uVar15 = uVar18;
                          uVar14 = (ulong)uVar15;
                          uVar18 = UF::P_[uVar14];
                        } while (UF::P_[uVar14] < uVar15);
                      }
                      else {
                        uVar15 = *(uint *)(lVar44 + lVar20 * 4);
                        if (*(char *)(lVar25 + 1 + lVar20) != '\0') {
                          *(uint *)(lVar40 + lVar31 * 4) = uVar15;
                          return;
                        }
                        do {
                          uVar24 = uVar15;
                          uVar10 = (ulong)uVar24;
                          uVar15 = UF::P_[uVar10];
                          uVar18 = *(uint *)(lVar44 + lVar31 * 4);
                        } while (UF::P_[uVar10] < uVar24);
                        do {
                          uVar15 = uVar18;
                          uVar14 = (ulong)uVar15;
                          uVar18 = UF::P_[uVar14];
                        } while (UF::P_[uVar14] < uVar15);
                      }
                      goto LAB_0028c284;
                    }
LAB_0028c115:
                    uVar39 = *(undefined4 *)(lVar40 + lVar20 * 4);
                  }
                  goto LAB_0028c166;
                }
                lVar35 = (long)iVar23;
                lVar36 = lVar35 + 2;
                lVar38 = lVar35 << 0x20;
                lVar33 = lVar31 + lVar35 * 4;
                lVar47 = lVar32 + lVar35;
                lVar42 = 0;
LAB_0028b44f:
                if (*(char *)(lVar26 + lVar35 + -1 + lVar42) == '\0') goto LAB_0028b4a6;
                lVar41 = lVar38 >> 0x20;
                lVar52 = lVar38 >> 0x1e;
                if (*(char *)(lVar47 + -1 + lVar42) == '\0') {
                  if (*(char *)(lVar26 + lVar35 + lVar42) == '\0') {
                    uVar28 = lVar36 + lVar42;
                    iVar23 = (int)uVar28;
                    uVar15 = *(uint *)(lVar40 + lVar52);
                    goto LAB_0028b90f;
                  }
                  if (*(char *)(lVar47 + lVar42) == '\0') goto code_r0x0028b47a;
                  uVar28 = lVar36 + lVar42;
                  if (*(char *)(lVar42 + lVar11 + lVar35) == '\0') {
                    uVar15 = *(uint *)(lVar13 + lVar35 * 4 + 8 + lVar42 * 4);
                    do {
                      uVar37 = (ulong)uVar15;
                      uVar14 = (ulong)uVar15;
                      bVar53 = UF::P_[uVar14] < uVar15;
                      uVar15 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar40 + lVar52);
                    } while (bVar53);
                    do {
                      uVar15 = uVar18;
                      uVar51 = (ulong)uVar15;
                      uVar18 = UF::P_[uVar51];
                    } while (UF::P_[uVar51] < uVar15);
                    goto LAB_0028bb90;
                  }
                  if (*(char *)(lVar42 + -1 + lVar11 + lVar35) == '\0') {
                    uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar42 * 4);
                    do {
                      uVar37 = (ulong)uVar15;
                      uVar14 = (ulong)uVar15;
                      bVar53 = UF::P_[uVar14] < uVar15;
                      uVar15 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar40 + lVar52);
                    } while (bVar53);
                    do {
                      uVar15 = uVar18;
                      uVar51 = (ulong)uVar15;
                      uVar18 = UF::P_[uVar51];
                    } while (UF::P_[uVar51] < uVar15);
                    goto LAB_0028bb90;
                  }
                  if (*(char *)(lVar17 + lVar41) == '\0') {
                    uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar42 * 4);
                    do {
                      uVar37 = (ulong)uVar15;
                      uVar14 = (ulong)uVar15;
                      bVar53 = UF::P_[uVar14] < uVar15;
                      uVar15 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar40 + lVar41 * 4);
                    } while (bVar53);
                    do {
                      uVar15 = uVar18;
                      uVar51 = (ulong)uVar15;
                      uVar18 = UF::P_[uVar51];
                    } while (UF::P_[uVar51] < uVar15);
                    goto LAB_0028bb90;
                  }
                  uVar37 = (ulong)*(uint *)(lVar44 + lVar41 * 4);
                  if (*(char *)(lVar27 + lVar41) == '\0') {
                    do {
                      uVar14 = uVar37;
                      uVar18 = (uint)uVar14;
                      uVar37 = (ulong)UF::P_[uVar14];
                      uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar42 * 4);
                    } while (UF::P_[uVar14] < uVar18);
                    do {
                      uVar37 = (ulong)uVar15;
                      uVar51 = (ulong)uVar15;
                      bVar53 = UF::P_[uVar51] < uVar15;
                      uVar15 = UF::P_[uVar51];
                    } while (bVar53);
                    goto LAB_0028b5f0;
                  }
                  goto LAB_0028baf5;
                }
                uVar28 = lVar36 + lVar42;
                if (*(char *)(lVar42 + -1 + lVar11 + lVar35) == '\0') {
                  uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar42 * 4);
                  do {
                    uVar24 = uVar15;
                    uVar14 = (ulong)uVar24;
                    uVar15 = UF::P_[uVar14];
                    uVar18 = *(uint *)(lVar40 + lVar52);
                  } while (UF::P_[uVar14] < uVar24);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar15);
                }
                else {
                  if (*(char *)(lVar17 + lVar41) != '\0') {
                    uVar15 = *(uint *)(lVar44 + lVar41 * 4);
                    if (*(char *)(lVar27 + lVar41) != '\0') goto LAB_0028b53a;
                    do {
                      uVar24 = uVar15;
                      uVar14 = (ulong)uVar24;
                      uVar15 = UF::P_[uVar14];
                      uVar18 = *(uint *)(lVar13 + lVar35 * 4 + lVar42 * 4);
                    } while (UF::P_[uVar14] < uVar24);
                    do {
                      uVar15 = uVar18;
                      uVar51 = (ulong)uVar15;
                      uVar18 = UF::P_[uVar51];
                    } while (UF::P_[uVar51] < uVar15);
                    if (uVar24 < uVar15) {
LAB_0028ba7a:
                      UF::P_[uVar51] = uVar24;
                      uVar15 = uVar24;
                    }
                    else {
LAB_0028a9a8:
                      UF::P_[uVar14] = uVar15;
                    }
                    goto LAB_0028b72e;
                  }
                  uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar42 * 4);
                  do {
                    uVar24 = uVar15;
                    uVar14 = (ulong)uVar24;
                    uVar15 = UF::P_[uVar14];
                    uVar18 = *(uint *)(lVar40 + lVar41 * 4);
                  } while (UF::P_[uVar14] < uVar24);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar15);
                }
                goto LAB_0028b712;
              }
              if (cVar7 != '\0') {
                if (*(char *)(lVar17 + uVar28) != '\0') goto LAB_0028b799;
                uVar15 = *(uint *)(lVar44 + lVar36 * 4);
                if (*(char *)(lVar25 + uVar28) == '\0') {
                  do {
                    uVar24 = uVar15;
                    uVar14 = (ulong)uVar24;
                    uVar15 = puVar2[uVar14];
                    uVar18 = *(uint *)(lVar44 + uVar28 * 4);
                  } while (puVar2[uVar14] < uVar24);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = puVar2[uVar51];
                  } while (puVar2[uVar51] < uVar15);
                  goto LAB_0028b818;
                }
LAB_0028b79e:
                *(uint *)(lVar40 + uVar28 * 4) = uVar15;
                uVar14 = uVar28 + 2;
                lVar36 = lVar36 + 2;
                if ((long)uVar10 <= (long)uVar14) {
                  iVar23 = (int)uVar28;
                  goto LAB_0028bc26;
                }
                goto LAB_0028b750;
              }
              if (*(char *)(lVar20 + 3 + lVar36) == '\0') {
                if (*(char *)(lVar17 + uVar28) == '\0') {
                  uVar15 = *(uint *)(lVar44 + lVar36 * 4);
                }
                else {
                  uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                }
                goto LAB_0028b90c;
              }
              lVar33 = (long)(iVar23 + 4);
              if (*(char *)(lVar17 + lVar33) == '\0') {
                if (*(char *)(lVar17 + uVar28) != '\0') goto LAB_0028ba8e;
                uVar14 = (ulong)*(uint *)(lVar44 + lVar36 * 4);
                goto LAB_0028ab38;
              }
              cVar7 = *(char *)(lVar25 + 3 + lVar36);
              if (*(char *)(lVar17 + uVar28) == '\0') {
                if (cVar7 == '\0') {
                  uVar15 = *(uint *)(lVar44 + lVar36 * 4);
                  do {
                    uVar37 = (ulong)uVar15;
                    uVar14 = (ulong)uVar15;
                    bVar53 = UF::P_[uVar14] < uVar15;
                    uVar15 = UF::P_[uVar14];
                    uVar18 = *(uint *)(lVar44 + lVar33 * 4);
                  } while (bVar53);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = UF::P_[uVar51];
                  } while (UF::P_[uVar51] < uVar15);
                  goto LAB_0028bb90;
                }
                uVar15 = *(uint *)(lVar44 + lVar36 * 4);
                if (*(char *)(lVar25 + uVar28) != '\0') goto LAB_0028baf2;
                do {
                  uVar37 = (ulong)uVar15;
                  uVar14 = (ulong)uVar15;
                  bVar53 = UF::P_[uVar14] < uVar15;
                  uVar15 = UF::P_[uVar14];
                  uVar18 = *(uint *)(lVar44 + uVar28 * 4);
                } while (bVar53);
                do {
                  uVar15 = uVar18;
                  uVar51 = (ulong)uVar15;
                  uVar18 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar15);
              }
              else {
                uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                if (cVar7 != '\0') goto LAB_0028baf2;
                do {
                  uVar37 = (ulong)uVar15;
                  uVar14 = (ulong)uVar15;
                  bVar53 = UF::P_[uVar14] < uVar15;
                  uVar15 = UF::P_[uVar14];
                  uVar18 = *(uint *)(lVar44 + lVar33 * 4);
                } while (bVar53);
                do {
                  uVar15 = uVar18;
                  uVar51 = (ulong)uVar15;
                  uVar18 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar15);
              }
              goto LAB_0028bb90;
            }
            if (*(char *)(lVar20 + lVar35) != '\0') {
              lVar47 = lVar36 + 0x400000000 >> 0x20;
              if (*(char *)(lVar17 + lVar47) == '\0') goto LAB_0028b2e5;
              if (*(char *)(lVar25 + lVar35) == '\0') {
                uVar15 = *(uint *)(lVar44 + lVar47 * 4);
                do {
                  uVar24 = uVar15;
                  uVar14 = (ulong)uVar24;
                  uVar18 = *(uint *)(lVar40 + lVar33);
                  uVar15 = UF::P_[uVar14];
                } while (UF::P_[uVar14] < uVar24);
                do {
                  uVar15 = uVar18;
                  uVar51 = (ulong)uVar15;
                  uVar18 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar15);
              }
              else {
                uVar15 = *(uint *)(lVar13 + lVar42 * 4 + lVar38 * 4);
                do {
                  uVar24 = uVar15;
                  uVar14 = (ulong)uVar24;
                  uVar18 = *(uint *)(lVar40 + lVar33);
                  uVar15 = UF::P_[uVar14];
                } while (UF::P_[uVar14] < uVar24);
                do {
                  uVar15 = uVar18;
                  uVar51 = (ulong)uVar15;
                  uVar18 = UF::P_[uVar51];
                } while (UF::P_[uVar51] < uVar15);
              }
              uVar37 = (ulong)uVar24;
              if (uVar24 < uVar15) goto LAB_0028bb95;
              UF::P_[uVar14] = uVar15;
              uVar37 = (ulong)uVar15;
              goto LAB_0028bba2;
            }
            iVar23 = (int)uVar28;
            uVar15 = *(uint *)(lVar40 + lVar33);
            goto LAB_0028b90f;
          }
LAB_0028be14:
          uVar28 = (ulong)uVar15;
          if (local_e8 < (int)uVar15) goto LAB_0028be1f;
          lVar31 = (long)(int)uVar15;
          if (*(char *)(lVar20 + lVar31) == '\0') {
            if (*(char *)((long)iVar29 + 3 + lVar20) == '\0') {
              *(undefined4 *)(lVar40 + lVar31 * 4) = 0;
              return;
            }
            if (*(char *)(lVar17 + 3 + (long)iVar29) == '\0') {
              UF::P_[UF::length_] = UF::length_;
              uVar15 = UF::length_ + 1;
              *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
              UF::length_ = uVar15;
              return;
            }
            uVar39 = *(undefined4 *)(lVar44 + lVar31 * 4);
          }
          else {
            lVar20 = (long)iVar29;
            if (*(char *)(lVar17 + 3 + lVar20) != '\0') {
              uVar15 = *(uint *)(lVar44 + lVar31 * 4);
              do {
                uVar24 = uVar15;
                uVar15 = UF::P_[uVar24];
                uVar18 = *(uint *)(lVar40 + lVar20 * 4);
              } while (UF::P_[uVar24] < uVar24);
              do {
                uVar15 = uVar18;
                uVar18 = UF::P_[uVar15];
              } while (UF::P_[uVar15] < uVar15);
              if (uVar24 < uVar15) {
                UF::P_[uVar15] = uVar24;
                uVar15 = uVar24;
              }
              else {
                UF::P_[uVar24] = uVar15;
              }
              *(uint *)(lVar40 + lVar31 * 4) = uVar15;
              return;
            }
            uVar39 = *(undefined4 *)(lVar40 + lVar20 * 4);
          }
          goto LAB_0028bc1b;
        }
        uVar37 = (ulong)*(uint *)(lVar44 + 0x10 + lVar36 * 4);
        goto LAB_0028baf5;
      }
      goto LAB_0028b0ad;
    }
    goto LAB_0028b8c5;
  }
  if (*(char *)(lVar17 + 3 + lVar36) != '\0') {
    if (*(char *)(lVar25 + uVar28) == '\0') {
      uVar15 = *(uint *)(lVar44 + 8 + lVar36 * 4);
      do {
        uVar24 = uVar15;
        uVar14 = (ulong)uVar24;
        uVar15 = UF::P_[uVar14];
        uVar18 = *(uint *)(lVar40 + lVar36 * 4);
      } while (UF::P_[uVar14] < uVar24);
      do {
        uVar15 = uVar18;
        uVar51 = (ulong)uVar15;
        uVar18 = UF::P_[uVar51];
        if (uVar15 <= UF::P_[uVar51]) goto LAB_0028b712;
      } while( true );
    }
    uVar15 = *(uint *)(lVar44 + lVar36 * 4);
    if (*(char *)(lVar27 + lVar36) != '\0') goto LAB_0028b72e;
    do {
      uVar24 = uVar15;
      uVar14 = (ulong)uVar24;
      uVar15 = UF::P_[uVar14];
      uVar18 = *(uint *)(lVar44 + 8 + lVar36 * 4);
    } while (UF::P_[uVar14] < uVar24);
    do {
      uVar15 = uVar18;
      uVar51 = (ulong)uVar15;
      uVar18 = UF::P_[uVar51];
      if (uVar15 <= UF::P_[uVar51]) goto LAB_0028b712;
    } while( true );
  }
  if (*(char *)(lVar20 + 3 + lVar36) == '\0') {
LAB_0028b908:
    uVar15 = *(uint *)(lVar40 + lVar36 * 4);
    goto LAB_0028b90c;
  }
  if (*(char *)(lVar36 + 4 + lVar17) == '\0') {
    lVar36 = lVar36 * 4;
    goto LAB_0028b40f;
  }
  if (*(char *)(lVar25 + 3 + lVar36) == '\0') {
    uVar15 = *(uint *)(lVar44 + 0x10 + lVar36 * 4);
    do {
      uVar37 = (ulong)uVar15;
      uVar14 = (ulong)uVar15;
      bVar53 = UF::P_[uVar14] < uVar15;
      uVar15 = UF::P_[uVar14];
      uVar18 = *(uint *)(lVar40 + lVar36 * 4);
    } while (bVar53);
    do {
      uVar15 = uVar18;
      uVar51 = (ulong)uVar15;
      uVar18 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar15);
  }
  else {
    if (*(char *)(lVar25 + uVar28) != '\0') {
      uVar15 = *(uint *)(lVar44 + lVar36 * 4);
      if (*(char *)(lVar27 + lVar36) == '\0') {
        do {
          uVar37 = (ulong)uVar15;
          uVar14 = (ulong)uVar15;
          bVar53 = UF::P_[uVar14] < uVar15;
          uVar15 = UF::P_[uVar14];
          uVar18 = *(uint *)(lVar44 + 8 + lVar36 * 4);
        } while (bVar53);
        do {
          uVar15 = uVar18;
          uVar51 = (ulong)uVar15;
          uVar18 = UF::P_[uVar51];
        } while (UF::P_[uVar51] < uVar15);
        goto LAB_0028bb90;
      }
LAB_0028baf2:
      uVar37 = (ulong)uVar15;
LAB_0028baf5:
      uVar14 = uVar28 & 0xffffffff;
      goto LAB_0028adaa;
    }
    uVar15 = *(uint *)(lVar44 + 8 + lVar36 * 4);
    do {
      uVar37 = (ulong)uVar15;
      uVar14 = (ulong)uVar15;
      bVar53 = UF::P_[uVar14] < uVar15;
      uVar15 = UF::P_[uVar14];
      uVar18 = *(uint *)(lVar40 + lVar36 * 4);
    } while (bVar53);
    do {
      uVar15 = uVar18;
      uVar51 = (ulong)uVar15;
      uVar18 = UF::P_[uVar51];
    } while (UF::P_[uVar51] < uVar15);
  }
LAB_0028bb90:
  if ((uint)uVar37 < uVar15) {
LAB_0028bb95:
    UF::P_[uVar51] = (uint)uVar37;
  }
  else {
    UF::P_[uVar14] = uVar15;
    uVar37 = (ulong)uVar15;
  }
LAB_0028bba2:
  uVar14 = uVar28 & 0xffffffff;
  goto LAB_0028adaa;
LAB_0028b4a6:
  uVar28 = lVar36 + lVar42;
  lVar36 = lVar38 + 0x300000000 >> 0x20;
  iVar29 = (int)uVar28;
  if (*(char *)(lVar20 + lVar36) == '\0') goto LAB_0028a722;
  if (*(char *)(lVar17 + lVar36) == '\0') {
    lVar36 = lVar38 + 0x400000000 >> 0x20;
    if (*(char *)(lVar17 + lVar36) != '\0') goto LAB_0028bad6;
    goto LAB_0028ba2b;
  }
LAB_0028b0b0:
  *(undefined4 *)(lVar40 + uVar28 * 4) = *(undefined4 *)(lVar44 + uVar28 * 4);
  uVar15 = iVar29 + 2;
  if (local_e8 <= (int)uVar15) {
LAB_0028bce9:
    uVar28 = (ulong)uVar15;
    if (local_e8 < (int)uVar15) goto LAB_0028be1f;
    lVar31 = (long)(int)uVar15;
    if (*(char *)(lVar20 + lVar31) == '\0') {
LAB_0028bf1b:
      if (*(char *)((long)iVar29 + 3 + lVar20) == '\0') goto LAB_0028bfc3;
      cVar7 = *(char *)(lVar17 + 3 + (long)iVar29);
      goto joined_r0x0028bf2e;
    }
    lVar20 = (long)iVar29;
    if (*(char *)(lVar17 + 3 + lVar20) == '\0') goto LAB_0028c115;
    if (*(char *)(lVar17 + lVar31) != '\0') goto LAB_0028c161;
    if (*(char *)(lVar25 + lVar31) == '\0') {
      uVar15 = *(uint *)(lVar44 + lVar31 * 4);
      do {
        uVar24 = uVar15;
        uVar10 = (ulong)uVar24;
        uVar15 = UF::P_[uVar10];
        uVar18 = *(uint *)(lVar40 + lVar20 * 4);
      } while (UF::P_[uVar10] < uVar24);
      do {
        uVar15 = uVar18;
        uVar14 = (ulong)uVar15;
        uVar18 = UF::P_[uVar14];
      } while (UF::P_[uVar14] < uVar15);
      goto LAB_0028c284;
    }
LAB_0028c03b:
    uVar39 = *(undefined4 *)(lVar44 + lVar20 * 4);
    goto LAB_0028c166;
  }
  lVar47 = (long)iVar29;
  lVar38 = lVar47 + 2;
  lVar36 = lVar47 << 0x20;
  lVar33 = lVar12 + lVar47;
  lVar35 = lVar13 + lVar47 * 4;
  lVar42 = 0;
LAB_0028b0fe:
  if (*(char *)(lVar26 + lVar47 + -1 + lVar42) != '\0') goto LAB_0028b147;
  if (*(char *)(lVar26 + lVar47 + lVar42) != '\0') {
    if (*(char *)(lVar33 + 1 + lVar42) != '\0') goto code_r0x0028b119;
    uVar28 = lVar38 + lVar42;
    lVar36 = lVar36 + 0x400000000 >> 0x20;
    if (*(char *)(lVar17 + lVar36) == '\0') {
      if (*(char *)(lVar42 + lVar33) != '\0') goto LAB_0028b29b;
      uVar14 = (ulong)UF::length_;
      UF::P_[uVar14] = UF::length_;
      UF::length_ = UF::length_ + 1;
      goto LAB_0028ab38;
    }
    if (*(char *)(lVar42 + lVar33) == '\0') goto LAB_0028b2aa;
    uVar37 = (ulong)*(uint *)(lVar35 + lVar42 * 4);
    if (*(char *)(lVar42 + lVar47 + lVar11) == '\0') {
      do {
        uVar14 = uVar37;
        uVar18 = (uint)uVar14;
        uVar37 = (ulong)UF::P_[uVar14];
        uVar15 = *(uint *)(lVar44 + lVar36 * 4);
      } while (UF::P_[uVar14] < uVar18);
      do {
        uVar37 = (ulong)uVar15;
        uVar51 = (ulong)uVar15;
        bVar53 = UF::P_[uVar51] < uVar15;
        uVar15 = UF::P_[uVar51];
      } while (bVar53);
      goto LAB_0028b5f0;
    }
    goto LAB_0028b2af;
  }
  uVar28 = lVar38 + lVar42;
LAB_0028b1a3:
  iVar29 = (int)uVar28;
LAB_0028a722:
  *(undefined4 *)(lVar40 + uVar28 * 4) = 0;
  iVar23 = iVar29 + 2;
  if (local_e8 <= iVar23) {
LAB_0028bc7b:
    lVar31 = (long)iVar23;
    if (local_e8 < iVar23) {
      if (*(char *)(lVar20 + lVar31) == '\0') goto LAB_0028bfc3;
      cVar7 = *(char *)(lVar17 + lVar31);
    }
    else {
      if (*(char *)(lVar20 + lVar31) == '\0') goto LAB_0028bf1b;
      lVar20 = (long)iVar29;
      cVar7 = *(char *)(lVar17 + lVar31);
      if (*(char *)(lVar17 + 3 + lVar20) != '\0') {
        if ((cVar7 != '\0') || (*(char *)(lVar17 + 1 + lVar20) == '\0')) goto LAB_0028c161;
        uVar15 = *(uint *)(lVar44 + lVar20 * 4);
        if (*(char *)(lVar25 + lVar31) == '\0') {
          do {
            uVar24 = uVar15;
            uVar10 = (ulong)uVar24;
            uVar15 = UF::P_[uVar10];
            uVar18 = *(uint *)(lVar44 + lVar31 * 4);
          } while (UF::P_[uVar10] < uVar24);
          do {
            uVar15 = uVar18;
            uVar14 = (ulong)uVar15;
            uVar18 = UF::P_[uVar14];
          } while (UF::P_[uVar14] < uVar15);
          goto LAB_0028c284;
        }
        goto LAB_0028c022;
      }
    }
    if (cVar7 != '\0') goto LAB_0028c161;
    lVar20 = (long)iVar29;
    if (*(char *)(lVar17 + 1 + lVar20) != '\0') goto LAB_0028c03b;
    goto LAB_0028c0a0;
  }
  lVar35 = (long)iVar29;
  lVar33 = lVar35 + 2;
  lVar36 = lVar35 << 0x20;
  lVar38 = 0;
LAB_0028a75d:
  if (*(char *)(lVar26 + lVar35 + -1 + lVar38) == '\0') {
    if (*(char *)(lVar26 + lVar35 + lVar38) == '\0') goto code_r0x0028a770;
    uVar28 = lVar33 + lVar38;
    if (*(char *)(lVar38 + 1 + lVar12 + lVar35) != '\0') goto code_r0x0028a80b;
    lVar36 = lVar36 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar38 + lVar12 + lVar35);
    if (*(char *)(lVar17 + lVar36) == '\0') {
      if (cVar7 != '\0') {
LAB_0028b29b:
        uVar14 = uVar28 & 0xffffffff;
        goto LAB_0028aef4;
      }
LAB_0028a9e7:
      uVar28 = lVar33 + lVar38;
      uVar14 = (ulong)UF::length_;
      UF::P_[uVar14] = UF::length_;
      UF::length_ = UF::length_ + 1;
      goto LAB_0028ab38;
    }
    if (cVar7 == '\0') {
LAB_0028b2aa:
      uVar37 = (ulong)*(uint *)(lVar44 + lVar36 * 4);
    }
    else {
      uVar37 = (ulong)*(uint *)(lVar13 + lVar35 * 4 + lVar38 * 4);
      if (*(char *)(lVar38 + lVar11 + lVar35) == '\0') {
        do {
          uVar14 = uVar37;
          uVar18 = (uint)uVar14;
          uVar37 = (ulong)UF::P_[uVar14];
          uVar15 = *(uint *)(lVar44 + lVar36 * 4);
        } while (UF::P_[uVar14] < uVar18);
        do {
          uVar37 = (ulong)uVar15;
          uVar51 = (ulong)uVar15;
          bVar53 = UF::P_[uVar51] < uVar15;
          uVar15 = UF::P_[uVar51];
        } while (bVar53);
LAB_0028b5f0:
        if (uVar18 < (uint)uVar37) {
LAB_0028b5f9:
          UF::P_[uVar51] = uVar18;
          uVar37 = (ulong)uVar18;
        }
        else {
LAB_0028aa93:
          UF::P_[uVar14] = (uint)uVar37;
        }
        goto LAB_0028bba2;
      }
    }
LAB_0028b2af:
    uVar14 = uVar28 & 0xffffffff;
    goto LAB_0028adaa;
  }
  uVar28 = lVar33 + lVar38;
  lVar47 = lVar36 + 0x300000000 >> 0x20;
  lVar42 = lVar36 >> 0x20;
  if (*(char *)(lVar17 + lVar47) == '\0') {
    if (*(char *)(lVar20 + lVar47) == '\0') {
      if (*(char *)(lVar38 + lVar12 + lVar35) == '\0') {
        if (*(char *)(lVar48 + lVar42) == '\0') {
          UF::P_[UF::length_] = UF::length_;
          uVar15 = UF::length_;
          UF::length_ = UF::length_ + 1;
          goto LAB_0028b90c;
        }
        uVar15 = *(uint *)(lVar44 + lVar42 * 4);
      }
      else {
        uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar38 * 4);
      }
      iVar23 = (int)uVar28;
      goto LAB_0028b90f;
    }
    lVar36 = lVar36 + 0x400000000 >> 0x20;
    cVar7 = *(char *)(lVar38 + lVar12 + lVar35);
    if (*(char *)(lVar17 + lVar36) != '\0') {
      if (cVar7 == '\0') {
        if (*(char *)(lVar48 + lVar42) == '\0') {
          uVar37 = (ulong)*(uint *)(lVar44 + lVar36 * 4);
        }
        else {
          if (*(char *)(lVar25 + lVar47) == '\0') {
            uVar15 = *(uint *)(lVar44 + lVar42 * 4);
            do {
              uVar37 = (ulong)uVar15;
              uVar14 = (ulong)uVar15;
              bVar53 = UF::P_[uVar14] < uVar15;
              uVar15 = UF::P_[uVar14];
              uVar18 = *(uint *)(lVar44 + lVar36 * 4);
            } while (bVar53);
            do {
              uVar15 = uVar18;
              uVar51 = (ulong)uVar15;
              uVar18 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar15);
            goto LAB_0028bb90;
          }
          uVar37 = (ulong)*(uint *)(lVar44 + lVar42 * 4);
          if (*(char *)(lVar38 + -1 + lVar11 + lVar35) == '\0') {
            do {
              uVar14 = uVar37;
              uVar18 = (uint)uVar14;
              uVar37 = (ulong)UF::P_[uVar14];
              uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar38 * 4);
            } while (UF::P_[uVar14] < uVar18);
            do {
              uVar24 = uVar15;
              uVar37 = (ulong)uVar24;
              uVar51 = (ulong)uVar24;
              uVar15 = UF::P_[uVar51];
            } while (UF::P_[uVar51] < uVar24);
            if (uVar24 <= uVar18) goto LAB_0028aa93;
            goto LAB_0028b5f9;
          }
        }
      }
      else {
        uVar37 = (ulong)*(uint *)(lVar13 + lVar35 * 4 + lVar38 * 4);
        if (*(char *)(lVar25 + lVar47) == '\0') {
          do {
            uVar14 = uVar37;
            uVar18 = (uint)uVar14;
            uVar37 = (ulong)UF::P_[uVar14];
            uVar15 = *(uint *)(lVar44 + lVar36 * 4);
          } while (UF::P_[uVar14] < uVar18);
          do {
            uVar37 = (ulong)uVar15;
            uVar51 = (ulong)uVar15;
            bVar53 = UF::P_[uVar51] < uVar15;
            uVar15 = UF::P_[uVar51];
          } while (bVar53);
          goto LAB_0028b5f0;
        }
      }
      goto LAB_0028b2af;
    }
    if (cVar7 != '\0') goto LAB_0028ba8e;
    if (*(char *)(lVar48 + lVar42) == '\0') goto LAB_0028a9e7;
    uVar14 = (ulong)*(uint *)(lVar44 + lVar42 * 4);
    goto LAB_0028ab38;
  }
  if ((*(char *)(lVar38 + lVar12 + lVar35) == '\0') && (*(char *)(lVar48 + lVar42) != '\0')) {
    uVar15 = *(uint *)(lVar44 + lVar42 * 4);
    if (*(char *)(lVar38 + -1 + lVar11 + lVar35) == '\0') {
      do {
        uVar24 = uVar15;
        uVar14 = (ulong)uVar24;
        uVar15 = UF::P_[uVar14];
        uVar18 = *(uint *)(lVar13 + lVar35 * 4 + lVar38 * 4);
      } while (UF::P_[uVar14] < uVar24);
      do {
        uVar15 = uVar18;
        uVar51 = (ulong)uVar15;
        uVar18 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar15);
      if (uVar15 <= uVar24) goto LAB_0028a9a8;
      goto LAB_0028ba7a;
    }
  }
  else {
    uVar15 = *(uint *)(lVar13 + lVar35 * 4 + lVar38 * 4);
  }
LAB_0028a7e4:
  uVar14 = uVar28 & 0xffffffff;
  goto LAB_0028b733;
LAB_0028b147:
  uVar28 = lVar38 + lVar42;
  lVar41 = lVar36 + 0x300000000 >> 0x20;
  lVar38 = lVar36 >> 0x1e;
  if (*(char *)(lVar17 + lVar41) != '\0') goto code_r0x0028b167;
  if (*(char *)(lVar20 + lVar41) == '\0') {
    iVar23 = (int)uVar28;
    uVar15 = *(uint *)(lVar40 + lVar38);
    goto LAB_0028b90f;
  }
  lVar52 = lVar36 + 0x400000000 >> 0x20;
  if (*(char *)(lVar17 + lVar52) == '\0') goto LAB_0028b2e5;
  if (*(char *)(lVar25 + lVar41) != '\0') {
    if (*(char *)(lVar42 + lVar33) != '\0') {
      uVar37 = (ulong)*(uint *)(lVar35 + lVar42 * 4);
      uVar14 = uVar28 & 0xffffffff;
      goto LAB_0028adaa;
    }
    if (*(char *)(lVar42 + -1 + lVar47 + lVar11) == '\0') {
      uVar15 = *(uint *)(lVar35 + lVar42 * 4);
      do {
        uVar37 = (ulong)uVar15;
        uVar14 = (ulong)uVar15;
        bVar53 = UF::P_[uVar14] < uVar15;
        uVar15 = UF::P_[uVar14];
        uVar18 = *(uint *)(lVar40 + lVar38);
      } while (bVar53);
      do {
        uVar15 = uVar18;
        uVar51 = (ulong)uVar15;
        uVar18 = UF::P_[uVar51];
      } while (UF::P_[uVar51] < uVar15);
      goto LAB_0028bb90;
    }
    uVar37 = (ulong)*(uint *)(lVar44 + lVar38);
    goto LAB_0028b2af;
  }
  uVar15 = *(uint *)(lVar44 + lVar52 * 4);
  do {
    uVar37 = (ulong)uVar15;
    uVar14 = (ulong)uVar15;
    bVar53 = UF::P_[uVar14] < uVar15;
    uVar15 = UF::P_[uVar14];
    uVar18 = *(uint *)(lVar40 + lVar38);
  } while (bVar53);
  do {
    uVar15 = uVar18;
    uVar51 = (ulong)uVar15;
    uVar18 = UF::P_[uVar51];
  } while (UF::P_[uVar51] < uVar15);
  goto LAB_0028bb90;
LAB_0028b2e5:
  lVar36 = lVar36 >> 0x1e;
  goto LAB_0028b40f;
code_r0x0028b167:
  if (*(char *)(lVar42 + lVar33) != '\0') {
    uVar15 = *(uint *)(lVar35 + lVar42 * 4);
    goto LAB_0028b72e;
  }
  if (*(char *)(lVar42 + -1 + lVar47 + lVar11) != '\0') {
    uVar15 = *(uint *)(lVar44 + lVar38);
    goto LAB_0028a7e4;
  }
  uVar15 = *(uint *)(lVar35 + lVar42 * 4);
  do {
    uVar24 = uVar15;
    uVar14 = (ulong)uVar24;
    uVar15 = UF::P_[uVar14];
    uVar18 = *(uint *)(lVar40 + lVar38);
  } while (UF::P_[uVar14] < uVar24);
  do {
    uVar15 = uVar18;
    uVar51 = (ulong)uVar15;
    uVar18 = UF::P_[uVar51];
  } while (UF::P_[uVar51] < uVar15);
  goto LAB_0028b712;
code_r0x0028b119:
  *(undefined4 *)(lVar31 + lVar47 * 4 + lVar42 * 4) = *(undefined4 *)(lVar35 + lVar42 * 4);
  lVar36 = lVar36 + 0x200000000;
  lVar41 = lVar38 + lVar42;
  lVar42 = lVar42 + 2;
  if ((long)uVar10 <= lVar41 + 2) {
    uVar15 = iVar29 + (int)lVar42 + 2;
    iVar29 = iVar29 + (int)lVar42;
    goto LAB_0028bce9;
  }
  goto LAB_0028b0fe;
code_r0x0028a770:
  *(undefined4 *)(lVar31 + lVar35 * 4 + lVar38 * 4) = 0;
  lVar36 = lVar36 + 0x200000000;
  lVar42 = lVar33 + lVar38;
  lVar38 = lVar38 + 2;
  if ((long)uVar10 <= lVar42 + 2) {
    iVar23 = iVar29 + (int)lVar38 + 2;
    iVar29 = iVar29 + (int)lVar38;
    goto LAB_0028bc7b;
  }
  goto LAB_0028a75d;
code_r0x0028a80b:
  iVar29 = (int)uVar28;
  goto LAB_0028b0b0;
LAB_0028ba8e:
  uVar14 = uVar28 & 0xffffffff;
  goto LAB_0028aef4;
code_r0x0028b47a:
  *(undefined4 *)(lVar33 + lVar42 * 4) = *(undefined4 *)(lVar33 + -8 + lVar42 * 4);
  lVar38 = lVar38 + 0x200000000;
  lVar41 = lVar36 + lVar42;
  lVar42 = lVar42 + 2;
  if ((long)uVar10 <= lVar41 + 2) {
    uVar15 = iVar23 + (int)lVar42 + 2;
    iVar23 = iVar23 + (int)lVar42;
    goto LAB_0028bd9b;
  }
  goto LAB_0028b44f;
LAB_0028b53a:
  uVar14 = uVar28 & 0xffffffff;
  goto LAB_0028b733;
LAB_0027f7a4:
  iVar23 = iVar29 + 2;
  uVar39 = *(undefined4 *)(lVar40 + lVar32 * 4);
LAB_0027f7b4:
  *(undefined4 *)(lVar40 + lVar31 * 4) = uVar39;
  iVar29 = iVar23;
LAB_0027f7b8:
  iVar23 = iVar29 + 2;
  if ((int)uVar15 <= iVar23) goto code_r0x0027f7c7;
  goto LAB_0027f707;
LAB_0028a4b8:
  if ((this->o_rows & 1U) == 0) {
    return;
  }
LAB_0028a4c3:
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar32 = *(long *)&pMVar4->field_0x10;
  lVar26 = **(long **)&pMVar4->field_0x48;
  lVar33 = (long)(int)(uVar15 - 1);
  lVar20 = lVar32 + lVar26 * lVar33;
  lVar17 = lVar20 - lVar26;
  lVar31 = *(long *)&pMVar5->field_0x10;
  lVar36 = **(long **)&pMVar5->field_0x48;
  lVar40 = lVar31 + lVar36 * lVar33;
  lVar44 = lVar40 + lVar36 * -2;
  if ((int)uVar18 < 3) {
    uVar15 = 0;
    iVar23 = -2;
  }
  else {
    lVar25 = lVar17 - lVar26;
    lVar48 = lVar17 + 1;
    lVar27 = lVar25 + 1;
    uVar10 = uVar10 & 0xffffffff;
    lVar11 = lVar32 + lVar26 * (lVar33 + -2) + 3;
    lVar35 = (lVar33 + -1) * lVar26;
    lVar12 = lVar35 + lVar32 + 2;
    lVar26 = lVar26 * lVar33 + lVar32 + 3;
    lVar13 = lVar36 * (lVar33 + -2) + lVar31 + 8;
    lVar31 = lVar36 * lVar33 + 8 + lVar31;
    lVar32 = lVar35 + lVar32 + 4;
    iVar23 = -2;
    uVar14 = 0;
    do {
      iVar29 = (int)uVar14;
      uVar28 = (ulong)iVar29;
      lVar36 = (long)iVar23;
      if (*(char *)(lVar20 + uVar28) == '\0') {
        if (*(char *)(lVar20 + 3 + lVar36) == '\0') goto LAB_0028a722;
        if (*(char *)(lVar17 + 3 + lVar36) != '\0') goto LAB_0028b0b0;
        cVar7 = *(char *)(lVar17 + uVar28);
        if (*(char *)(lVar36 + 4 + lVar17) == '\0') {
LAB_0028a699:
          if (cVar7 != '\0') goto LAB_0028aef4;
          UF::P_[UF::length_] = UF::length_;
          uVar15 = UF::length_;
          UF::length_ = UF::length_ + 1;
          goto LAB_0028ab3b;
        }
        if (cVar7 == '\0') {
LAB_0028a6b9:
          uVar37 = (ulong)*(uint *)(lVar44 + 0x10 + lVar36 * 4);
          goto LAB_0028adaa;
        }
        uVar15 = *(uint *)(lVar44 + uVar28 * 4);
        if (*(char *)(lVar25 + 3 + lVar36) == '\0') {
          do {
            uVar24 = uVar15;
            uVar51 = (ulong)uVar24;
            uVar15 = UF::P_[uVar51];
            uVar18 = *(uint *)(lVar44 + 0x10 + lVar36 * 4);
          } while (UF::P_[uVar51] < uVar24);
          do {
            uVar15 = uVar18;
            uVar46 = (ulong)uVar15;
            uVar18 = UF::P_[uVar46];
          } while (UF::P_[uVar46] < uVar15);
LAB_0028a708:
          uVar37 = (ulong)uVar24;
          if (uVar24 < uVar15) {
            UF::P_[uVar46] = uVar24;
          }
          else {
            UF::P_[uVar51] = uVar15;
            uVar37 = (ulong)uVar15;
          }
          goto LAB_0028adaa;
        }
LAB_0028a679:
        uVar37 = (ulong)uVar15;
LAB_0028adaa:
        *(int *)(lVar40 + uVar28 * 4) = (int)uVar37;
        puVar2 = UF::P_;
        iVar23 = (int)uVar14;
        uVar28 = (ulong)(iVar23 + 2U);
        if ((int)(iVar23 + 2U) < local_e8) {
          lVar36 = (long)iVar23;
          uVar14 = lVar36 + 2;
          do {
            uVar28 = uVar14;
            if (*(char *)(lVar20 + uVar28) != '\0') {
              if (*(char *)(lVar17 + 3 + lVar36) != '\0') {
                uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                goto LAB_0028b53a;
              }
              if (*(char *)(lVar20 + 3 + lVar36) != '\0') {
                if (*(char *)(lVar36 + 4 + lVar17) == '\0') {
                  lVar36 = (long)(int)lVar36;
                  goto LAB_0028b997;
                }
                if (*(char *)(lVar25 + 3 + lVar36) == '\0') {
                  uVar15 = *(uint *)(lVar44 + 0x10 + lVar36 * 4);
                  do {
                    uVar24 = uVar15;
                    uVar14 = (ulong)uVar24;
                    uVar15 = puVar2[uVar14];
                    uVar18 = *(uint *)(lVar40 + lVar36 * 4);
                  } while (puVar2[uVar14] < uVar24);
                  do {
                    uVar15 = uVar18;
                    uVar51 = (ulong)uVar15;
                    uVar18 = puVar2[uVar51];
                  } while (puVar2[uVar51] < uVar15);
                  goto LAB_0028ae90;
                }
                uVar15 = *(uint *)(lVar44 + uVar28 * 4);
                goto LAB_0028aeb5;
              }
              uVar15 = *(uint *)(lVar40 + (long)(int)lVar36 * 4);
LAB_0028b90c:
              iVar23 = (int)uVar28;
              goto LAB_0028b90f;
            }
            if (*(char *)(lVar20 + 3 + lVar36) == '\0') {
LAB_0028b8c5:
              iVar29 = (int)uVar28;
              goto LAB_0028a722;
            }
            if (*(char *)(lVar17 + 3 + lVar36) != '\0') {
LAB_0028b0ad:
              iVar29 = (int)uVar28;
              goto LAB_0028b0b0;
            }
            if (*(char *)(lVar36 + 4 + lVar17) == '\0') goto LAB_0028aef1;
            uVar15 = *(uint *)(lVar44 + uVar28 * 4);
            if (*(char *)(lVar25 + 3 + lVar36) == '\0') {
              do {
                uVar24 = uVar15;
                uVar14 = (ulong)uVar24;
                uVar15 = puVar2[uVar14];
                uVar18 = *(uint *)(lVar44 + 0x10 + lVar36 * 4);
              } while (puVar2[uVar14] < uVar24);
              do {
                uVar15 = uVar18;
                uVar51 = (ulong)uVar15;
                uVar18 = puVar2[uVar51];
              } while (puVar2[uVar51] < uVar15);
LAB_0028ae90:
              if (uVar24 < uVar15) {
                puVar2[uVar51] = uVar24;
                uVar15 = uVar24;
              }
              else {
                puVar2[uVar14] = uVar15;
              }
            }
LAB_0028aeb5:
            *(uint *)(lVar40 + uVar28 * 4) = uVar15;
            uVar14 = uVar28 + 2;
            lVar36 = lVar36 + 2;
            if ((long)uVar10 <= (long)uVar14) {
              iVar23 = (int)uVar28;
              uVar28 = uVar14 & 0xffffffff;
              break;
            }
          } while( true );
        }
        if (local_e8 < (int)uVar28) {
LAB_0028be1f:
          lVar31 = (long)(int)uVar28;
          if (*(char *)(lVar20 + lVar31) != '\0') {
            *(undefined4 *)(lVar40 + lVar31 * 4) = *(undefined4 *)(lVar40 + -8 + lVar31 * 4);
            return;
          }
          *(undefined4 *)(lVar40 + lVar31 * 4) = 0;
          return;
        }
        lVar31 = (long)(int)uVar28;
        lVar32 = (long)iVar23;
        if (*(char *)(lVar20 + lVar31) == '\0') {
          if (*(char *)(lVar20 + 3 + lVar32) == '\0') goto LAB_0028bfdc;
          goto LAB_0028bc16;
        }
        if (*(char *)(lVar17 + 3 + lVar32) != '\0') goto LAB_0028bc16;
        uVar39 = *(undefined4 *)(lVar40 + lVar32 * 4);
        goto LAB_0028bc1b;
      }
      if (*(char *)(lVar17 + 3 + lVar36) != '\0') {
        uVar15 = *(uint *)(lVar44 + uVar28 * 4);
        goto LAB_0028b733;
      }
      if (*(char *)(lVar20 + 3 + lVar36) != '\0') {
        cVar7 = *(char *)(lVar17 + uVar28);
        if (*(char *)(lVar36 + 4 + lVar17) == '\0') goto LAB_0028a699;
        if (cVar7 == '\0') goto LAB_0028a6b9;
        uVar15 = *(uint *)(lVar44 + uVar28 * 4);
        if (*(char *)(lVar25 + 3 + lVar36) == '\0') {
          do {
            uVar24 = uVar15;
            uVar51 = (ulong)uVar24;
            uVar15 = UF::P_[uVar51];
            uVar18 = *(uint *)(lVar44 + 0x10 + lVar36 * 4);
          } while (UF::P_[uVar51] < uVar24);
          do {
            uVar15 = uVar18;
            uVar46 = (ulong)uVar15;
            uVar18 = UF::P_[uVar46];
          } while (UF::P_[uVar46] < uVar15);
          goto LAB_0028a708;
        }
        goto LAB_0028a679;
      }
      iVar23 = iVar29;
      if (*(char *)(lVar17 + uVar28) == '\0') {
        UF::P_[UF::length_] = UF::length_;
        uVar15 = UF::length_;
        UF::length_ = UF::length_ + 1;
      }
      else {
        uVar15 = *(uint *)(lVar44 + uVar28 * 4);
      }
LAB_0028b90f:
      *(uint *)(lVar40 + uVar28 * 4) = uVar15;
      uVar15 = iVar23 + 2;
      uVar14 = (ulong)uVar15;
    } while ((int)uVar15 < local_e8);
  }
  lVar31 = (long)(int)uVar15;
  if (local_e8 < (int)uVar15) {
    if (*(char *)(lVar20 + lVar31) == '\0') {
LAB_0028bfdc:
      *(undefined4 *)(lVar40 + lVar31 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar20 + lVar31) == '\0') {
      if (*(char *)((long)iVar23 + 3 + lVar20) == '\0') goto LAB_0028bfdc;
      cVar7 = *(char *)(lVar17 + 3 + (long)iVar23);
    }
    else {
      cVar7 = *(char *)(lVar17 + 3 + (long)iVar23);
    }
    if (cVar7 != '\0') goto LAB_0028bc16;
  }
  if (*(char *)(lVar17 + lVar31) == '\0') {
    UF::P_[UF::length_] = UF::length_;
    uVar15 = UF::length_ + 1;
    *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
    UF::length_ = uVar15;
    return;
  }
LAB_0028bc16:
  uVar39 = *(undefined4 *)(lVar44 + lVar31 * 4);
LAB_0028bc1b:
  *(undefined4 *)(lVar40 + lVar31 * 4) = uVar39;
  return;
code_r0x0027f7c7:
  lVar32 = (long)iVar29;
LAB_0027fac6:
  lVar31 = (long)iVar23;
  cVar7 = *(char *)(lVar20 + lVar31);
  if (iVar23 <= (int)uVar15) {
    if (cVar7 != '\0') goto LAB_0027fc5c;
    cVar7 = *(char *)(lVar20 + 3 + lVar32);
  }
joined_r0x0027fc56:
  if (cVar7 == '\0') {
LAB_0028bfc3:
    *(undefined4 *)(lVar40 + lVar31 * 4) = 0;
    return;
  }
LAB_0027fc5c:
  puVar2[UF::length_] = UF::length_;
  uVar15 = UF::length_ + 1;
  *(uint *)(lVar40 + lVar31 * 4) = UF::length_;
  UF::length_ = uVar15;
  return;
}

Assistant:

void FirstScan()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        e_rows = h & 0xfffffffe;
        o_rows = h % 2 == 1;
        e_cols = w & 0xfffffffe;
        o_cols = w % 2 == 1;

        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }
    }